

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx::CurveNiMBIntersectorK<8,4>::
     occluded_n<embree::avx::OrientedCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  long lVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  BBox1f BVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Primitive PVar18;
  Geometry *pGVar19;
  __int_type_conflict _Var20;
  long lVar21;
  long lVar22;
  long lVar23;
  RTCFilterFunctionN p_Var24;
  ulong uVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  uint uVar85;
  uint uVar86;
  ulong uVar87;
  uint uVar88;
  long lVar89;
  ulong uVar90;
  byte bVar91;
  undefined4 uVar92;
  undefined8 unaff_RBP;
  long lVar93;
  bool bVar94;
  bool bVar95;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar111 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar144 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar170;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  float fVar206;
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  float t1;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  float fVar222;
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  float fVar223;
  float fVar251;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar250;
  float fVar252;
  float fVar253;
  float fVar254;
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  float fVar255;
  float fVar271;
  float fVar272;
  vfloat4 b0;
  float fVar273;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  float fVar274;
  float fVar275;
  float fVar276;
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  float fVar277;
  float fVar287;
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  float fVar285;
  float fVar286;
  float fVar288;
  float fVar289;
  float fVar290;
  undefined1 auVar283 [32];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  float fVar327;
  float fVar328;
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  float fVar342;
  undefined1 auVar343 [16];
  float fVar341;
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  float fVar354;
  float fVar356;
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  float fVar355;
  float fVar357;
  float fVar358;
  float fVar359;
  undefined1 auVar353 [64];
  float fVar360;
  float fVar370;
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  float fVar368;
  float fVar369;
  float fVar371;
  float fVar372;
  float fVar373;
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  float fVar374;
  float fVar375;
  float fVar385;
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  float fVar383;
  float fVar384;
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  float fVar386;
  float fVar387;
  float fVar399;
  vfloat4 a0;
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [32];
  undefined1 auVar397 [32];
  float fVar410;
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  float fVar400;
  float fVar409;
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  float fVar407;
  float fVar408;
  undefined1 auVar405 [32];
  undefined1 auVar406 [64];
  undefined1 local_628 [8];
  float fStack_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  undefined1 local_608 [8];
  float fStack_600;
  float fStack_5fc;
  float local_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  undefined1 local_5a8 [8];
  float fStack_5a0;
  float fStack_59c;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  undefined1 local_578 [8];
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  float fStack_560;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  vfloat_impl<4> p00;
  undefined1 local_468 [16];
  undefined1 (*local_458) [16];
  Primitive *local_450;
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  undefined8 local_358;
  undefined8 uStack_350;
  vfloat_impl<4> p03;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  BBox1f cu_stack [4];
  RTCHitN local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined1 local_1c8 [16];
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  BBox1f cv_stack [4];
  undefined1 auVar284 [32];
  undefined1 auVar398 [32];
  
  PVar18 = prim[1];
  uVar87 = (ulong)(byte)PVar18;
  auVar108 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 4 + 6)));
  auVar106 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 4 + 10)));
  auVar34 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 5 + 6)));
  auVar229 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 5 + 10)));
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 6 + 6)));
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 6 + 10)));
  lVar89 = uVar87 * 0x25;
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 0xf + 6)));
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 0xf + 10)));
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar18 * 0x10 + 6)));
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar18 * 0x10 + 10)));
  auVar41 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 0x11 + 6)));
  auVar42 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 0x11 + 10)));
  fVar255 = *(float *)(prim + lVar89 + 0x12);
  auVar107 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar107 = vinsertps_avx(auVar107,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar140 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar140 = vinsertps_avx(auVar140,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar107 = vsubps_avx(auVar107,*(undefined1 (*) [16])(prim + lVar89 + 6));
  local_578._4_4_ = fVar255 * auVar107._4_4_;
  local_578._0_4_ = fVar255 * auVar107._0_4_;
  fStack_570 = fVar255 * auVar107._8_4_;
  fStack_56c = fVar255 * auVar107._12_4_;
  auVar317._0_4_ = fVar255 * auVar140._0_4_;
  auVar317._4_4_ = fVar255 * auVar140._4_4_;
  auVar317._8_4_ = fVar255 * auVar140._8_4_;
  auVar317._12_4_ = fVar255 * auVar140._12_4_;
  auVar107 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 0x1a + 6)));
  auVar140 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 0x1a + 10)));
  auVar126._16_16_ = auVar106;
  auVar126._0_16_ = auVar108;
  auVar108 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 0x1b + 6)));
  auVar200._16_16_ = auVar229;
  auVar200._0_16_ = auVar34;
  auVar106 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 0x1b + 10)));
  auVar129 = vcvtdq2ps_avx(auVar200);
  auVar201._16_16_ = auVar36;
  auVar201._0_16_ = auVar35;
  auVar26 = vcvtdq2ps_avx(auVar201);
  auVar218._16_16_ = auVar38;
  auVar218._0_16_ = auVar37;
  auVar219._16_16_ = auVar40;
  auVar219._0_16_ = auVar39;
  auVar27 = vcvtdq2ps_avx(auVar219);
  auVar246._16_16_ = auVar42;
  auVar246._0_16_ = auVar41;
  auVar28 = vcvtdq2ps_avx(auVar246);
  auVar267._16_16_ = auVar140;
  auVar267._0_16_ = auVar107;
  auVar298._16_16_ = auVar106;
  auVar298._0_16_ = auVar108;
  auVar107 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 0x1c + 6)));
  auVar140 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 0x1c + 10)));
  auVar379._16_16_ = auVar140;
  auVar379._0_16_ = auVar107;
  auVar107 = vshufps_avx(auVar317,auVar317,0x55);
  auVar140 = vshufps_avx(auVar317,auVar317,0xaa);
  fVar255 = auVar140._0_4_;
  fVar170 = auVar140._4_4_;
  fVar271 = auVar140._8_4_;
  fVar206 = auVar140._12_4_;
  fVar274 = auVar107._0_4_;
  fVar275 = auVar107._4_4_;
  fVar276 = auVar107._8_4_;
  fVar223 = auVar107._12_4_;
  auVar29 = vcvtdq2ps_avx(auVar126);
  auVar30 = vcvtdq2ps_avx(auVar218);
  auVar31 = vcvtdq2ps_avx(auVar267);
  auVar32 = vcvtdq2ps_avx(auVar298);
  auVar33 = vcvtdq2ps_avx(auVar379);
  auVar107 = vshufps_avx(auVar317,auVar317,0);
  fVar272 = auVar107._0_4_;
  fVar387 = auVar107._4_4_;
  fVar273 = auVar107._8_4_;
  fVar399 = auVar107._12_4_;
  auVar396._0_4_ = fVar272 * auVar29._0_4_ + fVar274 * auVar129._0_4_ + fVar255 * auVar26._0_4_;
  auVar396._4_4_ = fVar387 * auVar29._4_4_ + fVar275 * auVar129._4_4_ + fVar170 * auVar26._4_4_;
  auVar396._8_4_ = fVar273 * auVar29._8_4_ + fVar276 * auVar129._8_4_ + fVar271 * auVar26._8_4_;
  auVar396._12_4_ = fVar399 * auVar29._12_4_ + fVar223 * auVar129._12_4_ + fVar206 * auVar26._12_4_;
  auVar396._16_4_ = fVar272 * auVar29._16_4_ + fVar274 * auVar129._16_4_ + fVar255 * auVar26._16_4_;
  auVar396._20_4_ = fVar387 * auVar29._20_4_ + fVar275 * auVar129._20_4_ + fVar170 * auVar26._20_4_;
  auVar396._24_4_ = fVar273 * auVar29._24_4_ + fVar276 * auVar129._24_4_ + fVar271 * auVar26._24_4_;
  auVar396._28_4_ = fVar223 + 0.0;
  auVar380._0_4_ = fVar272 * auVar30._0_4_ + fVar274 * auVar27._0_4_ + fVar255 * auVar28._0_4_;
  auVar380._4_4_ = fVar387 * auVar30._4_4_ + fVar275 * auVar27._4_4_ + fVar170 * auVar28._4_4_;
  auVar380._8_4_ = fVar273 * auVar30._8_4_ + fVar276 * auVar27._8_4_ + fVar271 * auVar28._8_4_;
  auVar380._12_4_ = fVar399 * auVar30._12_4_ + fVar223 * auVar27._12_4_ + fVar206 * auVar28._12_4_;
  auVar380._16_4_ = fVar272 * auVar30._16_4_ + fVar274 * auVar27._16_4_ + fVar255 * auVar28._16_4_;
  auVar380._20_4_ = fVar387 * auVar30._20_4_ + fVar275 * auVar27._20_4_ + fVar170 * auVar28._20_4_;
  auVar380._24_4_ = fVar273 * auVar30._24_4_ + fVar276 * auVar27._24_4_ + fVar271 * auVar28._24_4_;
  auVar380._28_4_ = 0;
  auVar283._0_4_ = fVar272 * auVar31._0_4_ + fVar274 * auVar32._0_4_ + fVar255 * auVar33._0_4_;
  auVar283._4_4_ = fVar387 * auVar31._4_4_ + fVar275 * auVar32._4_4_ + fVar170 * auVar33._4_4_;
  auVar283._8_4_ = fVar273 * auVar31._8_4_ + fVar276 * auVar32._8_4_ + fVar271 * auVar33._8_4_;
  auVar283._12_4_ = fVar399 * auVar31._12_4_ + fVar223 * auVar32._12_4_ + fVar206 * auVar33._12_4_;
  auVar283._16_4_ = fVar272 * auVar31._16_4_ + fVar274 * auVar32._16_4_ + fVar255 * auVar33._16_4_;
  auVar283._20_4_ = fVar387 * auVar31._20_4_ + fVar275 * auVar32._20_4_ + fVar170 * auVar33._20_4_;
  auVar283._24_4_ = fVar273 * auVar31._24_4_ + fVar276 * auVar32._24_4_ + fVar271 * auVar33._24_4_;
  auVar283._28_4_ = fVar223 + fVar206 + 0.0;
  auVar107 = vshufps_avx(_local_578,_local_578,0x55);
  auVar140 = vshufps_avx(_local_578,_local_578,0xaa);
  fVar275 = auVar140._0_4_;
  fVar276 = auVar140._4_4_;
  fVar223 = auVar140._8_4_;
  fVar250 = auVar140._12_4_;
  fVar274 = auVar33._28_4_;
  fVar255 = auVar107._0_4_;
  fVar271 = auVar107._4_4_;
  fVar272 = auVar107._8_4_;
  fVar273 = auVar107._12_4_;
  fVar222 = fVar250 + auVar28._28_4_;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = *(ulong *)(prim + uVar87 * 7 + 6);
  auVar107 = vpmovsxwd_avx(auVar107);
  auVar140._8_8_ = 0;
  auVar140._0_8_ = *(ulong *)(prim + uVar87 * 7 + 0xe);
  auVar140 = vpmovsxwd_avx(auVar140);
  auVar108._8_8_ = 0;
  auVar108._0_8_ = *(ulong *)(prim + uVar87 * 0xb + 6);
  auVar108 = vpmovsxwd_avx(auVar108);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + uVar87 * 0xb + 0xe);
  auVar106 = vpmovsxwd_avx(auVar106);
  auVar34 = vshufps_avx(_local_578,_local_578,0);
  fVar170 = auVar34._0_4_;
  fVar206 = auVar34._4_4_;
  fVar387 = auVar34._8_4_;
  fVar399 = auVar34._12_4_;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + uVar87 * 9 + 6);
  auVar34 = vpmovsxwd_avx(auVar34);
  auVar202._0_4_ = auVar29._0_4_ * fVar170 + auVar129._0_4_ * fVar255 + fVar275 * auVar26._0_4_;
  auVar202._4_4_ = auVar29._4_4_ * fVar206 + auVar129._4_4_ * fVar271 + fVar276 * auVar26._4_4_;
  auVar202._8_4_ = auVar29._8_4_ * fVar387 + auVar129._8_4_ * fVar272 + fVar223 * auVar26._8_4_;
  auVar202._12_4_ = auVar29._12_4_ * fVar399 + auVar129._12_4_ * fVar273 + fVar250 * auVar26._12_4_;
  auVar202._16_4_ = auVar29._16_4_ * fVar170 + auVar129._16_4_ * fVar255 + fVar275 * auVar26._16_4_;
  auVar202._20_4_ = auVar29._20_4_ * fVar206 + auVar129._20_4_ * fVar271 + fVar276 * auVar26._20_4_;
  auVar202._24_4_ = auVar29._24_4_ * fVar387 + auVar129._24_4_ * fVar272 + fVar223 * auVar26._24_4_;
  auVar202._28_4_ = fVar274 + fVar250 + auVar26._28_4_;
  auVar229._8_8_ = 0;
  auVar229._0_8_ = *(ulong *)(prim + uVar87 * 9 + 0xe);
  auVar229 = vpmovsxwd_avx(auVar229);
  auVar163._0_4_ = auVar30._0_4_ * fVar170 + auVar27._0_4_ * fVar255 + fVar275 * auVar28._0_4_;
  auVar163._4_4_ = auVar30._4_4_ * fVar206 + auVar27._4_4_ * fVar271 + fVar276 * auVar28._4_4_;
  auVar163._8_4_ = auVar30._8_4_ * fVar387 + auVar27._8_4_ * fVar272 + fVar223 * auVar28._8_4_;
  auVar163._12_4_ = auVar30._12_4_ * fVar399 + auVar27._12_4_ * fVar273 + fVar250 * auVar28._12_4_;
  auVar163._16_4_ = auVar30._16_4_ * fVar170 + auVar27._16_4_ * fVar255 + fVar275 * auVar28._16_4_;
  auVar163._20_4_ = auVar30._20_4_ * fVar206 + auVar27._20_4_ * fVar271 + fVar276 * auVar28._20_4_;
  auVar163._24_4_ = auVar30._24_4_ * fVar387 + auVar27._24_4_ * fVar272 + fVar223 * auVar28._24_4_;
  auVar163._28_4_ = fVar274 + fVar222;
  auVar247._8_4_ = 0x7fffffff;
  auVar247._0_8_ = 0x7fffffff7fffffff;
  auVar247._12_4_ = 0x7fffffff;
  auVar247._16_4_ = 0x7fffffff;
  auVar247._20_4_ = 0x7fffffff;
  auVar247._24_4_ = 0x7fffffff;
  auVar247._28_4_ = 0x7fffffff;
  auVar127._0_4_ = fVar170 * auVar31._0_4_ + fVar255 * auVar32._0_4_ + fVar275 * auVar33._0_4_;
  auVar127._4_4_ = fVar206 * auVar31._4_4_ + fVar271 * auVar32._4_4_ + fVar276 * auVar33._4_4_;
  auVar127._8_4_ = fVar387 * auVar31._8_4_ + fVar272 * auVar32._8_4_ + fVar223 * auVar33._8_4_;
  auVar127._12_4_ = fVar399 * auVar31._12_4_ + fVar273 * auVar32._12_4_ + fVar250 * auVar33._12_4_;
  auVar127._16_4_ = fVar170 * auVar31._16_4_ + fVar255 * auVar32._16_4_ + fVar275 * auVar33._16_4_;
  auVar127._20_4_ = fVar206 * auVar31._20_4_ + fVar271 * auVar32._20_4_ + fVar276 * auVar33._20_4_;
  auVar127._24_4_ = fVar387 * auVar31._24_4_ + fVar272 * auVar32._24_4_ + fVar223 * auVar33._24_4_;
  auVar127._28_4_ = fVar222 + fVar273 + fVar274;
  auVar129 = vandps_avx(auVar396,auVar247);
  auVar268._8_4_ = 0x219392ef;
  auVar268._0_8_ = 0x219392ef219392ef;
  auVar268._12_4_ = 0x219392ef;
  auVar268._16_4_ = 0x219392ef;
  auVar268._20_4_ = 0x219392ef;
  auVar268._24_4_ = 0x219392ef;
  auVar268._28_4_ = 0x219392ef;
  auVar129 = vcmpps_avx(auVar129,auVar268,1);
  auVar26 = vblendvps_avx(auVar396,auVar268,auVar129);
  auVar129 = vandps_avx(auVar380,auVar247);
  auVar129 = vcmpps_avx(auVar129,auVar268,1);
  auVar27 = vblendvps_avx(auVar380,auVar268,auVar129);
  auVar129 = vandps_avx(auVar283,auVar247);
  auVar129 = vcmpps_avx(auVar129,auVar268,1);
  auVar28 = vrcpps_avx(auVar26);
  auVar129 = vblendvps_avx(auVar283,auVar268,auVar129);
  auVar397._8_4_ = 0x3f800000;
  auVar397._0_8_ = 0x3f8000003f800000;
  auVar397._12_4_ = 0x3f800000;
  auVar397._16_4_ = 0x3f800000;
  auVar397._20_4_ = 0x3f800000;
  auVar397._24_4_ = 0x3f800000;
  auVar397._28_4_ = 0x3f800000;
  fVar223 = auVar28._0_4_;
  fVar250 = auVar28._4_4_;
  auVar29._4_4_ = fVar250 * auVar26._4_4_;
  auVar29._0_4_ = fVar223 * auVar26._0_4_;
  fVar222 = auVar28._8_4_;
  auVar29._8_4_ = fVar222 * auVar26._8_4_;
  fVar251 = auVar28._12_4_;
  auVar29._12_4_ = fVar251 * auVar26._12_4_;
  fVar252 = auVar28._16_4_;
  auVar29._16_4_ = fVar252 * auVar26._16_4_;
  fVar253 = auVar28._20_4_;
  auVar29._20_4_ = fVar253 * auVar26._20_4_;
  fVar254 = auVar28._24_4_;
  auVar29._24_4_ = fVar254 * auVar26._24_4_;
  auVar29._28_4_ = auVar26._28_4_;
  auVar30 = vsubps_avx(auVar397,auVar29);
  fVar223 = fVar223 + fVar223 * auVar30._0_4_;
  fVar250 = fVar250 + fVar250 * auVar30._4_4_;
  fVar222 = fVar222 + fVar222 * auVar30._8_4_;
  fVar251 = fVar251 + fVar251 * auVar30._12_4_;
  fVar252 = fVar252 + fVar252 * auVar30._16_4_;
  fVar253 = fVar253 + fVar253 * auVar30._20_4_;
  fVar254 = fVar254 + fVar254 * auVar30._24_4_;
  auVar29 = vrcpps_avx(auVar27);
  fVar255 = auVar29._0_4_;
  fVar271 = auVar29._4_4_;
  auVar26._4_4_ = auVar27._4_4_ * fVar271;
  auVar26._0_4_ = auVar27._0_4_ * fVar255;
  fVar272 = auVar29._8_4_;
  auVar26._8_4_ = auVar27._8_4_ * fVar272;
  fVar273 = auVar29._12_4_;
  auVar26._12_4_ = auVar27._12_4_ * fVar273;
  fVar274 = auVar29._16_4_;
  auVar26._16_4_ = auVar27._16_4_ * fVar274;
  fVar275 = auVar29._20_4_;
  auVar26._20_4_ = auVar27._20_4_ * fVar275;
  fVar276 = auVar29._24_4_;
  auVar26._24_4_ = auVar27._24_4_ * fVar276;
  auVar26._28_4_ = 0x219392ef;
  auVar27 = vsubps_avx(auVar397,auVar26);
  auVar26 = vrcpps_avx(auVar129);
  fVar255 = fVar255 + fVar255 * auVar27._0_4_;
  fVar271 = fVar271 + fVar271 * auVar27._4_4_;
  fVar272 = fVar272 + fVar272 * auVar27._8_4_;
  fVar273 = fVar273 + fVar273 * auVar27._12_4_;
  fVar274 = fVar274 + fVar274 * auVar27._16_4_;
  fVar275 = fVar275 + fVar275 * auVar27._20_4_;
  fVar276 = fVar276 + fVar276 * auVar27._24_4_;
  fVar277 = auVar26._0_4_;
  fVar285 = auVar26._4_4_;
  auVar31._4_4_ = fVar285 * auVar129._4_4_;
  auVar31._0_4_ = fVar277 * auVar129._0_4_;
  fVar286 = auVar26._8_4_;
  auVar31._8_4_ = fVar286 * auVar129._8_4_;
  fVar287 = auVar26._12_4_;
  auVar31._12_4_ = fVar287 * auVar129._12_4_;
  fVar288 = auVar26._16_4_;
  auVar31._16_4_ = fVar288 * auVar129._16_4_;
  fVar289 = auVar26._20_4_;
  auVar31._20_4_ = fVar289 * auVar129._20_4_;
  fVar290 = auVar26._24_4_;
  auVar31._24_4_ = fVar290 * auVar129._24_4_;
  auVar31._28_4_ = auVar29._28_4_;
  auVar129 = vsubps_avx(auVar397,auVar31);
  fVar277 = fVar277 + fVar277 * auVar129._0_4_;
  fVar285 = fVar285 + fVar285 * auVar129._4_4_;
  fVar286 = fVar286 + fVar286 * auVar129._8_4_;
  fVar287 = fVar287 + fVar287 * auVar129._12_4_;
  fVar288 = fVar288 + fVar288 * auVar129._16_4_;
  fVar289 = fVar289 + fVar289 * auVar129._20_4_;
  fVar290 = fVar290 + fVar290 * auVar129._24_4_;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + uVar87 * 0xd + 6);
  auVar35 = vpmovsxwd_avx(auVar35);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar87 * 0xd + 0xe);
  auVar36 = vpmovsxwd_avx(auVar36);
  auVar299._16_16_ = auVar140;
  auVar299._0_16_ = auVar107;
  auVar322._16_16_ = auVar106;
  auVar322._0_16_ = auVar108;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar87 * 0x12 + 6);
  auVar107 = vpmovsxwd_avx(auVar37);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar87 * 0x12 + 0xe);
  auVar140 = vpmovsxwd_avx(auVar38);
  auVar108 = vpermilps_avx(ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) -
                                          *(float *)(prim + lVar89 + 0x16)) *
                                         *(float *)(prim + lVar89 + 0x1a))),0);
  auVar129 = vcvtdq2ps_avx(auVar299);
  auVar26 = vcvtdq2ps_avx(auVar322);
  auVar26 = vsubps_avx(auVar26,auVar129);
  fVar170 = auVar108._0_4_;
  fVar206 = auVar108._4_4_;
  fVar387 = auVar108._8_4_;
  fVar399 = auVar108._12_4_;
  auVar300._0_4_ = auVar26._0_4_ * fVar170 + auVar129._0_4_;
  auVar300._4_4_ = auVar26._4_4_ * fVar206 + auVar129._4_4_;
  auVar300._8_4_ = auVar26._8_4_ * fVar387 + auVar129._8_4_;
  auVar300._12_4_ = auVar26._12_4_ * fVar399 + auVar129._12_4_;
  auVar300._16_4_ = auVar26._16_4_ * fVar170 + auVar129._16_4_;
  auVar300._20_4_ = auVar26._20_4_ * fVar206 + auVar129._20_4_;
  auVar300._24_4_ = auVar26._24_4_ * fVar387 + auVar129._24_4_;
  auVar300._28_4_ = auVar26._28_4_ + auVar129._28_4_;
  auVar314._16_16_ = auVar229;
  auVar314._0_16_ = auVar34;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar87 * 0x16 + 6);
  auVar108 = vpmovsxwd_avx(auVar39);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar87 * 0x16 + 0xe);
  auVar106 = vpmovsxwd_avx(auVar40);
  auVar129 = vcvtdq2ps_avx(auVar314);
  auVar364._16_16_ = auVar36;
  auVar364._0_16_ = auVar35;
  auVar26 = vcvtdq2ps_avx(auVar364);
  auVar26 = vsubps_avx(auVar26,auVar129);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar87 * 0x14 + 6);
  auVar34 = vpmovsxwd_avx(auVar41);
  auVar315._0_4_ = auVar129._0_4_ + auVar26._0_4_ * fVar170;
  auVar315._4_4_ = auVar129._4_4_ + auVar26._4_4_ * fVar206;
  auVar315._8_4_ = auVar129._8_4_ + auVar26._8_4_ * fVar387;
  auVar315._12_4_ = auVar129._12_4_ + auVar26._12_4_ * fVar399;
  auVar315._16_4_ = auVar129._16_4_ + auVar26._16_4_ * fVar170;
  auVar315._20_4_ = auVar129._20_4_ + auVar26._20_4_ * fVar206;
  auVar315._24_4_ = auVar129._24_4_ + auVar26._24_4_ * fVar387;
  auVar315._28_4_ = auVar129._28_4_ + auVar26._28_4_;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar87 * 0x14 + 0xe);
  auVar229 = vpmovsxwd_avx(auVar42);
  auVar336._16_16_ = auVar140;
  auVar336._0_16_ = auVar107;
  auVar129 = vcvtdq2ps_avx(auVar336);
  auVar323._16_16_ = auVar106;
  auVar323._0_16_ = auVar108;
  auVar26 = vcvtdq2ps_avx(auVar323);
  auVar26 = vsubps_avx(auVar26,auVar129);
  auVar324._0_4_ = auVar129._0_4_ + auVar26._0_4_ * fVar170;
  auVar324._4_4_ = auVar129._4_4_ + auVar26._4_4_ * fVar206;
  auVar324._8_4_ = auVar129._8_4_ + auVar26._8_4_ * fVar387;
  auVar324._12_4_ = auVar129._12_4_ + auVar26._12_4_ * fVar399;
  auVar324._16_4_ = auVar129._16_4_ + auVar26._16_4_ * fVar170;
  auVar324._20_4_ = auVar129._20_4_ + auVar26._20_4_ * fVar206;
  auVar324._24_4_ = auVar129._24_4_ + auVar26._24_4_ * fVar387;
  auVar324._28_4_ = auVar129._28_4_ + auVar26._28_4_;
  auVar337._16_16_ = auVar229;
  auVar337._0_16_ = auVar34;
  auVar129 = vcvtdq2ps_avx(auVar337);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar87 * 0x18 + 6);
  auVar107 = vpmovsxwd_avx(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar87 * 0x18 + 0xe);
  auVar140 = vpmovsxwd_avx(auVar11);
  auVar348._16_16_ = auVar140;
  auVar348._0_16_ = auVar107;
  auVar26 = vcvtdq2ps_avx(auVar348);
  auVar26 = vsubps_avx(auVar26,auVar129);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar87 * 0x1d + 6);
  auVar107 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar87 * 0x1d + 0xe);
  auVar140 = vpmovsxwd_avx(auVar13);
  auVar338._0_4_ = auVar129._0_4_ + auVar26._0_4_ * fVar170;
  auVar338._4_4_ = auVar129._4_4_ + auVar26._4_4_ * fVar206;
  auVar338._8_4_ = auVar129._8_4_ + auVar26._8_4_ * fVar387;
  auVar338._12_4_ = auVar129._12_4_ + auVar26._12_4_ * fVar399;
  auVar338._16_4_ = auVar129._16_4_ + auVar26._16_4_ * fVar170;
  auVar338._20_4_ = auVar129._20_4_ + auVar26._20_4_ * fVar206;
  auVar338._24_4_ = auVar129._24_4_ + auVar26._24_4_ * fVar387;
  auVar338._28_4_ = auVar129._28_4_ + auVar26._28_4_;
  auVar349._16_16_ = auVar140;
  auVar349._0_16_ = auVar107;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar87 * 0x21 + 6);
  auVar107 = vpmovsxwd_avx(auVar14);
  auVar129 = vcvtdq2ps_avx(auVar349);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar87 * 0x21 + 0xe);
  auVar140 = vpmovsxwd_avx(auVar15);
  auVar365._16_16_ = auVar140;
  auVar365._0_16_ = auVar107;
  auVar26 = vcvtdq2ps_avx(auVar365);
  auVar26 = vsubps_avx(auVar26,auVar129);
  auVar350._0_4_ = auVar129._0_4_ + auVar26._0_4_ * fVar170;
  auVar350._4_4_ = auVar129._4_4_ + auVar26._4_4_ * fVar206;
  auVar350._8_4_ = auVar129._8_4_ + auVar26._8_4_ * fVar387;
  auVar350._12_4_ = auVar129._12_4_ + auVar26._12_4_ * fVar399;
  auVar350._16_4_ = auVar129._16_4_ + auVar26._16_4_ * fVar170;
  auVar350._20_4_ = auVar129._20_4_ + auVar26._20_4_ * fVar206;
  auVar350._24_4_ = auVar129._24_4_ + auVar26._24_4_ * fVar387;
  auVar350._28_4_ = auVar129._28_4_ + auVar26._28_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar87 * 0x1f + 6);
  auVar107 = vpmovsxwd_avx(auVar16);
  auVar115._8_8_ = 0;
  auVar115._0_8_ = *(ulong *)(prim + uVar87 * 0x1f + 0xe);
  auVar140 = vpmovsxwd_avx(auVar115);
  auVar366._16_16_ = auVar140;
  auVar366._0_16_ = auVar107;
  auVar129 = vcvtdq2ps_avx(auVar366);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar87 * 0x23 + 6);
  auVar107 = vpmovsxwd_avx(auVar17);
  auVar197._8_8_ = 0;
  auVar197._0_8_ = *(ulong *)(prim + uVar87 * 0x23 + 0xe);
  auVar140 = vpmovsxwd_avx(auVar197);
  auVar381._16_16_ = auVar140;
  auVar381._0_16_ = auVar107;
  auVar26 = vcvtdq2ps_avx(auVar381);
  auVar26 = vsubps_avx(auVar26,auVar129);
  auVar367._0_4_ = auVar129._0_4_ + auVar26._0_4_ * fVar170;
  auVar367._4_4_ = auVar129._4_4_ + auVar26._4_4_ * fVar206;
  auVar367._8_4_ = auVar129._8_4_ + auVar26._8_4_ * fVar387;
  auVar367._12_4_ = auVar129._12_4_ + auVar26._12_4_ * fVar399;
  auVar367._16_4_ = auVar129._16_4_ + auVar26._16_4_ * fVar170;
  auVar367._20_4_ = auVar129._20_4_ + auVar26._20_4_ * fVar206;
  auVar367._24_4_ = auVar129._24_4_ + auVar26._24_4_ * fVar387;
  auVar367._28_4_ = auVar129._28_4_ + fVar399;
  auVar129 = vsubps_avx(auVar300,auVar202);
  auVar147._0_4_ = fVar223 * auVar129._0_4_;
  auVar147._4_4_ = fVar250 * auVar129._4_4_;
  auVar147._8_4_ = fVar222 * auVar129._8_4_;
  auVar147._12_4_ = fVar251 * auVar129._12_4_;
  auVar32._16_4_ = fVar252 * auVar129._16_4_;
  auVar32._0_16_ = auVar147;
  auVar32._20_4_ = fVar253 * auVar129._20_4_;
  auVar32._24_4_ = fVar254 * auVar129._24_4_;
  auVar32._28_4_ = auVar129._28_4_;
  auVar129 = vsubps_avx(auVar315,auVar202);
  auVar224._0_4_ = fVar223 * auVar129._0_4_;
  auVar224._4_4_ = fVar250 * auVar129._4_4_;
  auVar224._8_4_ = fVar222 * auVar129._8_4_;
  auVar224._12_4_ = fVar251 * auVar129._12_4_;
  auVar33._16_4_ = fVar252 * auVar129._16_4_;
  auVar33._0_16_ = auVar224;
  auVar33._20_4_ = fVar253 * auVar129._20_4_;
  auVar33._24_4_ = fVar254 * auVar129._24_4_;
  auVar33._28_4_ = auVar28._28_4_ + auVar30._28_4_;
  auVar129 = vsubps_avx(auVar324,auVar163);
  auVar183._0_4_ = fVar255 * auVar129._0_4_;
  auVar183._4_4_ = fVar271 * auVar129._4_4_;
  auVar183._8_4_ = fVar272 * auVar129._8_4_;
  auVar183._12_4_ = fVar273 * auVar129._12_4_;
  auVar28._16_4_ = fVar274 * auVar129._16_4_;
  auVar28._0_16_ = auVar183;
  auVar28._20_4_ = fVar275 * auVar129._20_4_;
  auVar28._24_4_ = fVar276 * auVar129._24_4_;
  auVar28._28_4_ = auVar129._28_4_;
  auVar129 = vsubps_avx(auVar338,auVar163);
  auVar256._0_4_ = fVar255 * auVar129._0_4_;
  auVar256._4_4_ = fVar271 * auVar129._4_4_;
  auVar256._8_4_ = fVar272 * auVar129._8_4_;
  auVar256._12_4_ = fVar273 * auVar129._12_4_;
  auVar30._16_4_ = fVar274 * auVar129._16_4_;
  auVar30._0_16_ = auVar256;
  auVar30._20_4_ = fVar275 * auVar129._20_4_;
  auVar30._24_4_ = fVar276 * auVar129._24_4_;
  auVar30._28_4_ = auVar29._28_4_ + auVar27._28_4_;
  auVar129 = vsubps_avx(auVar350,auVar127);
  auVar146._0_4_ = fVar277 * auVar129._0_4_;
  auVar146._4_4_ = fVar285 * auVar129._4_4_;
  auVar146._8_4_ = fVar286 * auVar129._8_4_;
  auVar146._12_4_ = fVar287 * auVar129._12_4_;
  auVar27._16_4_ = fVar288 * auVar129._16_4_;
  auVar27._0_16_ = auVar146;
  auVar27._20_4_ = fVar289 * auVar129._20_4_;
  auVar27._24_4_ = fVar290 * auVar129._24_4_;
  auVar27._28_4_ = auVar129._28_4_;
  auVar129 = vsubps_avx(auVar367,auVar127);
  auVar96._0_4_ = fVar277 * auVar129._0_4_;
  auVar96._4_4_ = fVar285 * auVar129._4_4_;
  auVar96._8_4_ = fVar286 * auVar129._8_4_;
  auVar96._12_4_ = fVar287 * auVar129._12_4_;
  auVar44._16_4_ = fVar288 * auVar129._16_4_;
  auVar44._0_16_ = auVar96;
  auVar44._20_4_ = fVar289 * auVar129._20_4_;
  auVar44._24_4_ = fVar290 * auVar129._24_4_;
  auVar44._28_4_ = auVar129._28_4_;
  auVar107 = vpminsd_avx(auVar32._16_16_,auVar33._16_16_);
  auVar140 = vpminsd_avx(auVar147,auVar224);
  auVar339._16_16_ = auVar107;
  auVar339._0_16_ = auVar140;
  auVar107 = vpminsd_avx(auVar28._16_16_,auVar30._16_16_);
  auVar140 = vpminsd_avx(auVar183,auVar256);
  auVar351._16_16_ = auVar107;
  auVar351._0_16_ = auVar140;
  auVar129 = vmaxps_avx(auVar339,auVar351);
  auVar107 = vpminsd_avx(auVar27._16_16_,auVar44._16_16_);
  auVar140 = vpminsd_avx(auVar146,auVar96);
  uVar92 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar405._4_4_ = uVar92;
  auVar405._0_4_ = uVar92;
  auVar405._8_4_ = uVar92;
  auVar405._12_4_ = uVar92;
  auVar405._16_4_ = uVar92;
  auVar405._20_4_ = uVar92;
  auVar405._24_4_ = uVar92;
  auVar405._28_4_ = uVar92;
  auVar382._16_16_ = auVar107;
  auVar382._0_16_ = auVar140;
  auVar26 = vmaxps_avx(auVar382,auVar405);
  auVar129 = vmaxps_avx(auVar129,auVar26);
  local_198._4_4_ = auVar129._4_4_ * 0.99999964;
  local_198._0_4_ = auVar129._0_4_ * 0.99999964;
  local_198._8_4_ = auVar129._8_4_ * 0.99999964;
  local_198._12_4_ = auVar129._12_4_ * 0.99999964;
  local_198._16_4_ = auVar129._16_4_ * 0.99999964;
  local_198._20_4_ = auVar129._20_4_ * 0.99999964;
  local_198._24_4_ = auVar129._24_4_ * 0.99999964;
  local_198._28_4_ = auVar129._28_4_;
  auVar107 = vpmaxsd_avx(auVar32._16_16_,auVar33._16_16_);
  auVar140 = vpmaxsd_avx(auVar147,auVar224);
  auVar220._16_16_ = auVar107;
  auVar220._0_16_ = auVar140;
  auVar107 = vpmaxsd_avx(auVar28._16_16_,auVar30._16_16_);
  auVar140 = vpmaxsd_avx(auVar183,auVar256);
  auVar203._16_16_ = auVar107;
  auVar203._0_16_ = auVar140;
  auVar129 = vminps_avx(auVar220,auVar203);
  auVar107 = vpmaxsd_avx(auVar27._16_16_,auVar44._16_16_);
  auVar140 = vpmaxsd_avx(auVar146,auVar96);
  auVar128._16_16_ = auVar107;
  auVar128._0_16_ = auVar140;
  uVar92 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar164._4_4_ = uVar92;
  auVar164._0_4_ = uVar92;
  auVar164._8_4_ = uVar92;
  auVar164._12_4_ = uVar92;
  auVar164._16_4_ = uVar92;
  auVar164._20_4_ = uVar92;
  auVar164._24_4_ = uVar92;
  auVar164._28_4_ = uVar92;
  auVar26 = vminps_avx(auVar128,auVar164);
  auVar129 = vminps_avx(auVar129,auVar26);
  auVar45._4_4_ = auVar129._4_4_ * 1.0000004;
  auVar45._0_4_ = auVar129._0_4_ * 1.0000004;
  auVar45._8_4_ = auVar129._8_4_ * 1.0000004;
  auVar45._12_4_ = auVar129._12_4_ * 1.0000004;
  auVar45._16_4_ = auVar129._16_4_ * 1.0000004;
  auVar45._20_4_ = auVar129._20_4_ * 1.0000004;
  auVar45._24_4_ = auVar129._24_4_ * 1.0000004;
  auVar45._28_4_ = auVar129._28_4_;
  auVar129 = vcmpps_avx(local_198,auVar45,2);
  auVar107 = vpshufd_avx(ZEXT116((byte)PVar18),0);
  auVar165._16_16_ = auVar107;
  auVar165._0_16_ = auVar107;
  auVar26 = vcvtdq2ps_avx(auVar165);
  auVar26 = vcmpps_avx(_DAT_01f7b060,auVar26,1);
  auVar129 = vandps_avx(auVar129,auVar26);
  uVar92 = vmovmskps_avx(auVar129);
  uVar87 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),uVar92);
  auVar129._16_16_ = mm_lookupmask_ps._240_16_;
  auVar129._0_16_ = mm_lookupmask_ps._240_16_;
  local_178 = vblendps_avx(auVar129,ZEXT832(0) << 0x20,0x80);
  local_458 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  auVar107 = (undefined1  [16])0x0;
  local_450 = prim;
LAB_00ac0b2b:
  if (uVar87 == 0) {
LAB_00ac2da5:
    return uVar87 != 0;
  }
  lVar89 = 0;
  if (uVar87 != 0) {
    for (; (uVar87 >> lVar89 & 1) == 0; lVar89 = lVar89 + 1) {
    }
  }
  uVar86 = *(uint *)(local_450 + 2);
  pGVar19 = (context->scene->geometries).items[uVar86].ptr;
  fVar255 = (pGVar19->time_range).lower;
  fVar255 = pGVar19->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar255) / ((pGVar19->time_range).upper - fVar255));
  auVar140 = vroundss_avx(ZEXT416((uint)fVar255),ZEXT416((uint)fVar255),9);
  auVar140 = vminss_avx(auVar140,ZEXT416((uint)(pGVar19->fnumTimeSegments + -1.0)));
  auVar107 = vmaxss_avx(auVar107,auVar140);
  uVar90 = (ulong)*(uint *)(*(long *)&pGVar19->field_0x58 +
                           (ulong)*(uint *)(local_450 + lVar89 * 4 + 6) *
                           pGVar19[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var20 = pGVar19[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar93 = (long)(int)auVar107._0_4_ * 0x38;
  lVar21 = *(long *)(_Var20 + lVar93);
  lVar22 = *(long *)(_Var20 + 0x10 + lVar93);
  pfVar4 = (float *)(lVar21 + lVar22 * uVar90);
  fVar170 = *pfVar4;
  fVar271 = pfVar4[1];
  fVar206 = pfVar4[2];
  fVar272 = pfVar4[3];
  lVar1 = uVar90 + 1;
  pfVar4 = (float *)(lVar21 + lVar22 * lVar1);
  lVar2 = uVar90 + 2;
  pfVar5 = (float *)(lVar21 + lVar22 * lVar2);
  lVar3 = uVar90 + 3;
  pfVar6 = (float *)(lVar21 + lVar22 * lVar3);
  fVar387 = *pfVar6;
  fVar273 = pfVar6[1];
  fVar399 = pfVar6[2];
  fVar274 = pfVar6[3];
  lVar21 = *(long *)&pGVar19[4].fnumTimeSegments;
  lVar22 = *(long *)(lVar21 + lVar93);
  lVar23 = *(long *)(lVar21 + 0x10 + lVar93);
  pfVar6 = (float *)(lVar22 + lVar23 * uVar90);
  fVar275 = *pfVar6;
  fVar276 = pfVar6[1];
  fVar223 = pfVar6[2];
  fVar250 = pfVar6[3];
  pfVar6 = (float *)(lVar22 + lVar23 * lVar1);
  pfVar7 = (float *)(lVar22 + lVar23 * lVar2);
  fVar255 = fVar255 - auVar107._0_4_;
  pfVar8 = (float *)(lVar22 + lVar23 * lVar3);
  fVar222 = *pfVar8;
  fVar251 = pfVar8[1];
  fVar252 = pfVar8[2];
  fVar253 = pfVar8[3];
  fVar287 = *pfVar5 * 0.0;
  fVar288 = pfVar5[1] * 0.0;
  fVar289 = pfVar5[2] * 0.0;
  fVar290 = pfVar5[3] * 0.0;
  fVar254 = fVar287 + fVar387 * 0.0;
  fVar277 = fVar288 + fVar273 * 0.0;
  fVar285 = fVar289 + fVar399 * 0.0;
  fVar286 = fVar290 + fVar274 * 0.0;
  fVar341 = *pfVar4 * 0.0;
  fVar354 = pfVar4[1] * 0.0;
  fVar356 = pfVar4[2] * 0.0;
  fVar358 = pfVar4[3] * 0.0;
  local_628._0_4_ = fVar170 + fVar341 + fVar254;
  local_628._4_4_ = fVar271 + fVar354 + fVar277;
  fStack_620 = fVar206 + fVar356 + fVar285;
  fStack_61c = fVar272 + fVar358 + fVar286;
  auVar97._0_4_ = *pfVar4 * 3.0 + fVar254;
  auVar97._4_4_ = pfVar4[1] * 3.0 + fVar277;
  auVar97._8_4_ = pfVar4[2] * 3.0 + fVar285;
  auVar97._12_4_ = pfVar4[3] * 3.0 + fVar286;
  auVar171._0_4_ = fVar170 * 3.0;
  auVar171._4_4_ = fVar271 * 3.0;
  auVar171._8_4_ = fVar206 * 3.0;
  auVar171._12_4_ = fVar272 * 3.0;
  auVar35 = vsubps_avx(auVar97,auVar171);
  fVar360 = *pfVar7 * 0.0;
  fVar368 = pfVar7[1] * 0.0;
  fVar369 = pfVar7[2] * 0.0;
  fVar370 = pfVar7[3] * 0.0;
  fVar254 = fVar360 + fVar222 * 0.0;
  fVar277 = fVar368 + fVar251 * 0.0;
  fVar285 = fVar369 + fVar252 * 0.0;
  fVar286 = fVar370 + fVar253 * 0.0;
  fVar375 = *pfVar6 * 0.0;
  fVar383 = pfVar6[1] * 0.0;
  fVar384 = pfVar6[2] * 0.0;
  fVar385 = pfVar6[3] * 0.0;
  auVar388._0_4_ = fVar375 + fVar254 + fVar275;
  auVar388._4_4_ = fVar383 + fVar277 + fVar276;
  auVar388._8_4_ = fVar384 + fVar285 + fVar223;
  auVar388._12_4_ = fVar385 + fVar286 + fVar250;
  auVar98._0_4_ = *pfVar6 * 3.0 + fVar254;
  auVar98._4_4_ = pfVar6[1] * 3.0 + fVar277;
  auVar98._8_4_ = pfVar6[2] * 3.0 + fVar285;
  auVar98._12_4_ = pfVar6[3] * 3.0 + fVar286;
  auVar278._0_4_ = fVar275 * 3.0;
  auVar278._4_4_ = fVar276 * 3.0;
  auVar278._8_4_ = fVar223 * 3.0;
  auVar278._12_4_ = fVar250 * 3.0;
  auVar106 = vsubps_avx(auVar98,auVar278);
  auVar207._0_4_ = fVar170 * 0.0;
  auVar207._4_4_ = fVar271 * 0.0;
  auVar207._8_4_ = fVar206 * 0.0;
  auVar207._12_4_ = fVar272 * 0.0;
  auVar279._0_4_ = auVar207._0_4_ + fVar341 + fVar287 + fVar387;
  auVar279._4_4_ = auVar207._4_4_ + fVar354 + fVar288 + fVar273;
  auVar279._8_4_ = auVar207._8_4_ + fVar356 + fVar289 + fVar399;
  auVar279._12_4_ = auVar207._12_4_ + fVar358 + fVar290 + fVar274;
  auVar291._0_4_ = fVar387 * 3.0;
  auVar291._4_4_ = fVar273 * 3.0;
  auVar291._8_4_ = fVar399 * 3.0;
  auVar291._12_4_ = fVar274 * 3.0;
  auVar225._0_4_ = *pfVar5 * 3.0;
  auVar225._4_4_ = pfVar5[1] * 3.0;
  auVar225._8_4_ = pfVar5[2] * 3.0;
  auVar225._12_4_ = pfVar5[3] * 3.0;
  auVar107 = vsubps_avx(auVar291,auVar225);
  auVar226._0_4_ = fVar341 + auVar107._0_4_;
  auVar226._4_4_ = fVar354 + auVar107._4_4_;
  auVar226._8_4_ = fVar356 + auVar107._8_4_;
  auVar226._12_4_ = fVar358 + auVar107._12_4_;
  auVar36 = vsubps_avx(auVar226,auVar207);
  auVar227._0_4_ = fVar275 * 0.0;
  auVar227._4_4_ = fVar276 * 0.0;
  auVar227._8_4_ = fVar223 * 0.0;
  auVar227._12_4_ = fVar250 * 0.0;
  auVar208._0_4_ = auVar227._0_4_ + fVar375 + fVar360 + fVar222;
  auVar208._4_4_ = auVar227._4_4_ + fVar383 + fVar368 + fVar251;
  auVar208._8_4_ = auVar227._8_4_ + fVar384 + fVar369 + fVar252;
  auVar208._12_4_ = auVar227._12_4_ + fVar385 + fVar370 + fVar253;
  auVar257._0_4_ = fVar222 * 3.0;
  auVar257._4_4_ = fVar251 * 3.0;
  auVar257._8_4_ = fVar252 * 3.0;
  auVar257._12_4_ = fVar253 * 3.0;
  auVar292._0_4_ = *pfVar7 * 3.0;
  auVar292._4_4_ = pfVar7[1] * 3.0;
  auVar292._8_4_ = pfVar7[2] * 3.0;
  auVar292._12_4_ = pfVar7[3] * 3.0;
  auVar107 = vsubps_avx(auVar257,auVar292);
  auVar258._0_4_ = fVar375 + auVar107._0_4_;
  auVar258._4_4_ = fVar383 + auVar107._4_4_;
  auVar258._8_4_ = fVar384 + auVar107._8_4_;
  auVar258._12_4_ = fVar385 + auVar107._12_4_;
  auVar229 = vsubps_avx(auVar258,auVar227);
  auVar107 = vshufps_avx(auVar35,auVar35,0xc9);
  auVar140 = vshufps_avx(auVar388,auVar388,0xc9);
  fVar254 = auVar35._0_4_;
  auVar293._0_4_ = fVar254 * auVar140._0_4_;
  fVar277 = auVar35._4_4_;
  auVar293._4_4_ = fVar277 * auVar140._4_4_;
  fVar285 = auVar35._8_4_;
  auVar293._8_4_ = fVar285 * auVar140._8_4_;
  fVar286 = auVar35._12_4_;
  auVar293._12_4_ = fVar286 * auVar140._12_4_;
  auVar302._0_4_ = auVar388._0_4_ * auVar107._0_4_;
  auVar302._4_4_ = auVar388._4_4_ * auVar107._4_4_;
  auVar302._8_4_ = auVar388._8_4_ * auVar107._8_4_;
  auVar302._12_4_ = auVar388._12_4_ * auVar107._12_4_;
  auVar140 = vsubps_avx(auVar302,auVar293);
  auVar108 = vshufps_avx(auVar140,auVar140,0xc9);
  auVar140 = vshufps_avx(auVar106,auVar106,0xc9);
  auVar303._0_4_ = auVar140._0_4_ * fVar254;
  auVar303._4_4_ = auVar140._4_4_ * fVar277;
  auVar303._8_4_ = auVar140._8_4_ * fVar285;
  auVar303._12_4_ = auVar140._12_4_ * fVar286;
  auVar99._0_4_ = auVar107._0_4_ * auVar106._0_4_;
  auVar99._4_4_ = auVar107._4_4_ * auVar106._4_4_;
  auVar99._8_4_ = auVar107._8_4_ * auVar106._8_4_;
  auVar99._12_4_ = auVar107._12_4_ * auVar106._12_4_;
  auVar107 = vsubps_avx(auVar99,auVar303);
  auVar106 = vshufps_avx(auVar107,auVar107,0xc9);
  auVar107 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar140 = vshufps_avx(auVar208,auVar208,0xc9);
  fVar375 = auVar36._0_4_;
  auVar304._0_4_ = fVar375 * auVar140._0_4_;
  fVar383 = auVar36._4_4_;
  auVar304._4_4_ = fVar383 * auVar140._4_4_;
  fVar384 = auVar36._8_4_;
  auVar304._8_4_ = fVar384 * auVar140._8_4_;
  fVar385 = auVar36._12_4_;
  auVar304._12_4_ = fVar385 * auVar140._12_4_;
  auVar209._0_4_ = auVar107._0_4_ * auVar208._0_4_;
  auVar209._4_4_ = auVar107._4_4_ * auVar208._4_4_;
  auVar209._8_4_ = auVar107._8_4_ * auVar208._8_4_;
  auVar209._12_4_ = auVar107._12_4_ * auVar208._12_4_;
  auVar140 = vsubps_avx(auVar209,auVar304);
  auVar34 = vshufps_avx(auVar140,auVar140,0xc9);
  auVar140 = vshufps_avx(auVar229,auVar229,0xc9);
  auVar305._0_4_ = fVar375 * auVar140._0_4_;
  auVar305._4_4_ = fVar383 * auVar140._4_4_;
  auVar305._8_4_ = fVar384 * auVar140._8_4_;
  auVar305._12_4_ = fVar385 * auVar140._12_4_;
  auVar228._0_4_ = auVar107._0_4_ * auVar229._0_4_;
  auVar228._4_4_ = auVar107._4_4_ * auVar229._4_4_;
  auVar228._8_4_ = auVar107._8_4_ * auVar229._8_4_;
  auVar228._12_4_ = auVar107._12_4_ * auVar229._12_4_;
  auVar37 = vsubps_avx(auVar228,auVar305);
  auVar107 = vdpps_avx(auVar108,auVar108,0x7f);
  fVar271 = auVar107._0_4_;
  auVar329._4_12_ = ZEXT812(0) << 0x20;
  auVar329._0_4_ = fVar271;
  auVar140 = vrsqrtss_avx(auVar329,auVar329);
  fVar170 = auVar140._0_4_;
  auVar140 = vdpps_avx(auVar108,auVar106,0x7f);
  auVar229 = ZEXT416((uint)(fVar170 * 1.5 - fVar271 * 0.5 * fVar170 * fVar170 * fVar170));
  auVar229 = vshufps_avx(auVar229,auVar229,0);
  fVar222 = auVar229._0_4_ * auVar108._0_4_;
  fVar251 = auVar229._4_4_ * auVar108._4_4_;
  fVar252 = auVar229._8_4_ * auVar108._8_4_;
  fVar253 = auVar229._12_4_ * auVar108._12_4_;
  auVar107 = vshufps_avx(auVar107,auVar107,0);
  auVar100._0_4_ = auVar107._0_4_ * auVar106._0_4_;
  auVar100._4_4_ = auVar107._4_4_ * auVar106._4_4_;
  auVar100._8_4_ = auVar107._8_4_ * auVar106._8_4_;
  auVar100._12_4_ = auVar107._12_4_ * auVar106._12_4_;
  auVar107 = vshufps_avx(auVar140,auVar140,0);
  auVar294._0_4_ = auVar107._0_4_ * auVar108._0_4_;
  auVar294._4_4_ = auVar107._4_4_ * auVar108._4_4_;
  auVar294._8_4_ = auVar107._8_4_ * auVar108._8_4_;
  auVar294._12_4_ = auVar107._12_4_ * auVar108._12_4_;
  auVar38 = vsubps_avx(auVar100,auVar294);
  auVar107 = vrcpss_avx(auVar329,auVar329);
  auVar107 = ZEXT416((uint)((2.0 - fVar271 * auVar107._0_4_) * auVar107._0_4_));
  auVar108 = vshufps_avx(auVar107,auVar107,0);
  auVar107 = vdpps_avx(auVar34,auVar34,0x7f);
  fVar287 = auVar107._0_4_;
  auVar389._4_12_ = ZEXT812(0) << 0x20;
  auVar389._0_4_ = fVar287;
  auVar140 = vrsqrtss_avx(auVar389,auVar389);
  fVar275 = auVar140._0_4_;
  lVar22 = *(long *)(_Var20 + 0x38 + lVar93);
  lVar23 = *(long *)(_Var20 + 0x48 + lVar93);
  pfVar4 = (float *)(lVar22 + lVar23 * uVar90);
  fVar170 = *pfVar4;
  fVar271 = pfVar4[1];
  fVar206 = pfVar4[2];
  fVar272 = pfVar4[3];
  pfVar4 = (float *)(lVar22 + lVar23 * lVar1);
  pfVar5 = (float *)(lVar22 + lVar23 * lVar2);
  auVar140 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar107 = vshufps_avx(auVar107,auVar107,0);
  auVar376._0_4_ = auVar107._0_4_ * auVar140._0_4_;
  auVar376._4_4_ = auVar107._4_4_ * auVar140._4_4_;
  auVar376._8_4_ = auVar107._8_4_ * auVar140._8_4_;
  auVar376._12_4_ = auVar107._12_4_ * auVar140._12_4_;
  auVar107 = vdpps_avx(auVar34,auVar140,0x7f);
  auVar107 = vshufps_avx(auVar107,auVar107,0);
  auVar101._0_4_ = auVar34._0_4_ * auVar107._0_4_;
  auVar101._4_4_ = auVar34._4_4_ * auVar107._4_4_;
  auVar101._8_4_ = auVar34._8_4_ * auVar107._8_4_;
  auVar101._12_4_ = auVar34._12_4_ * auVar107._12_4_;
  auVar37 = vsubps_avx(auVar376,auVar101);
  pfVar6 = (float *)(lVar22 + lVar23 * lVar3);
  fVar387 = *pfVar6;
  fVar273 = pfVar6[1];
  fVar399 = pfVar6[2];
  fVar274 = pfVar6[3];
  auVar107 = ZEXT416((uint)(fVar275 * 1.5 - fVar275 * fVar275 * fVar275 * fVar287 * 0.5));
  auVar140 = vshufps_avx(auVar107,auVar107,0);
  fVar275 = auVar34._0_4_ * auVar140._0_4_;
  fVar276 = auVar34._4_4_ * auVar140._4_4_;
  fVar223 = auVar34._8_4_ * auVar140._8_4_;
  fVar250 = auVar34._12_4_ * auVar140._12_4_;
  auVar107 = vrcpss_avx(auVar389,auVar389);
  auVar107 = ZEXT416((uint)(auVar107._0_4_ * (2.0 - fVar287 * auVar107._0_4_)));
  auVar107 = vshufps_avx(auVar107,auVar107,0);
  auVar106 = vshufps_avx(_local_628,_local_628,0xff);
  auVar390._0_4_ = auVar106._0_4_ * fVar222;
  auVar390._4_4_ = auVar106._4_4_ * fVar251;
  auVar390._8_4_ = auVar106._8_4_ * fVar252;
  auVar390._12_4_ = auVar106._12_4_ * fVar253;
  auVar34 = vshufps_avx(auVar35,auVar35,0xff);
  auVar39 = vsubps_avx(_local_628,auVar390);
  auVar295._0_4_ =
       auVar34._0_4_ * fVar222 + auVar106._0_4_ * auVar229._0_4_ * auVar38._0_4_ * auVar108._0_4_;
  auVar295._4_4_ =
       auVar34._4_4_ * fVar251 + auVar106._4_4_ * auVar229._4_4_ * auVar38._4_4_ * auVar108._4_4_;
  auVar295._8_4_ =
       auVar34._8_4_ * fVar252 + auVar106._8_4_ * auVar229._8_4_ * auVar38._8_4_ * auVar108._8_4_;
  auVar295._12_4_ =
       auVar34._12_4_ * fVar253 +
       auVar106._12_4_ * auVar229._12_4_ * auVar38._12_4_ * auVar108._12_4_;
  auVar35 = vsubps_avx(auVar35,auVar295);
  local_628._0_4_ = (float)local_628._0_4_ + auVar390._0_4_;
  local_628._4_4_ = (float)local_628._4_4_ + auVar390._4_4_;
  fStack_620 = fStack_620 + auVar390._8_4_;
  fStack_61c = fStack_61c + auVar390._12_4_;
  auVar108 = vshufps_avx(auVar279,auVar279,0xff);
  auVar172._0_4_ = auVar108._0_4_ * fVar275;
  auVar172._4_4_ = auVar108._4_4_ * fVar276;
  auVar172._8_4_ = auVar108._8_4_ * fVar223;
  auVar172._12_4_ = auVar108._12_4_ * fVar250;
  auVar106 = vshufps_avx(auVar36,auVar36,0xff);
  auVar38 = vsubps_avx(auVar279,auVar172);
  auVar102._0_4_ =
       auVar106._0_4_ * fVar275 + auVar108._0_4_ * auVar140._0_4_ * auVar107._0_4_ * auVar37._0_4_;
  auVar102._4_4_ =
       auVar106._4_4_ * fVar276 + auVar108._4_4_ * auVar140._4_4_ * auVar107._4_4_ * auVar37._4_4_;
  auVar102._8_4_ =
       auVar106._8_4_ * fVar223 + auVar108._8_4_ * auVar140._8_4_ * auVar107._8_4_ * auVar37._8_4_;
  auVar102._12_4_ =
       auVar106._12_4_ * fVar250 +
       auVar108._12_4_ * auVar140._12_4_ * auVar107._12_4_ * auVar37._12_4_;
  auVar36 = vsubps_avx(auVar36,auVar102);
  p00.field_0.v[1] = auVar279._4_4_ + auVar172._4_4_;
  p00.field_0.v[0] = auVar279._0_4_ + auVar172._0_4_;
  p00.field_0.v[2] = auVar279._8_4_ + auVar172._8_4_;
  p00.field_0.v[3] = auVar279._12_4_ + auVar172._12_4_;
  fVar341 = *pfVar5 * 0.0;
  fVar354 = pfVar5[1] * 0.0;
  fVar356 = pfVar5[2] * 0.0;
  fVar358 = pfVar5[3] * 0.0;
  fVar400 = fVar341 + fVar387 * 0.0;
  fVar407 = fVar354 + fVar273 * 0.0;
  fVar408 = fVar356 + fVar399 * 0.0;
  fVar410 = fVar358 + fVar274 * 0.0;
  auVar103._0_4_ = fVar400 + *pfVar4 * 3.0;
  auVar103._4_4_ = fVar407 + pfVar4[1] * 3.0;
  auVar103._8_4_ = fVar408 + pfVar4[2] * 3.0;
  auVar103._12_4_ = fVar410 + pfVar4[3] * 3.0;
  auVar173._0_4_ = fVar170 * 3.0;
  auVar173._4_4_ = fVar271 * 3.0;
  auVar173._8_4_ = fVar206 * 3.0;
  auVar173._12_4_ = fVar272 * 3.0;
  auVar37 = vsubps_avx(auVar103,auVar173);
  lVar22 = *(long *)(lVar21 + 0x38 + lVar93);
  lVar21 = *(long *)(lVar21 + 0x48 + lVar93);
  auVar107 = *(undefined1 (*) [16])(lVar22 + lVar2 * lVar21);
  pfVar6 = (float *)(lVar22 + lVar21 * lVar3);
  fVar275 = *pfVar6;
  fVar276 = pfVar6[1];
  fVar223 = pfVar6[2];
  fVar250 = pfVar6[3];
  fVar287 = auVar107._0_4_ * 0.0;
  fVar288 = auVar107._4_4_ * 0.0;
  fVar289 = auVar107._8_4_ * 0.0;
  fVar290 = auVar107._12_4_ * 0.0;
  fVar360 = fVar287 + fVar275 * 0.0;
  fVar368 = fVar288 + fVar276 * 0.0;
  fVar369 = fVar289 + fVar223 * 0.0;
  fVar370 = fVar290 + fVar250 * 0.0;
  pfVar6 = (float *)(lVar22 + lVar1 * lVar21);
  auVar391._0_4_ = *pfVar6 * 3.0 + fVar360;
  auVar391._4_4_ = pfVar6[1] * 3.0 + fVar368;
  auVar391._8_4_ = pfVar6[2] * 3.0 + fVar369;
  auVar391._12_4_ = pfVar6[3] * 3.0 + fVar370;
  pfVar7 = (float *)(lVar22 + uVar90 * lVar21);
  fVar222 = *pfVar7;
  fVar251 = pfVar7[1];
  fVar252 = pfVar7[2];
  fVar253 = pfVar7[3];
  auVar306._0_4_ = fVar222 * 3.0;
  auVar306._4_4_ = fVar251 * 3.0;
  auVar306._8_4_ = fVar252 * 3.0;
  auVar306._12_4_ = fVar253 * 3.0;
  auVar140 = vsubps_avx(auVar391,auVar306);
  auVar307._0_4_ = fVar387 * 3.0;
  auVar307._4_4_ = fVar273 * 3.0;
  auVar307._8_4_ = fVar399 * 3.0;
  auVar307._12_4_ = fVar274 * 3.0;
  auVar361._0_4_ = *pfVar5 * 3.0;
  auVar361._4_4_ = pfVar5[1] * 3.0;
  auVar361._8_4_ = pfVar5[2] * 3.0;
  auVar361._12_4_ = pfVar5[3] * 3.0;
  auVar108 = vsubps_avx(auVar307,auVar361);
  fVar342 = *pfVar4 * 0.0;
  fVar355 = pfVar4[1] * 0.0;
  fVar357 = pfVar4[2] * 0.0;
  fVar359 = pfVar4[3] * 0.0;
  auVar308._0_4_ = fVar342 + auVar108._0_4_;
  auVar308._4_4_ = fVar355 + auVar108._4_4_;
  auVar308._8_4_ = fVar357 + auVar108._8_4_;
  auVar308._12_4_ = fVar359 + auVar108._12_4_;
  auVar362._0_4_ = fVar170 + fVar342 + fVar400;
  auVar362._4_4_ = fVar271 + fVar355 + fVar407;
  auVar362._8_4_ = fVar206 + fVar357 + fVar408;
  auVar362._12_4_ = fVar272 + fVar359 + fVar410;
  auVar330._0_4_ = fVar170 * 0.0;
  auVar330._4_4_ = fVar271 * 0.0;
  auVar330._8_4_ = fVar206 * 0.0;
  auVar330._12_4_ = fVar272 * 0.0;
  local_5a8._0_4_ = auVar330._0_4_ + fVar342 + fVar387 + fVar341;
  local_5a8._4_4_ = auVar330._4_4_ + fVar355 + fVar273 + fVar354;
  fStack_5a0 = auVar330._8_4_ + fVar357 + fVar399 + fVar356;
  fStack_59c = auVar330._12_4_ + fVar359 + fVar274 + fVar358;
  auVar40 = vsubps_avx(auVar308,auVar330);
  auVar136._0_4_ = fVar275 * 3.0;
  auVar136._4_4_ = fVar276 * 3.0;
  auVar136._8_4_ = fVar223 * 3.0;
  auVar136._12_4_ = fVar250 * 3.0;
  auVar230._0_4_ = auVar107._0_4_ * 3.0;
  auVar230._4_4_ = auVar107._4_4_ * 3.0;
  auVar230._8_4_ = auVar107._8_4_ * 3.0;
  auVar230._12_4_ = auVar107._12_4_ * 3.0;
  auVar107 = vsubps_avx(auVar136,auVar230);
  fVar170 = *pfVar6 * 0.0;
  fVar271 = pfVar6[1] * 0.0;
  fVar206 = pfVar6[2] * 0.0;
  fVar272 = pfVar6[3] * 0.0;
  auVar137._0_4_ = fVar170 + auVar107._0_4_;
  auVar137._4_4_ = fVar271 + auVar107._4_4_;
  auVar137._8_4_ = fVar206 + auVar107._8_4_;
  auVar137._12_4_ = fVar272 + auVar107._12_4_;
  auVar174._0_4_ = fVar222 + fVar170 + fVar360;
  auVar174._4_4_ = fVar251 + fVar271 + fVar368;
  auVar174._8_4_ = fVar252 + fVar206 + fVar369;
  auVar174._12_4_ = fVar253 + fVar272 + fVar370;
  auVar104._0_4_ = fVar222 * 0.0;
  auVar104._4_4_ = fVar251 * 0.0;
  auVar104._8_4_ = fVar252 * 0.0;
  auVar104._12_4_ = fVar253 * 0.0;
  auVar210._0_4_ = auVar104._0_4_ + fVar170 + fVar287 + fVar275;
  auVar210._4_4_ = auVar104._4_4_ + fVar271 + fVar288 + fVar276;
  auVar210._8_4_ = auVar104._8_4_ + fVar206 + fVar289 + fVar223;
  auVar210._12_4_ = auVar104._12_4_ + fVar272 + fVar290 + fVar250;
  auVar106 = vsubps_avx(auVar137,auVar104);
  auVar107 = vshufps_avx(auVar174,auVar174,0xc9);
  fVar274 = auVar37._0_4_;
  auVar138._0_4_ = fVar274 * auVar107._0_4_;
  fVar275 = auVar37._4_4_;
  auVar138._4_4_ = fVar275 * auVar107._4_4_;
  fVar276 = auVar37._8_4_;
  auVar138._8_4_ = fVar276 * auVar107._8_4_;
  fVar223 = auVar37._12_4_;
  auVar138._12_4_ = fVar223 * auVar107._12_4_;
  auVar107 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar175._0_4_ = auVar107._0_4_ * auVar174._0_4_;
  auVar175._4_4_ = auVar107._4_4_ * auVar174._4_4_;
  auVar175._8_4_ = auVar107._8_4_ * auVar174._8_4_;
  auVar175._12_4_ = auVar107._12_4_ * auVar174._12_4_;
  auVar108 = vsubps_avx(auVar175,auVar138);
  auVar176._0_4_ = auVar140._0_4_ * auVar107._0_4_;
  auVar176._4_4_ = auVar140._4_4_ * auVar107._4_4_;
  auVar176._8_4_ = auVar140._8_4_ * auVar107._8_4_;
  auVar176._12_4_ = auVar140._12_4_ * auVar107._12_4_;
  auVar107 = vshufps_avx(auVar140,auVar140,0xc9);
  auVar231._0_4_ = fVar274 * auVar107._0_4_;
  auVar231._4_4_ = fVar275 * auVar107._4_4_;
  auVar231._8_4_ = fVar276 * auVar107._8_4_;
  auVar231._12_4_ = fVar223 * auVar107._12_4_;
  auVar34 = vsubps_avx(auVar176,auVar231);
  auVar107 = vshufps_avx(auVar210,auVar210,0xc9);
  fVar250 = auVar40._0_4_;
  auVar232._0_4_ = fVar250 * auVar107._0_4_;
  fVar222 = auVar40._4_4_;
  auVar232._4_4_ = fVar222 * auVar107._4_4_;
  fVar251 = auVar40._8_4_;
  auVar232._8_4_ = fVar251 * auVar107._8_4_;
  fVar252 = auVar40._12_4_;
  auVar232._12_4_ = fVar252 * auVar107._12_4_;
  auVar107 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar211._0_4_ = auVar107._0_4_ * auVar210._0_4_;
  auVar211._4_4_ = auVar107._4_4_ * auVar210._4_4_;
  auVar211._8_4_ = auVar107._8_4_ * auVar210._8_4_;
  auVar211._12_4_ = auVar107._12_4_ * auVar210._12_4_;
  auVar229 = vsubps_avx(auVar211,auVar232);
  auVar108 = vshufps_avx(auVar108,auVar108,0xc9);
  auVar139._0_4_ = auVar107._0_4_ * auVar106._0_4_;
  auVar139._4_4_ = auVar107._4_4_ * auVar106._4_4_;
  auVar139._8_4_ = auVar107._8_4_ * auVar106._8_4_;
  auVar139._12_4_ = auVar107._12_4_ * auVar106._12_4_;
  auVar107 = vshufps_avx(auVar106,auVar106,0xc9);
  auVar105._0_4_ = fVar250 * auVar107._0_4_;
  auVar105._4_4_ = fVar222 * auVar107._4_4_;
  auVar105._8_4_ = fVar251 * auVar107._8_4_;
  auVar105._12_4_ = fVar252 * auVar107._12_4_;
  auVar107 = vdpps_avx(auVar108,auVar108,0x7f);
  auVar41 = vsubps_avx(auVar139,auVar105);
  fVar271 = auVar107._0_4_;
  auVar106 = ZEXT416((uint)fVar271);
  auVar140 = vrsqrtss_avx(auVar106,auVar106);
  fVar170 = auVar140._0_4_;
  auVar140 = vshufps_avx(auVar34,auVar34,0xc9);
  auVar107 = vshufps_avx(auVar107,auVar107,0);
  auVar233._0_4_ = auVar107._0_4_ * auVar140._0_4_;
  auVar233._4_4_ = auVar107._4_4_ * auVar140._4_4_;
  auVar233._8_4_ = auVar107._8_4_ * auVar140._8_4_;
  auVar233._12_4_ = auVar107._12_4_ * auVar140._12_4_;
  auVar107 = vdpps_avx(auVar108,auVar140,0x7f);
  auVar107 = vshufps_avx(auVar107,auVar107,0);
  auVar177._0_4_ = auVar108._0_4_ * auVar107._0_4_;
  auVar177._4_4_ = auVar108._4_4_ * auVar107._4_4_;
  auVar177._8_4_ = auVar108._8_4_ * auVar107._8_4_;
  auVar177._12_4_ = auVar108._12_4_ * auVar107._12_4_;
  auVar42 = vsubps_avx(auVar233,auVar177);
  auVar107 = vrcpss_avx(auVar106,auVar106);
  auVar107 = ZEXT416((uint)(auVar107._0_4_ * (2.0 - fVar271 * auVar107._0_4_)));
  auVar106 = vshufps_avx(auVar107,auVar107,0);
  auVar34 = vshufps_avx(auVar229,auVar229,0xc9);
  auVar107 = ZEXT416((uint)(fVar170 * 1.5 - fVar271 * 0.5 * fVar170 * fVar170 * fVar170));
  auVar229 = vshufps_avx(auVar107,auVar107,0);
  fVar387 = auVar108._0_4_ * auVar229._0_4_;
  fVar273 = auVar108._4_4_ * auVar229._4_4_;
  fVar399 = auVar108._8_4_ * auVar229._8_4_;
  fVar253 = auVar108._12_4_ * auVar229._12_4_;
  auVar107 = vdpps_avx(auVar34,auVar34,0x7f);
  fVar271 = auVar107._0_4_;
  auVar108 = ZEXT416((uint)fVar271);
  auVar140 = vrsqrtss_avx(auVar108,auVar108);
  fVar170 = auVar140._0_4_;
  auVar140 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar107 = vshufps_avx(auVar107,auVar107,0);
  auVar259._0_4_ = auVar107._0_4_ * auVar140._0_4_;
  auVar259._4_4_ = auVar107._4_4_ * auVar140._4_4_;
  auVar259._8_4_ = auVar107._8_4_ * auVar140._8_4_;
  auVar259._12_4_ = auVar107._12_4_ * auVar140._12_4_;
  auVar107 = vdpps_avx(auVar34,auVar140,0x7f);
  auVar107 = vshufps_avx(auVar107,auVar107,0);
  auVar234._0_4_ = auVar34._0_4_ * auVar107._0_4_;
  auVar234._4_4_ = auVar34._4_4_ * auVar107._4_4_;
  auVar234._8_4_ = auVar34._8_4_ * auVar107._8_4_;
  auVar234._12_4_ = auVar34._12_4_ * auVar107._12_4_;
  auVar41 = vsubps_avx(auVar259,auVar234);
  auVar107 = vrcpss_avx(auVar108,auVar108);
  auVar107 = ZEXT416((uint)(auVar107._0_4_ * (2.0 - fVar271 * auVar107._0_4_)));
  auVar107 = vshufps_avx(auVar107,auVar107,0);
  auVar140 = ZEXT416((uint)(fVar170 * 1.5 - fVar271 * 0.5 * fVar170 * fVar170 * fVar170));
  auVar140 = vshufps_avx(auVar140,auVar140,0);
  fVar170 = auVar34._0_4_ * auVar140._0_4_;
  fVar271 = auVar34._4_4_ * auVar140._4_4_;
  fVar206 = auVar34._8_4_ * auVar140._8_4_;
  fVar272 = auVar34._12_4_ * auVar140._12_4_;
  auVar108 = vshufps_avx(auVar37,auVar37,0xff);
  auVar34 = vshufps_avx(auVar362,auVar362,0xff);
  auVar235._0_4_ = fVar387 * auVar34._0_4_;
  auVar235._4_4_ = fVar273 * auVar34._4_4_;
  auVar235._8_4_ = fVar399 * auVar34._8_4_;
  auVar235._12_4_ = fVar253 * auVar34._12_4_;
  auVar141._0_4_ =
       fVar387 * auVar108._0_4_ + auVar229._0_4_ * auVar42._0_4_ * auVar106._0_4_ * auVar34._0_4_;
  auVar141._4_4_ =
       fVar273 * auVar108._4_4_ + auVar229._4_4_ * auVar42._4_4_ * auVar106._4_4_ * auVar34._4_4_;
  auVar141._8_4_ =
       fVar399 * auVar108._8_4_ + auVar229._8_4_ * auVar42._8_4_ * auVar106._8_4_ * auVar34._8_4_;
  auVar141._12_4_ =
       fVar253 * auVar108._12_4_ +
       auVar229._12_4_ * auVar42._12_4_ * auVar106._12_4_ * auVar34._12_4_;
  auVar34 = vsubps_avx(auVar362,auVar235);
  auVar229 = vsubps_avx(auVar37,auVar141);
  auVar108 = vshufps_avx(auVar40,auVar40,0xff);
  auVar106 = vshufps_avx(_local_5a8,_local_5a8,0xff);
  auVar178._0_4_ = auVar106._0_4_ * fVar170;
  auVar178._4_4_ = auVar106._4_4_ * fVar271;
  auVar178._8_4_ = auVar106._8_4_ * fVar206;
  auVar178._12_4_ = auVar106._12_4_ * fVar272;
  auVar109._0_4_ =
       auVar108._0_4_ * fVar170 + auVar106._0_4_ * auVar140._0_4_ * auVar41._0_4_ * auVar107._0_4_;
  auVar109._4_4_ =
       auVar108._4_4_ * fVar271 + auVar106._4_4_ * auVar140._4_4_ * auVar41._4_4_ * auVar107._4_4_;
  auVar109._8_4_ =
       auVar108._8_4_ * fVar206 + auVar106._8_4_ * auVar140._8_4_ * auVar41._8_4_ * auVar107._8_4_;
  auVar109._12_4_ =
       auVar108._12_4_ * fVar272 +
       auVar106._12_4_ * auVar140._12_4_ * auVar41._12_4_ * auVar107._12_4_;
  auVar108 = vsubps_avx(_local_5a8,auVar178);
  auVar377._0_4_ = (float)local_5a8._0_4_ + auVar178._0_4_;
  auVar377._4_4_ = (float)local_5a8._4_4_ + auVar178._4_4_;
  auVar377._8_4_ = fStack_5a0 + auVar178._8_4_;
  auVar377._12_4_ = fStack_59c + auVar178._12_4_;
  auVar106 = vsubps_avx(auVar40,auVar109);
  local_548 = auVar35._0_4_;
  fStack_544 = auVar35._4_4_;
  fStack_540 = auVar35._8_4_;
  fStack_53c = auVar35._12_4_;
  local_4a8 = auVar39._0_4_;
  fStack_4a4 = auVar39._4_4_;
  fStack_4a0 = auVar39._8_4_;
  fStack_49c = auVar39._12_4_;
  auVar107 = vshufps_avx(ZEXT416((uint)fVar255),ZEXT416((uint)fVar255),0);
  auVar140 = vshufps_avx(ZEXT416((uint)(1.0 - fVar255)),ZEXT416((uint)(1.0 - fVar255)),0);
  fVar272 = auVar107._0_4_;
  fVar387 = auVar107._4_4_;
  fVar273 = auVar107._8_4_;
  fVar399 = auVar107._12_4_;
  fVar255 = auVar140._0_4_;
  fVar170 = auVar140._4_4_;
  fVar271 = auVar140._8_4_;
  fVar206 = auVar140._12_4_;
  local_408._0_4_ = fVar255 * local_4a8 + fVar272 * auVar34._0_4_;
  local_408._4_4_ = fVar170 * fStack_4a4 + fVar387 * auVar34._4_4_;
  fStack_400 = fVar271 * fStack_4a0 + fVar273 * auVar34._8_4_;
  fStack_3fc = fVar206 * fStack_49c + fVar399 * auVar34._12_4_;
  fVar287 = fVar255 * (local_4a8 + local_548 * 0.33333334) +
            fVar272 * (auVar34._0_4_ + auVar229._0_4_ * 0.33333334);
  fVar288 = fVar170 * (fStack_4a4 + fStack_544 * 0.33333334) +
            fVar387 * (auVar34._4_4_ + auVar229._4_4_ * 0.33333334);
  fVar289 = fVar271 * (fStack_4a0 + fStack_540 * 0.33333334) +
            fVar273 * (auVar34._8_4_ + auVar229._8_4_ * 0.33333334);
  fVar290 = fVar206 * (fStack_49c + fStack_53c * 0.33333334) +
            fVar399 * (auVar34._12_4_ + auVar229._12_4_ * 0.33333334);
  local_5d8 = auVar36._0_4_;
  fStack_5d4 = auVar36._4_4_;
  fStack_5d0 = auVar36._8_4_;
  fStack_5cc = auVar36._12_4_;
  auVar212._0_4_ = local_5d8 * 0.33333334;
  auVar212._4_4_ = fStack_5d4 * 0.33333334;
  auVar212._8_4_ = fStack_5d0 * 0.33333334;
  auVar212._12_4_ = fStack_5cc * 0.33333334;
  auVar107 = vsubps_avx(auVar38,auVar212);
  auVar260._0_4_ = (fVar375 + auVar102._0_4_) * 0.33333334;
  auVar260._4_4_ = (fVar383 + auVar102._4_4_) * 0.33333334;
  auVar260._8_4_ = (fVar384 + auVar102._8_4_) * 0.33333334;
  auVar260._12_4_ = (fVar385 + auVar102._12_4_) * 0.33333334;
  auVar140 = vsubps_avx((undefined1  [16])p00.field_0,auVar260);
  auVar179._0_4_ = auVar106._0_4_ * 0.33333334;
  auVar179._4_4_ = auVar106._4_4_ * 0.33333334;
  auVar179._8_4_ = auVar106._8_4_ * 0.33333334;
  auVar179._12_4_ = auVar106._12_4_ * 0.33333334;
  auVar106 = vsubps_avx(auVar108,auVar179);
  auVar142._0_4_ = (fVar250 + auVar109._0_4_) * 0.33333334;
  auVar142._4_4_ = (fVar222 + auVar109._4_4_) * 0.33333334;
  auVar142._8_4_ = (fVar251 + auVar109._8_4_) * 0.33333334;
  auVar142._12_4_ = (fVar252 + auVar109._12_4_) * 0.33333334;
  auVar34 = vsubps_avx(auVar377,auVar142);
  local_418._0_4_ = fVar255 * auVar107._0_4_ + fVar272 * auVar106._0_4_;
  local_418._4_4_ = fVar170 * auVar107._4_4_ + fVar387 * auVar106._4_4_;
  fStack_410 = fVar271 * auVar107._8_4_ + fVar273 * auVar106._8_4_;
  fStack_40c = fVar206 * auVar107._12_4_ + fVar399 * auVar106._12_4_;
  local_428._0_4_ = fVar272 * auVar108._0_4_ + auVar38._0_4_ * fVar255;
  local_428._4_4_ = fVar387 * auVar108._4_4_ + auVar38._4_4_ * fVar170;
  fStack_420 = fVar273 * auVar108._8_4_ + auVar38._8_4_ * fVar271;
  fStack_41c = fVar399 * auVar108._12_4_ + auVar38._12_4_ * fVar206;
  local_438._0_4_ = fVar255 * (float)local_628._0_4_ + fVar272 * (auVar362._0_4_ + auVar235._0_4_);
  local_438._4_4_ = fVar170 * (float)local_628._4_4_ + fVar387 * (auVar362._4_4_ + auVar235._4_4_);
  fStack_430 = fVar271 * fStack_620 + fVar273 * (auVar362._8_4_ + auVar235._8_4_);
  fStack_42c = fVar206 * fStack_61c + fVar399 * (auVar362._12_4_ + auVar235._12_4_);
  local_448._0_4_ =
       fVar255 * ((float)local_628._0_4_ + (fVar254 + auVar295._0_4_) * 0.33333334) +
       fVar272 * (auVar362._0_4_ + auVar235._0_4_ + (fVar274 + auVar141._0_4_) * 0.33333334);
  local_448._4_4_ =
       fVar170 * ((float)local_628._4_4_ + (fVar277 + auVar295._4_4_) * 0.33333334) +
       fVar387 * (auVar362._4_4_ + auVar235._4_4_ + (fVar275 + auVar141._4_4_) * 0.33333334);
  fStack_440 = fVar271 * (fStack_620 + (fVar285 + auVar295._8_4_) * 0.33333334) +
               fVar273 * (auVar362._8_4_ + auVar235._8_4_ + (fVar276 + auVar141._8_4_) * 0.33333334)
  ;
  fStack_43c = fVar206 * (fStack_61c + (fVar286 + auVar295._12_4_) * 0.33333334) +
               fVar399 * (auVar362._12_4_ + auVar235._12_4_ +
                         (fVar223 + auVar141._12_4_) * 0.33333334);
  auVar401._0_4_ = fVar255 * auVar140._0_4_ + fVar272 * auVar34._0_4_;
  auVar401._4_4_ = fVar170 * auVar140._4_4_ + fVar387 * auVar34._4_4_;
  auVar401._8_4_ = fVar271 * auVar140._8_4_ + fVar273 * auVar34._8_4_;
  auVar401._12_4_ = fVar206 * auVar140._12_4_ + fVar399 * auVar34._12_4_;
  fVar250 = (auVar279._0_4_ + auVar172._0_4_) * fVar255 + fVar272 * auVar377._0_4_;
  fVar251 = (auVar279._4_4_ + auVar172._4_4_) * fVar170 + fVar387 * auVar377._4_4_;
  fVar253 = (auVar279._8_4_ + auVar172._8_4_) * fVar271 + fVar273 * auVar377._8_4_;
  fVar254 = (auVar279._12_4_ + auVar172._12_4_) * fVar206 + fVar399 * auVar377._12_4_;
  auVar107 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar107 = vinsertps_avx(auVar107,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar36 = vsubps_avx(_local_408,auVar107);
  auVar108 = vmovsldup_avx(auVar36);
  auVar140 = vmovshdup_avx(auVar36);
  auVar106 = vshufps_avx(auVar36,auVar36,0xaa);
  fVar255 = pre->ray_space[k].vx.field_0.m128[0];
  fVar170 = pre->ray_space[k].vx.field_0.m128[1];
  fVar271 = pre->ray_space[k].vx.field_0.m128[2];
  fVar206 = pre->ray_space[k].vx.field_0.m128[3];
  fVar272 = pre->ray_space[k].vy.field_0.m128[0];
  fVar387 = pre->ray_space[k].vy.field_0.m128[1];
  fVar273 = pre->ray_space[k].vy.field_0.m128[2];
  fVar399 = pre->ray_space[k].vy.field_0.m128[3];
  fVar274 = pre->ray_space[k].vz.field_0.m128[0];
  fVar275 = pre->ray_space[k].vz.field_0.m128[1];
  fVar276 = pre->ray_space[k].vz.field_0.m128[2];
  fVar223 = pre->ray_space[k].vz.field_0.m128[3];
  local_608._0_4_ = fVar255 * auVar108._0_4_ + fVar272 * auVar140._0_4_ + fVar274 * auVar106._0_4_;
  local_608._4_4_ = fVar170 * auVar108._4_4_ + fVar387 * auVar140._4_4_ + fVar275 * auVar106._4_4_;
  fStack_600 = fVar271 * auVar108._8_4_ + fVar273 * auVar140._8_4_ + fVar276 * auVar106._8_4_;
  fStack_5fc = fVar206 * auVar108._12_4_ + fVar399 * auVar140._12_4_ + fVar223 * auVar106._12_4_;
  auVar43._4_4_ = fVar288;
  auVar43._0_4_ = fVar287;
  auVar43._8_4_ = fVar289;
  auVar43._12_4_ = fVar290;
  auVar37 = vsubps_avx(auVar43,auVar107);
  auVar106 = vshufps_avx(auVar37,auVar37,0xaa);
  auVar140 = vmovshdup_avx(auVar37);
  auVar108 = vmovsldup_avx(auVar37);
  fVar222 = fVar255 * auVar108._0_4_ + fVar272 * auVar140._0_4_ + fVar274 * auVar106._0_4_;
  fVar252 = fVar170 * auVar108._4_4_ + fVar387 * auVar140._4_4_ + fVar275 * auVar106._4_4_;
  local_628._4_4_ = fVar252;
  local_628._0_4_ = fVar222;
  fStack_620 = fVar271 * auVar108._8_4_ + fVar273 * auVar140._8_4_ + fVar276 * auVar106._8_4_;
  fStack_61c = fVar206 * auVar108._12_4_ + fVar399 * auVar140._12_4_ + fVar223 * auVar106._12_4_;
  auVar38 = vsubps_avx(_local_418,auVar107);
  auVar106 = vshufps_avx(auVar38,auVar38,0xaa);
  auVar140 = vmovshdup_avx(auVar38);
  auVar108 = vmovsldup_avx(auVar38);
  auVar213._0_4_ = fVar255 * auVar108._0_4_ + fVar272 * auVar140._0_4_ + fVar274 * auVar106._0_4_;
  auVar213._4_4_ = fVar170 * auVar108._4_4_ + fVar387 * auVar140._4_4_ + fVar275 * auVar106._4_4_;
  auVar213._8_4_ = fVar271 * auVar108._8_4_ + fVar273 * auVar140._8_4_ + fVar276 * auVar106._8_4_;
  auVar213._12_4_ =
       fVar206 * auVar108._12_4_ + fVar399 * auVar140._12_4_ + fVar223 * auVar106._12_4_;
  auVar39 = vsubps_avx(_local_428,auVar107);
  auVar106 = vshufps_avx(auVar39,auVar39,0xaa);
  auVar140 = vmovshdup_avx(auVar39);
  auVar108 = vmovsldup_avx(auVar39);
  auVar143._0_4_ = auVar108._0_4_ * fVar255 + auVar140._0_4_ * fVar272 + fVar274 * auVar106._0_4_;
  auVar143._4_4_ = auVar108._4_4_ * fVar170 + auVar140._4_4_ * fVar387 + fVar275 * auVar106._4_4_;
  auVar143._8_4_ = auVar108._8_4_ * fVar271 + auVar140._8_4_ * fVar273 + fVar276 * auVar106._8_4_;
  auVar143._12_4_ =
       auVar108._12_4_ * fVar206 + auVar140._12_4_ * fVar399 + fVar223 * auVar106._12_4_;
  auVar40 = vsubps_avx(_local_438,auVar107);
  auVar106 = vshufps_avx(auVar40,auVar40,0xaa);
  auVar140 = vmovshdup_avx(auVar40);
  auVar108 = vmovsldup_avx(auVar40);
  auVar309._0_4_ = auVar108._0_4_ * fVar255 + auVar140._0_4_ * fVar272 + auVar106._0_4_ * fVar274;
  auVar309._4_4_ = auVar108._4_4_ * fVar170 + auVar140._4_4_ * fVar387 + auVar106._4_4_ * fVar275;
  auVar309._8_4_ = auVar108._8_4_ * fVar271 + auVar140._8_4_ * fVar273 + auVar106._8_4_ * fVar276;
  auVar309._12_4_ =
       auVar108._12_4_ * fVar206 + auVar140._12_4_ * fVar399 + auVar106._12_4_ * fVar223;
  auVar41 = vsubps_avx(_local_448,auVar107);
  auVar106 = vshufps_avx(auVar41,auVar41,0xaa);
  auVar140 = vmovshdup_avx(auVar41);
  auVar108 = vmovsldup_avx(auVar41);
  auVar318._0_4_ = auVar108._0_4_ * fVar255 + auVar140._0_4_ * fVar272 + auVar106._0_4_ * fVar274;
  auVar318._4_4_ = auVar108._4_4_ * fVar170 + auVar140._4_4_ * fVar387 + auVar106._4_4_ * fVar275;
  auVar318._8_4_ = auVar108._8_4_ * fVar271 + auVar140._8_4_ * fVar273 + auVar106._8_4_ * fVar276;
  auVar318._12_4_ =
       auVar108._12_4_ * fVar206 + auVar140._12_4_ * fVar399 + auVar106._12_4_ * fVar223;
  auVar42 = vsubps_avx(auVar401,auVar107);
  auVar106 = vshufps_avx(auVar42,auVar42,0xaa);
  auVar140 = vmovshdup_avx(auVar42);
  auVar108 = vmovsldup_avx(auVar42);
  auVar331._0_4_ = auVar108._0_4_ * fVar255 + auVar140._0_4_ * fVar272 + auVar106._0_4_ * fVar274;
  auVar331._4_4_ = auVar108._4_4_ * fVar170 + auVar140._4_4_ * fVar387 + auVar106._4_4_ * fVar275;
  auVar331._8_4_ = auVar108._8_4_ * fVar271 + auVar140._8_4_ * fVar273 + auVar106._8_4_ * fVar276;
  auVar331._12_4_ =
       auVar108._12_4_ * fVar206 + auVar140._12_4_ * fVar399 + auVar106._12_4_ * fVar223;
  auVar343._4_4_ = fVar251;
  auVar343._0_4_ = fVar250;
  auVar343._8_4_ = fVar253;
  auVar343._12_4_ = fVar254;
  auVar10 = vsubps_avx(auVar343,auVar107);
  auVar108 = vshufps_avx(auVar10,auVar10,0xaa);
  auVar107 = vmovshdup_avx(auVar10);
  auVar140 = vmovsldup_avx(auVar10);
  auVar110._0_4_ = fVar255 * auVar140._0_4_ + fVar272 * auVar107._0_4_ + fVar274 * auVar108._0_4_;
  auVar110._4_4_ = fVar170 * auVar140._4_4_ + fVar387 * auVar107._4_4_ + fVar275 * auVar108._4_4_;
  auVar110._8_4_ = fVar271 * auVar140._8_4_ + fVar273 * auVar107._8_4_ + fVar276 * auVar108._8_4_;
  auVar110._12_4_ =
       fVar206 * auVar140._12_4_ + fVar399 * auVar107._12_4_ + fVar223 * auVar108._12_4_;
  auVar106 = vmovlhps_avx(_local_608,auVar309);
  auVar34 = vmovlhps_avx(_local_628,auVar318);
  auVar229 = vmovlhps_avx(auVar213,auVar331);
  auVar35 = vmovlhps_avx(auVar143,auVar110);
  auVar107 = vminps_avx(auVar106,auVar34);
  auVar140 = vminps_avx(auVar229,auVar35);
  auVar108 = vminps_avx(auVar107,auVar140);
  auVar107 = vmaxps_avx(auVar106,auVar34);
  auVar140 = vmaxps_avx(auVar229,auVar35);
  auVar107 = vmaxps_avx(auVar107,auVar140);
  auVar140 = vshufpd_avx(auVar108,auVar108,3);
  auVar108 = vminps_avx(auVar108,auVar140);
  auVar140 = vshufpd_avx(auVar107,auVar107,3);
  auVar140 = vmaxps_avx(auVar107,auVar140);
  auVar280._8_4_ = 0x7fffffff;
  auVar280._0_8_ = 0x7fffffff7fffffff;
  auVar280._12_4_ = 0x7fffffff;
  auVar107 = vandps_avx(auVar108,auVar280);
  auVar140 = vandps_avx(auVar140,auVar280);
  auVar107 = vmaxps_avx(auVar107,auVar140);
  auVar140 = vmovshdup_avx(auVar107);
  auVar107 = vmaxss_avx(auVar140,auVar107);
  fVar170 = auVar107._0_4_ * 9.536743e-07;
  auVar107 = vshufps_avx(ZEXT416((uint)fVar170),ZEXT416((uint)fVar170),0);
  local_78._16_16_ = auVar107;
  local_78._0_16_ = auVar107;
  auVar111._0_8_ = auVar107._0_8_ ^ 0x8000000080000000;
  auVar111._8_4_ = auVar107._8_4_ ^ 0x80000000;
  auVar111._12_4_ = auVar107._12_4_ ^ 0x80000000;
  local_98._16_16_ = auVar111;
  local_98._0_16_ = auVar111;
  auVar107 = vpshufd_avx(ZEXT416(uVar86),0);
  auVar140 = vpshufd_avx(ZEXT416(*(uint *)(local_450 + lVar89 * 4 + 6)),0);
  bVar94 = false;
  uVar90 = 0;
  fVar255 = *(float *)(ray + k * 4 + 0x30);
  auVar108 = vsubps_avx(auVar34,auVar106);
  auVar11 = vsubps_avx(auVar229,auVar34);
  auVar12 = vsubps_avx(auVar35,auVar229);
  auVar13 = vsubps_avx(_local_438,_local_408);
  auVar84._4_4_ = fVar288;
  auVar84._0_4_ = fVar287;
  auVar84._8_4_ = fVar289;
  auVar84._12_4_ = fVar290;
  auVar14 = vsubps_avx(_local_448,auVar84);
  auVar15 = vsubps_avx(auVar401,_local_418);
  auVar402._4_4_ = fVar251;
  auVar402._0_4_ = fVar250;
  auVar402._8_4_ = fVar253;
  auVar402._12_4_ = fVar254;
  auVar16 = vsubps_avx(auVar402,_local_428);
  auVar353 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar406 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_00ac172d:
  do {
    auVar402 = auVar406._0_16_;
    auVar343 = auVar353._0_16_;
    auVar115 = vshufps_avx(auVar343,auVar343,0x50);
    auVar392._8_4_ = 0x3f800000;
    auVar392._0_8_ = 0x3f8000003f800000;
    auVar392._12_4_ = 0x3f800000;
    auVar398._16_4_ = 0x3f800000;
    auVar398._0_16_ = auVar392;
    auVar398._20_4_ = 0x3f800000;
    auVar398._24_4_ = 0x3f800000;
    auVar398._28_4_ = 0x3f800000;
    auVar17 = vsubps_avx(auVar392,auVar115);
    fVar271 = auVar115._0_4_;
    fVar206 = auVar115._4_4_;
    fVar272 = auVar115._8_4_;
    fVar387 = auVar115._12_4_;
    fVar273 = auVar17._0_4_;
    fVar399 = auVar17._4_4_;
    fVar274 = auVar17._8_4_;
    fVar275 = auVar17._12_4_;
    auVar214._0_4_ = auVar309._0_4_ * fVar271 + fVar273 * (float)local_608._0_4_;
    auVar214._4_4_ = auVar309._4_4_ * fVar206 + fVar399 * (float)local_608._4_4_;
    auVar214._8_4_ = auVar309._0_4_ * fVar272 + fVar274 * (float)local_608._0_4_;
    auVar214._12_4_ = auVar309._4_4_ * fVar387 + fVar275 * (float)local_608._4_4_;
    auVar180._0_4_ = auVar318._0_4_ * fVar271 + fVar222 * fVar273;
    auVar180._4_4_ = auVar318._4_4_ * fVar206 + fVar252 * fVar399;
    auVar180._8_4_ = auVar318._0_4_ * fVar272 + fVar222 * fVar274;
    auVar180._12_4_ = auVar318._4_4_ * fVar387 + fVar252 * fVar275;
    auVar296._0_4_ = auVar331._0_4_ * fVar271 + auVar213._0_4_ * fVar273;
    auVar296._4_4_ = auVar331._4_4_ * fVar206 + auVar213._4_4_ * fVar399;
    auVar296._8_4_ = auVar331._0_4_ * fVar272 + auVar213._0_4_ * fVar274;
    auVar296._12_4_ = auVar331._4_4_ * fVar387 + auVar213._4_4_ * fVar275;
    auVar236._0_4_ = auVar110._0_4_ * fVar271 + auVar143._0_4_ * fVar273;
    auVar236._4_4_ = auVar110._4_4_ * fVar206 + auVar143._4_4_ * fVar399;
    auVar236._8_4_ = auVar110._0_4_ * fVar272 + auVar143._0_4_ * fVar274;
    auVar236._12_4_ = auVar110._4_4_ * fVar387 + auVar143._4_4_ * fVar275;
    auVar115 = vmovshdup_avx(auVar402);
    auVar17 = vshufps_avx(auVar402,auVar402,0);
    auVar325._16_16_ = auVar17;
    auVar325._0_16_ = auVar17;
    auVar197 = vshufps_avx(auVar402,auVar402,0x55);
    auVar130._16_16_ = auVar197;
    auVar130._0_16_ = auVar197;
    auVar129 = vsubps_avx(auVar130,auVar325);
    auVar197 = vshufps_avx(auVar214,auVar214,0);
    auVar96 = vshufps_avx(auVar214,auVar214,0x55);
    auVar146 = vshufps_avx(auVar180,auVar180,0);
    auVar183 = vshufps_avx(auVar180,auVar180,0x55);
    auVar147 = vshufps_avx(auVar296,auVar296,0);
    auVar224 = vshufps_avx(auVar296,auVar296,0x55);
    auVar256 = vshufps_avx(auVar236,auVar236,0);
    auVar317 = vshufps_avx(auVar236,auVar236,0x55);
    auVar115 = ZEXT416((uint)((auVar115._0_4_ - auVar406._0_4_) * 0.04761905));
    auVar115 = vshufps_avx(auVar115,auVar115,0);
    auVar340._0_4_ = auVar17._0_4_ + auVar129._0_4_ * 0.0;
    auVar340._4_4_ = auVar17._4_4_ + auVar129._4_4_ * 0.14285715;
    auVar340._8_4_ = auVar17._8_4_ + auVar129._8_4_ * 0.2857143;
    auVar340._12_4_ = auVar17._12_4_ + auVar129._12_4_ * 0.42857146;
    auVar340._16_4_ = auVar17._0_4_ + auVar129._16_4_ * 0.5714286;
    auVar340._20_4_ = auVar17._4_4_ + auVar129._20_4_ * 0.71428573;
    auVar340._24_4_ = auVar17._8_4_ + auVar129._24_4_ * 0.8571429;
    auVar340._28_4_ = auVar17._12_4_ + auVar129._28_4_;
    auVar28 = vsubps_avx(auVar398,auVar340);
    fVar271 = auVar146._0_4_;
    fVar272 = auVar146._4_4_;
    fVar273 = auVar146._8_4_;
    fVar274 = auVar146._12_4_;
    fVar359 = auVar28._0_4_;
    fVar400 = auVar28._4_4_;
    fVar407 = auVar28._8_4_;
    fVar408 = auVar28._12_4_;
    fVar410 = auVar28._16_4_;
    fVar327 = auVar28._20_4_;
    fVar328 = auVar28._24_4_;
    fVar370 = auVar183._0_4_;
    fVar383 = auVar183._4_4_;
    fVar385 = auVar183._8_4_;
    fVar355 = auVar183._12_4_;
    fVar386 = auVar96._12_4_ + 1.0;
    fVar358 = auVar147._0_4_;
    fVar360 = auVar147._4_4_;
    fVar368 = auVar147._8_4_;
    fVar369 = auVar147._12_4_;
    fVar276 = fVar358 * auVar340._0_4_ + fVar359 * fVar271;
    fVar223 = fVar360 * auVar340._4_4_ + fVar400 * fVar272;
    fVar277 = fVar368 * auVar340._8_4_ + fVar407 * fVar273;
    fVar285 = fVar369 * auVar340._12_4_ + fVar408 * fVar274;
    fVar286 = fVar358 * auVar340._16_4_ + fVar410 * fVar271;
    fVar341 = fVar360 * auVar340._20_4_ + fVar327 * fVar272;
    fVar354 = fVar368 * auVar340._24_4_ + fVar328 * fVar273;
    fVar206 = auVar224._0_4_;
    fVar387 = auVar224._4_4_;
    fVar399 = auVar224._8_4_;
    fVar275 = auVar224._12_4_;
    fVar375 = fVar370 * fVar359 + auVar340._0_4_ * fVar206;
    fVar384 = fVar383 * fVar400 + auVar340._4_4_ * fVar387;
    fVar342 = fVar385 * fVar407 + auVar340._8_4_ * fVar399;
    fVar357 = fVar355 * fVar408 + auVar340._12_4_ * fVar275;
    fVar371 = fVar370 * fVar410 + auVar340._16_4_ * fVar206;
    fVar372 = fVar383 * fVar327 + auVar340._20_4_ * fVar387;
    fVar373 = fVar385 * fVar328 + auVar340._24_4_ * fVar399;
    fVar374 = fVar355 + fVar274;
    auVar17 = vshufps_avx(auVar214,auVar214,0xaa);
    auVar146 = vshufps_avx(auVar214,auVar214,0xff);
    fVar356 = fVar369 + 0.0;
    auVar183 = vshufps_avx(auVar180,auVar180,0xaa);
    auVar147 = vshufps_avx(auVar180,auVar180,0xff);
    auVar248._0_4_ =
         fVar359 * (auVar340._0_4_ * fVar271 + fVar359 * auVar197._0_4_) + auVar340._0_4_ * fVar276;
    auVar248._4_4_ =
         fVar400 * (auVar340._4_4_ * fVar272 + fVar400 * auVar197._4_4_) + auVar340._4_4_ * fVar223;
    auVar248._8_4_ =
         fVar407 * (auVar340._8_4_ * fVar273 + fVar407 * auVar197._8_4_) + auVar340._8_4_ * fVar277;
    auVar248._12_4_ =
         fVar408 * (auVar340._12_4_ * fVar274 + fVar408 * auVar197._12_4_) +
         auVar340._12_4_ * fVar285;
    auVar248._16_4_ =
         fVar410 * (auVar340._16_4_ * fVar271 + fVar410 * auVar197._0_4_) +
         auVar340._16_4_ * fVar286;
    auVar248._20_4_ =
         fVar327 * (auVar340._20_4_ * fVar272 + fVar327 * auVar197._4_4_) +
         auVar340._20_4_ * fVar341;
    auVar248._24_4_ =
         fVar328 * (auVar340._24_4_ * fVar273 + fVar328 * auVar197._8_4_) +
         auVar340._24_4_ * fVar354;
    auVar248._28_4_ = auVar197._12_4_ + 1.0 + fVar275;
    auVar269._0_4_ =
         fVar359 * (fVar370 * auVar340._0_4_ + auVar96._0_4_ * fVar359) + auVar340._0_4_ * fVar375;
    auVar269._4_4_ =
         fVar400 * (fVar383 * auVar340._4_4_ + auVar96._4_4_ * fVar400) + auVar340._4_4_ * fVar384;
    auVar269._8_4_ =
         fVar407 * (fVar385 * auVar340._8_4_ + auVar96._8_4_ * fVar407) + auVar340._8_4_ * fVar342;
    auVar269._12_4_ =
         fVar408 * (fVar355 * auVar340._12_4_ + auVar96._12_4_ * fVar408) +
         auVar340._12_4_ * fVar357;
    auVar269._16_4_ =
         fVar410 * (fVar370 * auVar340._16_4_ + auVar96._0_4_ * fVar410) + auVar340._16_4_ * fVar371
    ;
    auVar269._20_4_ =
         fVar327 * (fVar383 * auVar340._20_4_ + auVar96._4_4_ * fVar327) + auVar340._20_4_ * fVar372
    ;
    auVar269._24_4_ =
         fVar328 * (fVar385 * auVar340._24_4_ + auVar96._8_4_ * fVar328) + auVar340._24_4_ * fVar373
    ;
    auVar269._28_4_ = auVar317._12_4_ + fVar275;
    auVar131._0_4_ =
         fVar359 * fVar276 + auVar340._0_4_ * (fVar358 * fVar359 + auVar256._0_4_ * auVar340._0_4_);
    auVar131._4_4_ =
         fVar400 * fVar223 + auVar340._4_4_ * (fVar360 * fVar400 + auVar256._4_4_ * auVar340._4_4_);
    auVar131._8_4_ =
         fVar407 * fVar277 + auVar340._8_4_ * (fVar368 * fVar407 + auVar256._8_4_ * auVar340._8_4_);
    auVar131._12_4_ =
         fVar408 * fVar285 +
         auVar340._12_4_ * (fVar369 * fVar408 + auVar256._12_4_ * auVar340._12_4_);
    auVar131._16_4_ =
         fVar410 * fVar286 +
         auVar340._16_4_ * (fVar358 * fVar410 + auVar256._0_4_ * auVar340._16_4_);
    auVar131._20_4_ =
         fVar327 * fVar341 +
         auVar340._20_4_ * (fVar360 * fVar327 + auVar256._4_4_ * auVar340._20_4_);
    auVar131._24_4_ =
         fVar328 * fVar354 +
         auVar340._24_4_ * (fVar368 * fVar328 + auVar256._8_4_ * auVar340._24_4_);
    auVar131._28_4_ = fVar274 + 1.0 + fVar356;
    auVar352._0_4_ =
         fVar359 * fVar375 + auVar340._0_4_ * (auVar317._0_4_ * auVar340._0_4_ + fVar359 * fVar206);
    auVar352._4_4_ =
         fVar400 * fVar384 + auVar340._4_4_ * (auVar317._4_4_ * auVar340._4_4_ + fVar400 * fVar387);
    auVar352._8_4_ =
         fVar407 * fVar342 + auVar340._8_4_ * (auVar317._8_4_ * auVar340._8_4_ + fVar407 * fVar399);
    auVar352._12_4_ =
         fVar408 * fVar357 +
         auVar340._12_4_ * (auVar317._12_4_ * auVar340._12_4_ + fVar408 * fVar275);
    auVar352._16_4_ =
         fVar410 * fVar371 +
         auVar340._16_4_ * (auVar317._0_4_ * auVar340._16_4_ + fVar410 * fVar206);
    auVar352._20_4_ =
         fVar327 * fVar372 +
         auVar340._20_4_ * (auVar317._4_4_ * auVar340._20_4_ + fVar327 * fVar387);
    auVar352._24_4_ =
         fVar328 * fVar373 +
         auVar340._24_4_ * (auVar317._8_4_ * auVar340._24_4_ + fVar328 * fVar399);
    auVar352._28_4_ = fVar356 + fVar275 + 0.0;
    local_b8._0_4_ = fVar359 * auVar248._0_4_ + auVar340._0_4_ * auVar131._0_4_;
    local_b8._4_4_ = fVar400 * auVar248._4_4_ + auVar340._4_4_ * auVar131._4_4_;
    local_b8._8_4_ = fVar407 * auVar248._8_4_ + auVar340._8_4_ * auVar131._8_4_;
    local_b8._12_4_ = fVar408 * auVar248._12_4_ + auVar340._12_4_ * auVar131._12_4_;
    local_b8._16_4_ = fVar410 * auVar248._16_4_ + auVar340._16_4_ * auVar131._16_4_;
    local_b8._20_4_ = fVar327 * auVar248._20_4_ + auVar340._20_4_ * auVar131._20_4_;
    local_b8._24_4_ = fVar328 * auVar248._24_4_ + auVar340._24_4_ * auVar131._24_4_;
    local_b8._28_4_ = fVar374 + fVar275 + 0.0;
    auVar221._0_4_ = fVar359 * auVar269._0_4_ + auVar340._0_4_ * auVar352._0_4_;
    auVar221._4_4_ = fVar400 * auVar269._4_4_ + auVar340._4_4_ * auVar352._4_4_;
    auVar221._8_4_ = fVar407 * auVar269._8_4_ + auVar340._8_4_ * auVar352._8_4_;
    auVar221._12_4_ = fVar408 * auVar269._12_4_ + auVar340._12_4_ * auVar352._12_4_;
    auVar221._16_4_ = fVar410 * auVar269._16_4_ + auVar340._16_4_ * auVar352._16_4_;
    auVar221._20_4_ = fVar327 * auVar269._20_4_ + auVar340._20_4_ * auVar352._20_4_;
    auVar221._24_4_ = fVar328 * auVar269._24_4_ + auVar340._24_4_ * auVar352._24_4_;
    auVar221._28_4_ = fVar374 + fVar356;
    auVar29 = vsubps_avx(auVar131,auVar248);
    auVar129 = vsubps_avx(auVar352,auVar269);
    local_548 = auVar115._0_4_;
    fStack_544 = auVar115._4_4_;
    fStack_540 = auVar115._8_4_;
    fStack_53c = auVar115._12_4_;
    local_f8 = local_548 * auVar29._0_4_ * 3.0;
    fStack_f4 = fStack_544 * auVar29._4_4_ * 3.0;
    auVar46._4_4_ = fStack_f4;
    auVar46._0_4_ = local_f8;
    fStack_f0 = fStack_540 * auVar29._8_4_ * 3.0;
    auVar46._8_4_ = fStack_f0;
    fStack_ec = fStack_53c * auVar29._12_4_ * 3.0;
    auVar46._12_4_ = fStack_ec;
    fStack_e8 = local_548 * auVar29._16_4_ * 3.0;
    auVar46._16_4_ = fStack_e8;
    fStack_e4 = fStack_544 * auVar29._20_4_ * 3.0;
    auVar46._20_4_ = fStack_e4;
    fStack_e0 = fStack_540 * auVar29._24_4_ * 3.0;
    auVar46._24_4_ = fStack_e0;
    auVar46._28_4_ = auVar29._28_4_;
    local_118 = local_548 * auVar129._0_4_ * 3.0;
    fStack_114 = fStack_544 * auVar129._4_4_ * 3.0;
    auVar47._4_4_ = fStack_114;
    auVar47._0_4_ = local_118;
    fStack_110 = fStack_540 * auVar129._8_4_ * 3.0;
    auVar47._8_4_ = fStack_110;
    fStack_10c = fStack_53c * auVar129._12_4_ * 3.0;
    auVar47._12_4_ = fStack_10c;
    fStack_108 = local_548 * auVar129._16_4_ * 3.0;
    auVar47._16_4_ = fStack_108;
    fStack_104 = fStack_544 * auVar129._20_4_ * 3.0;
    auVar47._20_4_ = fStack_104;
    fStack_100 = fStack_540 * auVar129._24_4_ * 3.0;
    auVar47._24_4_ = fStack_100;
    auVar47._28_4_ = fVar374;
    auVar26 = vsubps_avx(local_b8,auVar46);
    auVar129 = vperm2f128_avx(auVar26,auVar26,1);
    auVar129 = vshufps_avx(auVar129,auVar26,0x30);
    auVar129 = vshufps_avx(auVar26,auVar129,0x29);
    auVar27 = vsubps_avx(auVar221,auVar47);
    auVar26 = vperm2f128_avx(auVar27,auVar27,1);
    auVar26 = vshufps_avx(auVar26,auVar27,0x30);
    auVar27 = vshufps_avx(auVar27,auVar26,0x29);
    fVar372 = auVar183._0_4_;
    fVar373 = auVar183._4_4_;
    fVar409 = auVar183._8_4_;
    fVar274 = auVar17._12_4_;
    fVar360 = auVar147._0_4_;
    fVar369 = auVar147._4_4_;
    fVar375 = auVar147._8_4_;
    fVar384 = auVar147._12_4_;
    auVar115 = vshufps_avx(auVar296,auVar296,0xaa);
    fVar271 = auVar115._0_4_;
    fVar272 = auVar115._4_4_;
    fVar273 = auVar115._8_4_;
    fVar275 = auVar115._12_4_;
    fVar277 = auVar340._0_4_ * fVar271 + fVar372 * fVar359;
    fVar285 = auVar340._4_4_ * fVar272 + fVar373 * fVar400;
    fVar286 = auVar340._8_4_ * fVar273 + fVar409 * fVar407;
    fVar341 = auVar340._12_4_ * fVar275 + auVar183._12_4_ * fVar408;
    fVar354 = auVar340._16_4_ * fVar271 + fVar372 * fVar410;
    fVar356 = auVar340._20_4_ * fVar272 + fVar373 * fVar327;
    fVar358 = auVar340._24_4_ * fVar273 + fVar409 * fVar328;
    auVar115 = vshufps_avx(auVar296,auVar296,0xff);
    fVar206 = auVar115._0_4_;
    fVar387 = auVar115._4_4_;
    fVar399 = auVar115._8_4_;
    fVar276 = auVar115._12_4_;
    fVar368 = auVar340._0_4_ * fVar206 + fVar360 * fVar359;
    fVar370 = auVar340._4_4_ * fVar387 + fVar369 * fVar400;
    fVar383 = auVar340._8_4_ * fVar399 + fVar375 * fVar407;
    fVar385 = auVar340._12_4_ * fVar276 + fVar384 * fVar408;
    fVar342 = auVar340._16_4_ * fVar206 + fVar360 * fVar410;
    fVar355 = auVar340._20_4_ * fVar387 + fVar369 * fVar327;
    fVar357 = auVar340._24_4_ * fVar399 + fVar375 * fVar328;
    auVar115 = vshufps_avx(auVar236,auVar236,0xaa);
    fVar371 = auVar115._12_4_ + fVar275;
    auVar197 = vshufps_avx(auVar236,auVar236,0xff);
    fVar223 = auVar197._12_4_;
    auVar132._0_4_ =
         fVar359 * (fVar372 * auVar340._0_4_ + fVar359 * auVar17._0_4_) + auVar340._0_4_ * fVar277;
    auVar132._4_4_ =
         fVar400 * (fVar373 * auVar340._4_4_ + fVar400 * auVar17._4_4_) + auVar340._4_4_ * fVar285;
    auVar132._8_4_ =
         fVar407 * (fVar409 * auVar340._8_4_ + fVar407 * auVar17._8_4_) + auVar340._8_4_ * fVar286;
    auVar132._12_4_ =
         fVar408 * (auVar183._12_4_ * auVar340._12_4_ + fVar408 * fVar274) +
         auVar340._12_4_ * fVar341;
    auVar132._16_4_ =
         fVar410 * (fVar372 * auVar340._16_4_ + fVar410 * auVar17._0_4_) + auVar340._16_4_ * fVar354
    ;
    auVar132._20_4_ =
         fVar327 * (fVar373 * auVar340._20_4_ + fVar327 * auVar17._4_4_) + auVar340._20_4_ * fVar356
    ;
    auVar132._24_4_ =
         fVar328 * (fVar409 * auVar340._24_4_ + fVar328 * auVar17._8_4_) + auVar340._24_4_ * fVar358
    ;
    auVar132._28_4_ = auVar27._28_4_ + fVar274 + fVar223;
    auVar166._0_4_ =
         fVar359 * (fVar360 * auVar340._0_4_ + auVar146._0_4_ * fVar359) + auVar340._0_4_ * fVar368;
    auVar166._4_4_ =
         fVar400 * (fVar369 * auVar340._4_4_ + auVar146._4_4_ * fVar400) + auVar340._4_4_ * fVar370;
    auVar166._8_4_ =
         fVar407 * (fVar375 * auVar340._8_4_ + auVar146._8_4_ * fVar407) + auVar340._8_4_ * fVar383;
    auVar166._12_4_ =
         fVar408 * (fVar384 * auVar340._12_4_ + auVar146._12_4_ * fVar408) +
         auVar340._12_4_ * fVar385;
    auVar166._16_4_ =
         fVar410 * (fVar360 * auVar340._16_4_ + auVar146._0_4_ * fVar410) +
         auVar340._16_4_ * fVar342;
    auVar166._20_4_ =
         fVar327 * (fVar369 * auVar340._20_4_ + auVar146._4_4_ * fVar327) +
         auVar340._20_4_ * fVar355;
    auVar166._24_4_ =
         fVar328 * (fVar375 * auVar340._24_4_ + auVar146._8_4_ * fVar328) +
         auVar340._24_4_ * fVar357;
    auVar166._28_4_ = fVar274 + auVar26._28_4_ + fVar223;
    auVar26 = vperm2f128_avx(local_b8,local_b8,1);
    auVar26 = vshufps_avx(auVar26,local_b8,0x30);
    auVar30 = vshufps_avx(local_b8,auVar26,0x29);
    auVar270._0_4_ =
         auVar340._0_4_ * (auVar115._0_4_ * auVar340._0_4_ + fVar359 * fVar271) + fVar359 * fVar277;
    auVar270._4_4_ =
         auVar340._4_4_ * (auVar115._4_4_ * auVar340._4_4_ + fVar400 * fVar272) + fVar400 * fVar285;
    auVar270._8_4_ =
         auVar340._8_4_ * (auVar115._8_4_ * auVar340._8_4_ + fVar407 * fVar273) + fVar407 * fVar286;
    auVar270._12_4_ =
         auVar340._12_4_ * (auVar115._12_4_ * auVar340._12_4_ + fVar408 * fVar275) +
         fVar408 * fVar341;
    auVar270._16_4_ =
         auVar340._16_4_ * (auVar115._0_4_ * auVar340._16_4_ + fVar410 * fVar271) +
         fVar410 * fVar354;
    auVar270._20_4_ =
         auVar340._20_4_ * (auVar115._4_4_ * auVar340._20_4_ + fVar327 * fVar272) +
         fVar327 * fVar356;
    auVar270._24_4_ =
         auVar340._24_4_ * (auVar115._8_4_ * auVar340._24_4_ + fVar328 * fVar273) +
         fVar328 * fVar358;
    auVar270._28_4_ = fVar371 + fVar386 + auVar269._28_4_;
    auVar316._0_4_ =
         fVar359 * fVar368 + auVar340._0_4_ * (auVar340._0_4_ * auVar197._0_4_ + fVar359 * fVar206);
    auVar316._4_4_ =
         fVar400 * fVar370 + auVar340._4_4_ * (auVar340._4_4_ * auVar197._4_4_ + fVar400 * fVar387);
    auVar316._8_4_ =
         fVar407 * fVar383 + auVar340._8_4_ * (auVar340._8_4_ * auVar197._8_4_ + fVar407 * fVar399);
    auVar316._12_4_ =
         fVar408 * fVar385 + auVar340._12_4_ * (auVar340._12_4_ * fVar223 + fVar408 * fVar276);
    auVar316._16_4_ =
         fVar410 * fVar342 +
         auVar340._16_4_ * (auVar340._16_4_ * auVar197._0_4_ + fVar410 * fVar206);
    auVar316._20_4_ =
         fVar327 * fVar355 +
         auVar340._20_4_ * (auVar340._20_4_ * auVar197._4_4_ + fVar327 * fVar387);
    auVar316._24_4_ =
         fVar328 * fVar357 +
         auVar340._24_4_ * (auVar340._24_4_ * auVar197._8_4_ + fVar328 * fVar399);
    auVar316._28_4_ = fVar386 + fVar384 + fVar223 + fVar276;
    auVar301._0_4_ = fVar359 * auVar132._0_4_ + auVar340._0_4_ * auVar270._0_4_;
    auVar301._4_4_ = fVar400 * auVar132._4_4_ + auVar340._4_4_ * auVar270._4_4_;
    auVar301._8_4_ = fVar407 * auVar132._8_4_ + auVar340._8_4_ * auVar270._8_4_;
    auVar301._12_4_ = fVar408 * auVar132._12_4_ + auVar340._12_4_ * auVar270._12_4_;
    auVar301._16_4_ = fVar410 * auVar132._16_4_ + auVar340._16_4_ * auVar270._16_4_;
    auVar301._20_4_ = fVar327 * auVar132._20_4_ + auVar340._20_4_ * auVar270._20_4_;
    auVar301._24_4_ = fVar328 * auVar132._24_4_ + auVar340._24_4_ * auVar270._24_4_;
    auVar301._28_4_ = fVar371 + fVar223 + fVar276;
    auVar326._0_4_ = fVar359 * auVar166._0_4_ + auVar340._0_4_ * auVar316._0_4_;
    auVar326._4_4_ = fVar400 * auVar166._4_4_ + auVar340._4_4_ * auVar316._4_4_;
    auVar326._8_4_ = fVar407 * auVar166._8_4_ + auVar340._8_4_ * auVar316._8_4_;
    auVar326._12_4_ = fVar408 * auVar166._12_4_ + auVar340._12_4_ * auVar316._12_4_;
    auVar326._16_4_ = fVar410 * auVar166._16_4_ + auVar340._16_4_ * auVar316._16_4_;
    auVar326._20_4_ = fVar327 * auVar166._20_4_ + auVar340._20_4_ * auVar316._20_4_;
    auVar326._24_4_ = fVar328 * auVar166._24_4_ + auVar340._24_4_ * auVar316._24_4_;
    auVar326._28_4_ = auVar28._28_4_ + auVar340._28_4_;
    auVar44 = vsubps_avx(auVar270,auVar132);
    auVar26 = vsubps_avx(auVar316,auVar166);
    local_138 = local_548 * auVar44._0_4_ * 3.0;
    fStack_134 = fStack_544 * auVar44._4_4_ * 3.0;
    auVar48._4_4_ = fStack_134;
    auVar48._0_4_ = local_138;
    fStack_130 = fStack_540 * auVar44._8_4_ * 3.0;
    auVar48._8_4_ = fStack_130;
    fStack_12c = fStack_53c * auVar44._12_4_ * 3.0;
    auVar48._12_4_ = fStack_12c;
    fStack_128 = local_548 * auVar44._16_4_ * 3.0;
    auVar48._16_4_ = fStack_128;
    fStack_124 = fStack_544 * auVar44._20_4_ * 3.0;
    auVar48._20_4_ = fStack_124;
    fStack_120 = fStack_540 * auVar44._24_4_ * 3.0;
    auVar48._24_4_ = fStack_120;
    auVar48._28_4_ = auVar44._28_4_;
    local_158 = local_548 * auVar26._0_4_ * 3.0;
    fStack_154 = fStack_544 * auVar26._4_4_ * 3.0;
    auVar49._4_4_ = fStack_154;
    auVar49._0_4_ = local_158;
    fStack_150 = fStack_540 * auVar26._8_4_ * 3.0;
    auVar49._8_4_ = fStack_150;
    fStack_14c = fStack_53c * auVar26._12_4_ * 3.0;
    auVar49._12_4_ = fStack_14c;
    fStack_148 = local_548 * auVar26._16_4_ * 3.0;
    auVar49._16_4_ = fStack_148;
    fStack_144 = fStack_544 * auVar26._20_4_ * 3.0;
    auVar49._20_4_ = fStack_144;
    fStack_140 = fStack_540 * auVar26._24_4_ * 3.0;
    auVar49._24_4_ = fStack_140;
    auVar49._28_4_ = auVar270._28_4_;
    auVar26 = vperm2f128_avx(auVar301,auVar301,1);
    auVar26 = vshufps_avx(auVar26,auVar301,0x30);
    auVar31 = vshufps_avx(auVar301,auVar26,0x29);
    auVar28 = vsubps_avx(auVar301,auVar48);
    auVar26 = vperm2f128_avx(auVar28,auVar28,1);
    auVar26 = vshufps_avx(auVar26,auVar28,0x30);
    auVar26 = vshufps_avx(auVar28,auVar26,0x29);
    auVar32 = vsubps_avx(auVar326,auVar49);
    auVar28 = vperm2f128_avx(auVar32,auVar32,1);
    auVar28 = vshufps_avx(auVar28,auVar32,0x30);
    auVar32 = vshufps_avx(auVar32,auVar28,0x29);
    auVar45 = vsubps_avx(auVar301,local_b8);
    auVar126 = vsubps_avx(auVar31,auVar30);
    fVar271 = auVar126._0_4_ + auVar45._0_4_;
    fVar206 = auVar126._4_4_ + auVar45._4_4_;
    fVar272 = auVar126._8_4_ + auVar45._8_4_;
    fVar387 = auVar126._12_4_ + auVar45._12_4_;
    fVar273 = auVar126._16_4_ + auVar45._16_4_;
    fVar399 = auVar126._20_4_ + auVar45._20_4_;
    fVar274 = auVar126._24_4_ + auVar45._24_4_;
    auVar28 = vperm2f128_avx(auVar221,auVar221,1);
    auVar28 = vshufps_avx(auVar28,auVar221,0x30);
    local_d8 = vshufps_avx(auVar221,auVar28,0x29);
    auVar28 = vperm2f128_avx(auVar326,auVar326,1);
    auVar28 = vshufps_avx(auVar28,auVar326,0x30);
    auVar33 = vshufps_avx(auVar326,auVar28,0x29);
    auVar28 = vsubps_avx(auVar326,auVar221);
    auVar127 = vsubps_avx(auVar33,local_d8);
    fVar275 = auVar127._0_4_ + auVar28._0_4_;
    fVar276 = auVar127._4_4_ + auVar28._4_4_;
    fVar223 = auVar127._8_4_ + auVar28._8_4_;
    fVar277 = auVar127._12_4_ + auVar28._12_4_;
    fVar285 = auVar127._16_4_ + auVar28._16_4_;
    fVar286 = auVar127._20_4_ + auVar28._20_4_;
    fVar341 = auVar127._24_4_ + auVar28._24_4_;
    auVar50._4_4_ = fVar206 * auVar221._4_4_;
    auVar50._0_4_ = fVar271 * auVar221._0_4_;
    auVar50._8_4_ = fVar272 * auVar221._8_4_;
    auVar50._12_4_ = fVar387 * auVar221._12_4_;
    auVar50._16_4_ = fVar273 * auVar221._16_4_;
    auVar50._20_4_ = fVar399 * auVar221._20_4_;
    auVar50._24_4_ = fVar274 * auVar221._24_4_;
    auVar50._28_4_ = auVar28._28_4_;
    auVar51._4_4_ = fVar276 * local_b8._4_4_;
    auVar51._0_4_ = fVar275 * local_b8._0_4_;
    auVar51._8_4_ = fVar223 * local_b8._8_4_;
    auVar51._12_4_ = fVar277 * local_b8._12_4_;
    auVar51._16_4_ = fVar285 * local_b8._16_4_;
    auVar51._20_4_ = fVar286 * local_b8._20_4_;
    auVar51._24_4_ = fVar341 * local_b8._24_4_;
    auVar51._28_4_ = fVar371;
    auVar128 = vsubps_avx(auVar50,auVar51);
    local_f8 = local_b8._0_4_ + local_f8;
    fStack_f4 = local_b8._4_4_ + fStack_f4;
    fStack_f0 = local_b8._8_4_ + fStack_f0;
    fStack_ec = local_b8._12_4_ + fStack_ec;
    fStack_e8 = local_b8._16_4_ + fStack_e8;
    fStack_e4 = local_b8._20_4_ + fStack_e4;
    fStack_e0 = local_b8._24_4_ + fStack_e0;
    fStack_dc = local_b8._28_4_ + auVar29._28_4_;
    local_118 = local_118 + auVar221._0_4_;
    fStack_114 = fStack_114 + auVar221._4_4_;
    fStack_110 = fStack_110 + auVar221._8_4_;
    fStack_10c = fStack_10c + auVar221._12_4_;
    fStack_108 = fStack_108 + auVar221._16_4_;
    fStack_104 = fStack_104 + auVar221._20_4_;
    fStack_100 = fStack_100 + auVar221._24_4_;
    fStack_fc = fVar374 + auVar221._28_4_;
    auVar52._4_4_ = fVar206 * fStack_114;
    auVar52._0_4_ = fVar271 * local_118;
    auVar52._8_4_ = fVar272 * fStack_110;
    auVar52._12_4_ = fVar387 * fStack_10c;
    auVar52._16_4_ = fVar273 * fStack_108;
    auVar52._20_4_ = fVar399 * fStack_104;
    auVar52._24_4_ = fVar274 * fStack_100;
    auVar52._28_4_ = fVar374;
    auVar53._4_4_ = fVar276 * fStack_f4;
    auVar53._0_4_ = fVar275 * local_f8;
    auVar53._8_4_ = fVar223 * fStack_f0;
    auVar53._12_4_ = fVar277 * fStack_ec;
    auVar53._16_4_ = fVar285 * fStack_e8;
    auVar53._20_4_ = fVar286 * fStack_e4;
    auVar53._24_4_ = fVar341 * fStack_e0;
    auVar53._28_4_ = fVar374 + auVar221._28_4_;
    auVar29 = vsubps_avx(auVar52,auVar53);
    local_578._0_4_ = auVar27._0_4_;
    local_578._4_4_ = auVar27._4_4_;
    fStack_570 = auVar27._8_4_;
    fStack_56c = auVar27._12_4_;
    fStack_568 = auVar27._16_4_;
    fStack_564 = auVar27._20_4_;
    fStack_560 = auVar27._24_4_;
    auVar54._4_4_ = fVar206 * (float)local_578._4_4_;
    auVar54._0_4_ = fVar271 * (float)local_578._0_4_;
    auVar54._8_4_ = fVar272 * fStack_570;
    auVar54._12_4_ = fVar387 * fStack_56c;
    auVar54._16_4_ = fVar273 * fStack_568;
    auVar54._20_4_ = fVar399 * fStack_564;
    auVar54._24_4_ = fVar274 * fStack_560;
    auVar54._28_4_ = fVar374;
    local_628._0_4_ = auVar129._0_4_;
    local_628._4_4_ = auVar129._4_4_;
    fStack_620 = auVar129._8_4_;
    fStack_61c = auVar129._12_4_;
    fStack_618 = auVar129._16_4_;
    fStack_614 = auVar129._20_4_;
    fStack_610 = auVar129._24_4_;
    auVar55._4_4_ = fVar276 * (float)local_628._4_4_;
    auVar55._0_4_ = fVar275 * (float)local_628._0_4_;
    auVar55._8_4_ = fVar223 * fStack_620;
    auVar55._12_4_ = fVar277 * fStack_61c;
    auVar55._16_4_ = fVar285 * fStack_618;
    auVar55._20_4_ = fVar286 * fStack_614;
    auVar55._24_4_ = fVar341 * fStack_610;
    auVar55._28_4_ = local_b8._28_4_;
    auVar163 = vsubps_avx(auVar54,auVar55);
    auVar56._4_4_ = local_d8._4_4_ * fVar206;
    auVar56._0_4_ = local_d8._0_4_ * fVar271;
    auVar56._8_4_ = local_d8._8_4_ * fVar272;
    auVar56._12_4_ = local_d8._12_4_ * fVar387;
    auVar56._16_4_ = local_d8._16_4_ * fVar273;
    auVar56._20_4_ = local_d8._20_4_ * fVar399;
    auVar56._24_4_ = local_d8._24_4_ * fVar274;
    auVar56._28_4_ = fVar374;
    auVar57._4_4_ = auVar30._4_4_ * fVar276;
    auVar57._0_4_ = auVar30._0_4_ * fVar275;
    auVar57._8_4_ = auVar30._8_4_ * fVar223;
    auVar57._12_4_ = auVar30._12_4_ * fVar277;
    auVar57._16_4_ = auVar30._16_4_ * fVar285;
    auVar57._20_4_ = auVar30._20_4_ * fVar286;
    auVar57._24_4_ = auVar30._24_4_ * fVar341;
    auVar57._28_4_ = local_d8._28_4_;
    local_548 = auVar26._0_4_;
    fStack_544 = auVar26._4_4_;
    fStack_540 = auVar26._8_4_;
    fStack_53c = auVar26._12_4_;
    fStack_538 = auVar26._16_4_;
    fStack_534 = auVar26._20_4_;
    fStack_530 = auVar26._24_4_;
    auVar164 = vsubps_avx(auVar56,auVar57);
    auVar58._4_4_ = auVar326._4_4_ * fVar206;
    auVar58._0_4_ = auVar326._0_4_ * fVar271;
    auVar58._8_4_ = auVar326._8_4_ * fVar272;
    auVar58._12_4_ = auVar326._12_4_ * fVar387;
    auVar58._16_4_ = auVar326._16_4_ * fVar273;
    auVar58._20_4_ = auVar326._20_4_ * fVar399;
    auVar58._24_4_ = auVar326._24_4_ * fVar274;
    auVar58._28_4_ = fVar374;
    auVar59._4_4_ = fVar276 * auVar301._4_4_;
    auVar59._0_4_ = fVar275 * auVar301._0_4_;
    auVar59._8_4_ = fVar223 * auVar301._8_4_;
    auVar59._12_4_ = fVar277 * auVar301._12_4_;
    auVar59._16_4_ = fVar285 * auVar301._16_4_;
    auVar59._20_4_ = fVar286 * auVar301._20_4_;
    auVar59._24_4_ = fVar341 * auVar301._24_4_;
    auVar59._28_4_ = fStack_dc;
    auVar165 = vsubps_avx(auVar58,auVar59);
    local_138 = auVar301._0_4_ + local_138;
    fStack_134 = auVar301._4_4_ + fStack_134;
    fStack_130 = auVar301._8_4_ + fStack_130;
    fStack_12c = auVar301._12_4_ + fStack_12c;
    fStack_128 = auVar301._16_4_ + fStack_128;
    fStack_124 = auVar301._20_4_ + fStack_124;
    fStack_120 = auVar301._24_4_ + fStack_120;
    fStack_11c = auVar301._28_4_ + auVar44._28_4_;
    local_158 = auVar326._0_4_ + local_158;
    fStack_154 = auVar326._4_4_ + fStack_154;
    fStack_150 = auVar326._8_4_ + fStack_150;
    fStack_14c = auVar326._12_4_ + fStack_14c;
    fStack_148 = auVar326._16_4_ + fStack_148;
    fStack_144 = auVar326._20_4_ + fStack_144;
    fStack_140 = auVar326._24_4_ + fStack_140;
    fStack_13c = auVar326._28_4_ + auVar270._28_4_;
    auVar60._4_4_ = fVar206 * fStack_154;
    auVar60._0_4_ = fVar271 * local_158;
    auVar60._8_4_ = fVar272 * fStack_150;
    auVar60._12_4_ = fVar387 * fStack_14c;
    auVar60._16_4_ = fVar273 * fStack_148;
    auVar60._20_4_ = fVar399 * fStack_144;
    auVar60._24_4_ = fVar274 * fStack_140;
    auVar60._28_4_ = auVar326._28_4_ + auVar270._28_4_;
    auVar61._4_4_ = fStack_134 * fVar276;
    auVar61._0_4_ = local_138 * fVar275;
    auVar61._8_4_ = fStack_130 * fVar223;
    auVar61._12_4_ = fStack_12c * fVar277;
    auVar61._16_4_ = fStack_128 * fVar285;
    auVar61._20_4_ = fStack_124 * fVar286;
    auVar61._24_4_ = fStack_120 * fVar341;
    auVar61._28_4_ = fStack_11c;
    auVar44 = vsubps_avx(auVar60,auVar61);
    auVar62._4_4_ = fVar206 * auVar32._4_4_;
    auVar62._0_4_ = fVar271 * auVar32._0_4_;
    auVar62._8_4_ = fVar272 * auVar32._8_4_;
    auVar62._12_4_ = fVar387 * auVar32._12_4_;
    auVar62._16_4_ = fVar273 * auVar32._16_4_;
    auVar62._20_4_ = fVar399 * auVar32._20_4_;
    auVar62._24_4_ = fVar274 * auVar32._24_4_;
    auVar62._28_4_ = fStack_11c;
    auVar63._4_4_ = fVar276 * fStack_544;
    auVar63._0_4_ = fVar275 * local_548;
    auVar63._8_4_ = fVar223 * fStack_540;
    auVar63._12_4_ = fVar277 * fStack_53c;
    auVar63._16_4_ = fVar285 * fStack_538;
    auVar63._20_4_ = fVar286 * fStack_534;
    auVar63._24_4_ = fVar341 * fStack_530;
    auVar63._28_4_ = auVar32._28_4_;
    auVar200 = vsubps_avx(auVar62,auVar63);
    auVar64._4_4_ = fVar206 * auVar33._4_4_;
    auVar64._0_4_ = fVar271 * auVar33._0_4_;
    auVar64._8_4_ = fVar272 * auVar33._8_4_;
    auVar64._12_4_ = fVar387 * auVar33._12_4_;
    auVar64._16_4_ = fVar273 * auVar33._16_4_;
    auVar64._20_4_ = fVar399 * auVar33._20_4_;
    auVar64._24_4_ = fVar274 * auVar33._24_4_;
    auVar64._28_4_ = auVar126._28_4_ + auVar45._28_4_;
    auVar65._4_4_ = auVar31._4_4_ * fVar276;
    auVar65._0_4_ = auVar31._0_4_ * fVar275;
    auVar65._8_4_ = auVar31._8_4_ * fVar223;
    auVar65._12_4_ = auVar31._12_4_ * fVar277;
    auVar65._16_4_ = auVar31._16_4_ * fVar285;
    auVar65._20_4_ = auVar31._20_4_ * fVar286;
    auVar65._24_4_ = auVar31._24_4_ * fVar341;
    auVar65._28_4_ = auVar127._28_4_ + auVar28._28_4_;
    auVar45 = vsubps_avx(auVar64,auVar65);
    auVar26 = vminps_avx(auVar128,auVar29);
    auVar129 = vmaxps_avx(auVar128,auVar29);
    auVar27 = vminps_avx(auVar163,auVar164);
    auVar27 = vminps_avx(auVar26,auVar27);
    auVar26 = vmaxps_avx(auVar163,auVar164);
    auVar129 = vmaxps_avx(auVar129,auVar26);
    auVar28 = vminps_avx(auVar165,auVar44);
    auVar26 = vmaxps_avx(auVar165,auVar44);
    auVar29 = vminps_avx(auVar200,auVar45);
    auVar29 = vminps_avx(auVar28,auVar29);
    auVar29 = vminps_avx(auVar27,auVar29);
    auVar27 = vmaxps_avx(auVar200,auVar45);
    auVar26 = vmaxps_avx(auVar26,auVar27);
    auVar26 = vmaxps_avx(auVar129,auVar26);
    auVar129 = vcmpps_avx(auVar29,local_78,2);
    auVar26 = vcmpps_avx(auVar26,local_98,5);
    auVar129 = vandps_avx(auVar26,auVar129);
    auVar26 = local_178 & auVar129;
    if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar26 >> 0x7f,0) != '\0') ||
          (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar26 >> 0xbf,0) != '\0') ||
        (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar26[0x1f] < '\0')
    {
      auVar26 = vsubps_avx(auVar30,local_b8);
      auVar27 = vsubps_avx(auVar31,auVar301);
      fVar206 = auVar26._0_4_ + auVar27._0_4_;
      fVar272 = auVar26._4_4_ + auVar27._4_4_;
      fVar387 = auVar26._8_4_ + auVar27._8_4_;
      fVar273 = auVar26._12_4_ + auVar27._12_4_;
      fVar399 = auVar26._16_4_ + auVar27._16_4_;
      fVar274 = auVar26._20_4_ + auVar27._20_4_;
      fVar275 = auVar26._24_4_ + auVar27._24_4_;
      auVar29 = vsubps_avx(local_d8,auVar221);
      auVar44 = vsubps_avx(auVar33,auVar326);
      fVar276 = auVar29._0_4_ + auVar44._0_4_;
      fVar223 = auVar29._4_4_ + auVar44._4_4_;
      fVar277 = auVar29._8_4_ + auVar44._8_4_;
      fVar285 = auVar29._12_4_ + auVar44._12_4_;
      fVar286 = auVar29._16_4_ + auVar44._16_4_;
      fVar341 = auVar29._20_4_ + auVar44._20_4_;
      fVar354 = auVar29._24_4_ + auVar44._24_4_;
      fVar271 = auVar44._28_4_;
      auVar66._4_4_ = auVar221._4_4_ * fVar272;
      auVar66._0_4_ = auVar221._0_4_ * fVar206;
      auVar66._8_4_ = auVar221._8_4_ * fVar387;
      auVar66._12_4_ = auVar221._12_4_ * fVar273;
      auVar66._16_4_ = auVar221._16_4_ * fVar399;
      auVar66._20_4_ = auVar221._20_4_ * fVar274;
      auVar66._24_4_ = auVar221._24_4_ * fVar275;
      auVar66._28_4_ = auVar221._28_4_;
      auVar67._4_4_ = local_b8._4_4_ * fVar223;
      auVar67._0_4_ = local_b8._0_4_ * fVar276;
      auVar67._8_4_ = local_b8._8_4_ * fVar277;
      auVar67._12_4_ = local_b8._12_4_ * fVar285;
      auVar67._16_4_ = local_b8._16_4_ * fVar286;
      auVar67._20_4_ = local_b8._20_4_ * fVar341;
      auVar67._24_4_ = local_b8._24_4_ * fVar354;
      auVar67._28_4_ = local_b8._28_4_;
      auVar44 = vsubps_avx(auVar66,auVar67);
      auVar68._4_4_ = fVar272 * fStack_114;
      auVar68._0_4_ = fVar206 * local_118;
      auVar68._8_4_ = fVar387 * fStack_110;
      auVar68._12_4_ = fVar273 * fStack_10c;
      auVar68._16_4_ = fVar399 * fStack_108;
      auVar68._20_4_ = fVar274 * fStack_104;
      auVar68._24_4_ = fVar275 * fStack_100;
      auVar68._28_4_ = auVar221._28_4_;
      auVar69._4_4_ = fVar223 * fStack_f4;
      auVar69._0_4_ = fVar276 * local_f8;
      auVar69._8_4_ = fVar277 * fStack_f0;
      auVar69._12_4_ = fVar285 * fStack_ec;
      auVar69._16_4_ = fVar286 * fStack_e8;
      auVar69._20_4_ = fVar341 * fStack_e4;
      auVar69._24_4_ = fVar354 * fStack_e0;
      auVar69._28_4_ = fVar271;
      auVar45 = vsubps_avx(auVar68,auVar69);
      auVar70._4_4_ = fVar272 * (float)local_578._4_4_;
      auVar70._0_4_ = fVar206 * (float)local_578._0_4_;
      auVar70._8_4_ = fVar387 * fStack_570;
      auVar70._12_4_ = fVar273 * fStack_56c;
      auVar70._16_4_ = fVar399 * fStack_568;
      auVar70._20_4_ = fVar274 * fStack_564;
      auVar70._24_4_ = fVar275 * fStack_560;
      auVar70._28_4_ = fVar271;
      auVar71._4_4_ = fVar223 * (float)local_628._4_4_;
      auVar71._0_4_ = fVar276 * (float)local_628._0_4_;
      auVar71._8_4_ = fVar277 * fStack_620;
      auVar71._12_4_ = fVar285 * fStack_61c;
      auVar71._16_4_ = fVar286 * fStack_618;
      auVar71._20_4_ = fVar341 * fStack_614;
      auVar71._24_4_ = fVar354 * fStack_610;
      auVar71._28_4_ = auVar28._28_4_;
      auVar126 = vsubps_avx(auVar70,auVar71);
      auVar72._4_4_ = local_d8._4_4_ * fVar272;
      auVar72._0_4_ = local_d8._0_4_ * fVar206;
      auVar72._8_4_ = local_d8._8_4_ * fVar387;
      auVar72._12_4_ = local_d8._12_4_ * fVar273;
      auVar72._16_4_ = local_d8._16_4_ * fVar399;
      auVar72._20_4_ = local_d8._20_4_ * fVar274;
      auVar72._24_4_ = local_d8._24_4_ * fVar275;
      auVar72._28_4_ = auVar28._28_4_;
      auVar73._4_4_ = auVar30._4_4_ * fVar223;
      auVar73._0_4_ = auVar30._0_4_ * fVar276;
      auVar73._8_4_ = auVar30._8_4_ * fVar277;
      auVar73._12_4_ = auVar30._12_4_ * fVar285;
      auVar73._16_4_ = auVar30._16_4_ * fVar286;
      auVar73._20_4_ = auVar30._20_4_ * fVar341;
      uVar92 = auVar30._28_4_;
      auVar73._24_4_ = auVar30._24_4_ * fVar354;
      auVar73._28_4_ = uVar92;
      auVar30 = vsubps_avx(auVar72,auVar73);
      auVar74._4_4_ = auVar326._4_4_ * fVar272;
      auVar74._0_4_ = auVar326._0_4_ * fVar206;
      auVar74._8_4_ = auVar326._8_4_ * fVar387;
      auVar74._12_4_ = auVar326._12_4_ * fVar273;
      auVar74._16_4_ = auVar326._16_4_ * fVar399;
      auVar74._20_4_ = auVar326._20_4_ * fVar274;
      auVar74._24_4_ = auVar326._24_4_ * fVar275;
      auVar74._28_4_ = uVar92;
      auVar75._4_4_ = auVar301._4_4_ * fVar223;
      auVar75._0_4_ = auVar301._0_4_ * fVar276;
      auVar75._8_4_ = auVar301._8_4_ * fVar277;
      auVar75._12_4_ = auVar301._12_4_ * fVar285;
      auVar75._16_4_ = auVar301._16_4_ * fVar286;
      auVar75._20_4_ = auVar301._20_4_ * fVar341;
      auVar75._24_4_ = auVar301._24_4_ * fVar354;
      auVar75._28_4_ = auVar301._28_4_;
      auVar127 = vsubps_avx(auVar74,auVar75);
      auVar76._4_4_ = fVar272 * fStack_154;
      auVar76._0_4_ = fVar206 * local_158;
      auVar76._8_4_ = fVar387 * fStack_150;
      auVar76._12_4_ = fVar273 * fStack_14c;
      auVar76._16_4_ = fVar399 * fStack_148;
      auVar76._20_4_ = fVar274 * fStack_144;
      auVar76._24_4_ = fVar275 * fStack_140;
      auVar76._28_4_ = uVar92;
      auVar77._4_4_ = fVar223 * fStack_134;
      auVar77._0_4_ = fVar276 * local_138;
      auVar77._8_4_ = fVar277 * fStack_130;
      auVar77._12_4_ = fVar285 * fStack_12c;
      auVar77._16_4_ = fVar286 * fStack_128;
      auVar77._20_4_ = fVar341 * fStack_124;
      auVar77._24_4_ = fVar354 * fStack_120;
      auVar77._28_4_ = auVar326._28_4_;
      auVar128 = vsubps_avx(auVar76,auVar77);
      auVar78._4_4_ = fVar272 * auVar32._4_4_;
      auVar78._0_4_ = fVar206 * auVar32._0_4_;
      auVar78._8_4_ = fVar387 * auVar32._8_4_;
      auVar78._12_4_ = fVar273 * auVar32._12_4_;
      auVar78._16_4_ = fVar399 * auVar32._16_4_;
      auVar78._20_4_ = fVar274 * auVar32._20_4_;
      auVar78._24_4_ = fVar275 * auVar32._24_4_;
      auVar78._28_4_ = auVar326._28_4_;
      auVar79._4_4_ = fStack_544 * fVar223;
      auVar79._0_4_ = local_548 * fVar276;
      auVar79._8_4_ = fStack_540 * fVar277;
      auVar79._12_4_ = fStack_53c * fVar285;
      auVar79._16_4_ = fStack_538 * fVar286;
      auVar79._20_4_ = fStack_534 * fVar341;
      auVar79._24_4_ = fStack_530 * fVar354;
      auVar79._28_4_ = local_d8._28_4_;
      auVar32 = vsubps_avx(auVar78,auVar79);
      auVar80._4_4_ = fVar272 * auVar33._4_4_;
      auVar80._0_4_ = fVar206 * auVar33._0_4_;
      auVar80._8_4_ = fVar387 * auVar33._8_4_;
      auVar80._12_4_ = fVar273 * auVar33._12_4_;
      auVar80._16_4_ = fVar399 * auVar33._16_4_;
      auVar80._20_4_ = fVar274 * auVar33._20_4_;
      auVar80._24_4_ = fVar275 * auVar33._24_4_;
      auVar80._28_4_ = auVar26._28_4_ + auVar27._28_4_;
      auVar81._4_4_ = auVar31._4_4_ * fVar223;
      auVar81._0_4_ = auVar31._0_4_ * fVar276;
      auVar81._8_4_ = auVar31._8_4_ * fVar277;
      auVar81._12_4_ = auVar31._12_4_ * fVar285;
      auVar81._16_4_ = auVar31._16_4_ * fVar286;
      auVar81._20_4_ = auVar31._20_4_ * fVar341;
      auVar81._24_4_ = auVar31._24_4_ * fVar354;
      auVar81._28_4_ = auVar29._28_4_ + fVar271;
      auVar31 = vsubps_avx(auVar80,auVar81);
      auVar27 = vminps_avx(auVar44,auVar45);
      auVar26 = vmaxps_avx(auVar44,auVar45);
      auVar28 = vminps_avx(auVar126,auVar30);
      auVar28 = vminps_avx(auVar27,auVar28);
      auVar27 = vmaxps_avx(auVar126,auVar30);
      auVar26 = vmaxps_avx(auVar26,auVar27);
      auVar29 = vminps_avx(auVar127,auVar128);
      auVar27 = vmaxps_avx(auVar127,auVar128);
      auVar30 = vminps_avx(auVar32,auVar31);
      auVar29 = vminps_avx(auVar29,auVar30);
      auVar29 = vminps_avx(auVar28,auVar29);
      auVar28 = vmaxps_avx(auVar32,auVar31);
      auVar27 = vmaxps_avx(auVar27,auVar28);
      auVar27 = vmaxps_avx(auVar26,auVar27);
      auVar26 = vcmpps_avx(auVar29,local_78,2);
      auVar27 = vcmpps_avx(auVar27,local_98,5);
      auVar26 = vandps_avx(auVar27,auVar26);
      auVar129 = vandps_avx(local_178,auVar129);
      auVar27 = auVar129 & auVar26;
      if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar27 >> 0x7f,0) != '\0') ||
            (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar27 >> 0xbf,0) != '\0') ||
          (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar27[0x1f] < '\0') {
        auVar129 = vandps_avx(auVar26,auVar129);
        uVar85 = vmovmskps_avx(auVar129);
        if (uVar85 != 0) {
          mask_stack[uVar90] = uVar85 & 0xff;
          BVar9 = (BBox1f)vmovlps_avx(auVar402);
          cu_stack[uVar90] = BVar9;
          BVar9 = (BBox1f)vmovlps_avx(auVar343);
          cv_stack[uVar90] = BVar9;
          uVar90 = (ulong)((int)uVar90 + 1);
        }
      }
    }
LAB_00ac1d86:
    do {
      do {
        do {
          do {
            if ((int)uVar90 == 0) {
              auVar107 = ZEXT816(0) << 0x40;
              if (bVar94) goto LAB_00ac2da5;
              uVar92 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar135._4_4_ = uVar92;
              auVar135._0_4_ = uVar92;
              auVar135._8_4_ = uVar92;
              auVar135._12_4_ = uVar92;
              auVar135._16_4_ = uVar92;
              auVar135._20_4_ = uVar92;
              auVar135._24_4_ = uVar92;
              auVar135._28_4_ = uVar92;
              auVar129 = vcmpps_avx(local_198,auVar135,2);
              uVar86 = vmovmskps_avx(auVar129);
              uVar87 = (ulong)((uint)uVar87 & (uint)uVar87 + 0xff & uVar86);
              goto LAB_00ac0b2b;
            }
            uVar88 = (int)uVar90 - 1;
            uVar85 = mask_stack[uVar88];
            fVar271 = cu_stack[uVar88].lower;
            fVar206 = cu_stack[uVar88].upper;
            auVar344._8_8_ = 0;
            auVar344._0_4_ = cv_stack[uVar88].lower;
            auVar344._4_4_ = cv_stack[uVar88].upper;
            auVar353 = ZEXT1664(auVar344);
            uVar25 = 0;
            if (uVar85 != 0) {
              for (; (uVar85 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
              }
            }
            uVar85 = uVar85 - 1 & uVar85;
            mask_stack[uVar88] = uVar85;
            if (uVar85 == 0) {
              uVar90 = (ulong)uVar88;
            }
            fVar387 = (float)(uVar25 + 1) * 0.14285715;
            fVar272 = (1.0 - (float)uVar25 * 0.14285715) * fVar271 +
                      fVar206 * (float)uVar25 * 0.14285715;
            fVar271 = (1.0 - fVar387) * fVar271 + fVar206 * fVar387;
            fVar206 = fVar271 - fVar272;
            if (0.16666667 <= fVar206) {
              auVar115 = vinsertps_avx(ZEXT416((uint)fVar272),ZEXT416((uint)fVar271),0x10);
              auVar406 = ZEXT1664(auVar115);
              goto LAB_00ac172d;
            }
            auVar115 = vshufps_avx(auVar344,auVar344,0x50);
            auVar144._8_4_ = 0x3f800000;
            auVar144._0_8_ = 0x3f8000003f800000;
            auVar144._12_4_ = 0x3f800000;
            auVar17 = vsubps_avx(auVar144,auVar115);
            fVar387 = auVar115._0_4_;
            fVar273 = auVar115._4_4_;
            fVar399 = auVar115._8_4_;
            fVar274 = auVar115._12_4_;
            fVar275 = auVar17._0_4_;
            fVar276 = auVar17._4_4_;
            fVar223 = auVar17._8_4_;
            fVar277 = auVar17._12_4_;
            auVar181._0_4_ = fVar387 * auVar309._0_4_ + fVar275 * (float)local_608._0_4_;
            auVar181._4_4_ = fVar273 * auVar309._4_4_ + fVar276 * (float)local_608._4_4_;
            auVar181._8_4_ = fVar399 * auVar309._0_4_ + fVar223 * (float)local_608._0_4_;
            auVar181._12_4_ = fVar274 * auVar309._4_4_ + fVar277 * (float)local_608._4_4_;
            auVar237._0_4_ = auVar318._0_4_ * fVar387 + fVar222 * fVar275;
            auVar237._4_4_ = auVar318._4_4_ * fVar273 + fVar252 * fVar276;
            auVar237._8_4_ = auVar318._0_4_ * fVar399 + fVar222 * fVar223;
            auVar237._12_4_ = auVar318._4_4_ * fVar274 + fVar252 * fVar277;
            auVar261._0_4_ = auVar331._0_4_ * fVar387 + auVar213._0_4_ * fVar275;
            auVar261._4_4_ = auVar331._4_4_ * fVar273 + auVar213._4_4_ * fVar276;
            auVar261._8_4_ = auVar331._0_4_ * fVar399 + auVar213._0_4_ * fVar223;
            auVar261._12_4_ = auVar331._4_4_ * fVar274 + auVar213._4_4_ * fVar277;
            auVar112._0_4_ = auVar110._0_4_ * fVar387 + auVar143._0_4_ * fVar275;
            auVar112._4_4_ = auVar110._4_4_ * fVar273 + auVar143._4_4_ * fVar276;
            auVar112._8_4_ = auVar110._0_4_ * fVar399 + auVar143._0_4_ * fVar223;
            auVar112._12_4_ = auVar110._4_4_ * fVar274 + auVar143._4_4_ * fVar277;
            auVar167._16_16_ = auVar181;
            auVar167._0_16_ = auVar181;
            auVar204._16_16_ = auVar237;
            auVar204._0_16_ = auVar237;
            auVar249._16_16_ = auVar261;
            auVar249._0_16_ = auVar261;
            auVar129 = ZEXT2032(CONCAT416(fVar271,ZEXT416((uint)fVar272)));
            auVar129 = vshufps_avx(auVar129,auVar129,0);
            auVar26 = vsubps_avx(auVar204,auVar167);
            fVar387 = auVar129._0_4_;
            fVar273 = auVar129._4_4_;
            fVar399 = auVar129._8_4_;
            fVar274 = auVar129._12_4_;
            fVar275 = auVar129._16_4_;
            fVar276 = auVar129._20_4_;
            fVar223 = auVar129._24_4_;
            auVar168._0_4_ = auVar181._0_4_ + auVar26._0_4_ * fVar387;
            auVar168._4_4_ = auVar181._4_4_ + auVar26._4_4_ * fVar273;
            auVar168._8_4_ = auVar181._8_4_ + auVar26._8_4_ * fVar399;
            auVar168._12_4_ = auVar181._12_4_ + auVar26._12_4_ * fVar274;
            auVar168._16_4_ = auVar181._0_4_ + auVar26._16_4_ * fVar275;
            auVar168._20_4_ = auVar181._4_4_ + auVar26._20_4_ * fVar276;
            auVar168._24_4_ = auVar181._8_4_ + auVar26._24_4_ * fVar223;
            auVar168._28_4_ = auVar181._12_4_ + auVar26._28_4_;
            auVar129 = vsubps_avx(auVar249,auVar204);
            auVar205._0_4_ = auVar237._0_4_ + auVar129._0_4_ * fVar387;
            auVar205._4_4_ = auVar237._4_4_ + auVar129._4_4_ * fVar273;
            auVar205._8_4_ = auVar237._8_4_ + auVar129._8_4_ * fVar399;
            auVar205._12_4_ = auVar237._12_4_ + auVar129._12_4_ * fVar274;
            auVar205._16_4_ = auVar237._0_4_ + auVar129._16_4_ * fVar275;
            auVar205._20_4_ = auVar237._4_4_ + auVar129._20_4_ * fVar276;
            auVar205._24_4_ = auVar237._8_4_ + auVar129._24_4_ * fVar223;
            auVar205._28_4_ = auVar237._12_4_ + auVar129._28_4_;
            auVar115 = vsubps_avx(auVar112,auVar261);
            auVar133._0_4_ = auVar261._0_4_ + auVar115._0_4_ * fVar387;
            auVar133._4_4_ = auVar261._4_4_ + auVar115._4_4_ * fVar273;
            auVar133._8_4_ = auVar261._8_4_ + auVar115._8_4_ * fVar399;
            auVar133._12_4_ = auVar261._12_4_ + auVar115._12_4_ * fVar274;
            auVar133._16_4_ = auVar261._0_4_ + auVar115._0_4_ * fVar275;
            auVar133._20_4_ = auVar261._4_4_ + auVar115._4_4_ * fVar276;
            auVar133._24_4_ = auVar261._8_4_ + auVar115._8_4_ * fVar223;
            auVar133._28_4_ = auVar261._12_4_ + auVar115._12_4_;
            auVar129 = vsubps_avx(auVar205,auVar168);
            auVar169._0_4_ = auVar168._0_4_ + fVar387 * auVar129._0_4_;
            auVar169._4_4_ = auVar168._4_4_ + fVar273 * auVar129._4_4_;
            auVar169._8_4_ = auVar168._8_4_ + fVar399 * auVar129._8_4_;
            auVar169._12_4_ = auVar168._12_4_ + fVar274 * auVar129._12_4_;
            auVar169._16_4_ = auVar168._16_4_ + fVar275 * auVar129._16_4_;
            auVar169._20_4_ = auVar168._20_4_ + fVar276 * auVar129._20_4_;
            auVar169._24_4_ = auVar168._24_4_ + fVar223 * auVar129._24_4_;
            auVar169._28_4_ = auVar168._28_4_ + auVar129._28_4_;
            auVar129 = vsubps_avx(auVar133,auVar205);
            auVar134._0_4_ = auVar205._0_4_ + fVar387 * auVar129._0_4_;
            auVar134._4_4_ = auVar205._4_4_ + fVar273 * auVar129._4_4_;
            auVar134._8_4_ = auVar205._8_4_ + fVar399 * auVar129._8_4_;
            auVar134._12_4_ = auVar205._12_4_ + fVar274 * auVar129._12_4_;
            auVar134._16_4_ = auVar205._16_4_ + fVar275 * auVar129._16_4_;
            auVar134._20_4_ = auVar205._20_4_ + fVar276 * auVar129._20_4_;
            auVar134._24_4_ = auVar205._24_4_ + fVar223 * auVar129._24_4_;
            auVar134._28_4_ = auVar205._28_4_ + auVar129._28_4_;
            auVar129 = vsubps_avx(auVar134,auVar169);
            auVar281._0_4_ = auVar169._0_4_ + fVar387 * auVar129._0_4_;
            auVar281._4_4_ = auVar169._4_4_ + fVar273 * auVar129._4_4_;
            auVar281._8_4_ = auVar169._8_4_ + fVar399 * auVar129._8_4_;
            auVar281._12_4_ = auVar169._12_4_ + fVar274 * auVar129._12_4_;
            auVar284._16_4_ = auVar169._16_4_ + fVar275 * auVar129._16_4_;
            auVar284._0_16_ = auVar281;
            auVar284._20_4_ = auVar169._20_4_ + fVar276 * auVar129._20_4_;
            auVar284._24_4_ = auVar169._24_4_ + fVar223 * auVar129._24_4_;
            auVar284._28_4_ = auVar169._28_4_ + auVar205._28_4_;
            auVar224 = auVar284._16_16_;
            auVar146 = vshufps_avx(ZEXT416((uint)(fVar206 * 0.33333334)),
                                   ZEXT416((uint)(fVar206 * 0.33333334)),0);
            auVar238._0_4_ = auVar281._0_4_ + auVar146._0_4_ * auVar129._0_4_ * 3.0;
            auVar238._4_4_ = auVar281._4_4_ + auVar146._4_4_ * auVar129._4_4_ * 3.0;
            auVar238._8_4_ = auVar281._8_4_ + auVar146._8_4_ * auVar129._8_4_ * 3.0;
            auVar238._12_4_ = auVar281._12_4_ + auVar146._12_4_ * auVar129._12_4_ * 3.0;
            auVar197 = vshufpd_avx(auVar281,auVar281,3);
            auVar96 = vshufpd_avx(auVar224,auVar224,3);
            auVar115 = vsubps_avx(auVar197,auVar281);
            auVar17 = vsubps_avx(auVar96,auVar224);
            auVar113._0_4_ = auVar115._0_4_ + auVar17._0_4_;
            auVar113._4_4_ = auVar115._4_4_ + auVar17._4_4_;
            auVar113._8_4_ = auVar115._8_4_ + auVar17._8_4_;
            auVar113._12_4_ = auVar115._12_4_ + auVar17._12_4_;
            auVar115 = vmovshdup_avx(auVar281);
            auVar17 = vmovshdup_avx(auVar238);
            auVar183 = vshufps_avx(auVar113,auVar113,0);
            auVar147 = vshufps_avx(auVar113,auVar113,0x55);
            fVar387 = auVar147._0_4_;
            fVar273 = auVar147._4_4_;
            fVar399 = auVar147._8_4_;
            fVar274 = auVar147._12_4_;
            fVar275 = auVar183._0_4_;
            fVar276 = auVar183._4_4_;
            fVar223 = auVar183._8_4_;
            fVar277 = auVar183._12_4_;
            auVar114._0_4_ = fVar275 * auVar281._0_4_ + auVar115._0_4_ * fVar387;
            auVar114._4_4_ = fVar276 * auVar281._4_4_ + auVar115._4_4_ * fVar273;
            auVar114._8_4_ = fVar223 * auVar281._8_4_ + auVar115._8_4_ * fVar399;
            auVar114._12_4_ = fVar277 * auVar281._12_4_ + auVar115._12_4_ * fVar274;
            auVar345._0_4_ = fVar275 * auVar238._0_4_ + auVar17._0_4_ * fVar387;
            auVar345._4_4_ = fVar276 * auVar238._4_4_ + auVar17._4_4_ * fVar273;
            auVar345._8_4_ = fVar223 * auVar238._8_4_ + auVar17._8_4_ * fVar399;
            auVar345._12_4_ = fVar277 * auVar238._12_4_ + auVar17._12_4_ * fVar274;
            auVar17 = vshufps_avx(auVar114,auVar114,0xe8);
            auVar183 = vshufps_avx(auVar345,auVar345,0xe8);
            auVar115 = vcmpps_avx(auVar17,auVar183,1);
            uVar85 = vextractps_avx(auVar115,0);
            auVar147 = auVar345;
            if ((uVar85 & 1) == 0) {
              auVar147 = auVar114;
            }
            auVar145._0_4_ = auVar146._0_4_ * auVar129._16_4_ * 3.0;
            auVar145._4_4_ = auVar146._4_4_ * auVar129._20_4_ * 3.0;
            auVar145._8_4_ = auVar146._8_4_ * auVar129._24_4_ * 3.0;
            auVar145._12_4_ = auVar146._12_4_ * 0.0;
            auVar317 = vsubps_avx(auVar224,auVar145);
            auVar146 = vmovshdup_avx(auVar317);
            auVar224 = vmovshdup_avx(auVar224);
            fVar285 = auVar317._0_4_;
            fVar286 = auVar317._4_4_;
            auVar262._0_4_ = fVar285 * fVar275 + auVar146._0_4_ * fVar387;
            auVar262._4_4_ = fVar286 * fVar276 + auVar146._4_4_ * fVar273;
            auVar262._8_4_ = auVar317._8_4_ * fVar223 + auVar146._8_4_ * fVar399;
            auVar262._12_4_ = auVar317._12_4_ * fVar277 + auVar146._12_4_ * fVar274;
            auVar403._0_4_ = fVar275 * auVar284._16_4_ + auVar224._0_4_ * fVar387;
            auVar403._4_4_ = fVar276 * auVar284._20_4_ + auVar224._4_4_ * fVar273;
            auVar403._8_4_ = fVar223 * auVar284._24_4_ + auVar224._8_4_ * fVar399;
            auVar403._12_4_ = fVar277 * auVar284._28_4_ + auVar224._12_4_ * fVar274;
            auVar224 = vshufps_avx(auVar262,auVar262,0xe8);
            auVar256 = vshufps_avx(auVar403,auVar403,0xe8);
            auVar146 = vcmpps_avx(auVar224,auVar256,1);
            uVar85 = vextractps_avx(auVar146,0);
            auVar343 = auVar403;
            if ((uVar85 & 1) == 0) {
              auVar343 = auVar262;
            }
            auVar147 = vmaxss_avx(auVar343,auVar147);
            auVar17 = vminps_avx(auVar17,auVar183);
            auVar183 = vminps_avx(auVar224,auVar256);
            auVar183 = vminps_avx(auVar17,auVar183);
            auVar115 = vshufps_avx(auVar115,auVar115,0x55);
            auVar115 = vblendps_avx(auVar115,auVar146,2);
            auVar146 = vpslld_avx(auVar115,0x1f);
            auVar115 = vshufpd_avx(auVar345,auVar345,1);
            auVar115 = vinsertps_avx(auVar115,auVar403,0x9c);
            auVar17 = vshufpd_avx(auVar114,auVar114,1);
            auVar17 = vinsertps_avx(auVar17,auVar262,0x9c);
            auVar115 = vblendvps_avx(auVar17,auVar115,auVar146);
            auVar17 = vmovshdup_avx(auVar115);
            auVar115 = vmaxss_avx(auVar17,auVar115);
            fVar399 = auVar183._0_4_;
            auVar17 = vmovshdup_avx(auVar183);
            fVar273 = auVar115._0_4_;
            fVar274 = auVar17._0_4_;
            fVar387 = auVar147._0_4_;
            if ((fVar399 < 0.0001) && (-0.0001 < fVar273)) break;
            if ((fVar274 < 0.0001 && -0.0001 < fVar387) || (fVar399 < 0.0001 && -0.0001 < fVar387))
            break;
            auVar146 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar115,1);
            auVar17 = vcmpps_avx(auVar17,SUB6416(ZEXT464(0x38d1b717),0),1);
            auVar17 = vandps_avx(auVar17,auVar146);
          } while ((auVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
          auVar146 = vcmpps_avx(auVar183,_DAT_01f45a50,1);
          auVar17 = vcmpss_avx(auVar147,ZEXT416(0) << 0x20,1);
          auVar182._8_4_ = 0x3f800000;
          auVar182._0_8_ = 0x3f8000003f800000;
          auVar182._12_4_ = 0x3f800000;
          auVar239._8_4_ = 0xbf800000;
          auVar239._0_8_ = 0xbf800000bf800000;
          auVar239._12_4_ = 0xbf800000;
          auVar17 = vblendvps_avx(auVar182,auVar239,auVar17);
          auVar146 = vblendvps_avx(auVar182,auVar239,auVar146);
          auVar183 = vcmpss_avx(auVar146,auVar17,4);
          auVar183 = vpshufd_avx(ZEXT416(auVar183._0_4_ & 1),0x50);
          auVar183 = vpslld_avx(auVar183,0x1f);
          auVar183 = vpsrad_avx(auVar183,0x1f);
          auVar183 = vpandn_avx(auVar183,_DAT_01f7afb0);
          auVar147 = vmovshdup_avx(auVar146);
          fVar275 = auVar147._0_4_;
          if ((auVar146._0_4_ != fVar275) || (NAN(auVar146._0_4_) || NAN(fVar275))) {
            if ((fVar274 != fVar399) || (NAN(fVar274) || NAN(fVar399))) {
              fVar399 = -fVar399 / (fVar274 - fVar399);
              auVar146 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar399) * 0.0 + fVar399)));
            }
            else {
              auVar146 = ZEXT816(0x3f80000000000000);
              if ((fVar399 != 0.0) || (NAN(fVar399))) {
                auVar146 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar224 = vcmpps_avx(auVar183,auVar146,1);
            auVar147 = vblendps_avx(auVar183,auVar146,2);
            auVar146 = vblendps_avx(auVar146,auVar183,2);
            auVar183 = vblendvps_avx(auVar146,auVar147,auVar224);
          }
          auVar115 = vcmpss_avx(auVar115,ZEXT416(0) << 0x20,1);
          auVar184._8_4_ = 0x3f800000;
          auVar184._0_8_ = 0x3f8000003f800000;
          auVar184._12_4_ = 0x3f800000;
          auVar240._8_4_ = 0xbf800000;
          auVar240._0_8_ = 0xbf800000bf800000;
          auVar240._12_4_ = 0xbf800000;
          auVar115 = vblendvps_avx(auVar184,auVar240,auVar115);
          fVar399 = auVar115._0_4_;
          if ((auVar17._0_4_ != fVar399) || (NAN(auVar17._0_4_) || NAN(fVar399))) {
            if ((fVar273 != fVar387) || (NAN(fVar273) || NAN(fVar387))) {
              fVar387 = -fVar387 / (fVar273 - fVar387);
              auVar115 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar387) * 0.0 + fVar387)));
            }
            else {
              auVar115 = ZEXT816(0x3f80000000000000);
              if ((fVar387 != 0.0) || (NAN(fVar387))) {
                auVar115 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar146 = vcmpps_avx(auVar183,auVar115,1);
            auVar17 = vblendps_avx(auVar183,auVar115,2);
            auVar115 = vblendps_avx(auVar115,auVar183,2);
            auVar183 = vblendvps_avx(auVar115,auVar17,auVar146);
          }
          if ((fVar275 != fVar399) || (NAN(fVar275) || NAN(fVar399))) {
            auVar116._8_4_ = 0x3f800000;
            auVar116._0_8_ = 0x3f8000003f800000;
            auVar116._12_4_ = 0x3f800000;
            auVar115 = vcmpps_avx(auVar183,auVar116,1);
            auVar17 = vinsertps_avx(auVar183,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar185._4_12_ = auVar183._4_12_;
            auVar185._0_4_ = 0x3f800000;
            auVar183 = vblendvps_avx(auVar185,auVar17,auVar115);
          }
          auVar115 = vcmpps_avx(auVar183,_DAT_01f46740,1);
          auVar83._12_4_ = 0;
          auVar83._0_12_ = auVar183._4_12_;
          auVar17 = vinsertps_avx(auVar183,ZEXT416(0x3f800000),0x10);
          auVar115 = vblendvps_avx(auVar17,auVar83 << 0x20,auVar115);
          auVar17 = vmovshdup_avx(auVar115);
        } while (auVar17._0_4_ < auVar115._0_4_);
        auVar117._0_4_ = auVar115._0_4_ + -0.1;
        auVar117._4_4_ = auVar115._4_4_ + 0.1;
        auVar117._8_4_ = auVar115._8_4_ + 0.0;
        auVar117._12_4_ = auVar115._12_4_ + 0.0;
        auVar146 = vshufpd_avx(auVar238,auVar238,3);
        auVar282._8_8_ = 0x3f80000000000000;
        auVar282._0_8_ = 0x3f80000000000000;
        auVar115 = vcmpps_avx(auVar117,auVar282,1);
        auVar82._12_4_ = 0;
        auVar82._0_12_ = auVar117._4_12_;
        auVar17 = vinsertps_avx(auVar117,SUB6416(ZEXT464(0x3f800000),0),0x10);
        auVar115 = vblendvps_avx(auVar17,auVar82 << 0x20,auVar115);
        auVar17 = vshufpd_avx(auVar317,auVar317,3);
        auVar183 = vshufps_avx(auVar115,auVar115,0x50);
        auVar393._8_4_ = 0x3f800000;
        auVar393._0_8_ = 0x3f8000003f800000;
        auVar393._12_4_ = 0x3f800000;
        auVar147 = vsubps_avx(auVar393,auVar183);
        local_4a8 = auVar197._0_4_;
        fStack_4a4 = auVar197._4_4_;
        fStack_4a0 = auVar197._8_4_;
        fStack_49c = auVar197._12_4_;
        fVar387 = auVar183._0_4_;
        fVar273 = auVar183._4_4_;
        fVar399 = auVar183._8_4_;
        fVar274 = auVar183._12_4_;
        local_5d8 = auVar96._0_4_;
        fStack_5d4 = auVar96._4_4_;
        fStack_5d0 = auVar96._8_4_;
        fStack_5cc = auVar96._12_4_;
        fVar275 = auVar147._0_4_;
        fVar276 = auVar147._4_4_;
        fVar223 = auVar147._8_4_;
        fVar277 = auVar147._12_4_;
        auVar118._0_4_ = fVar387 * local_4a8 + fVar275 * auVar281._0_4_;
        auVar118._4_4_ = fVar273 * fStack_4a4 + fVar276 * auVar281._4_4_;
        auVar118._8_4_ = fVar399 * fStack_4a0 + fVar223 * auVar281._0_4_;
        auVar118._12_4_ = fVar274 * fStack_49c + fVar277 * auVar281._4_4_;
        auVar263._0_4_ = auVar146._0_4_ * fVar387 + fVar275 * auVar238._0_4_;
        auVar263._4_4_ = auVar146._4_4_ * fVar273 + fVar276 * auVar238._4_4_;
        auVar263._8_4_ = auVar146._8_4_ * fVar399 + fVar223 * auVar238._0_4_;
        auVar263._12_4_ = auVar146._12_4_ * fVar274 + fVar277 * auVar238._4_4_;
        auVar297._0_4_ = auVar17._0_4_ * fVar387 + fVar275 * fVar285;
        auVar297._4_4_ = auVar17._4_4_ * fVar273 + fVar276 * fVar286;
        auVar297._8_4_ = auVar17._8_4_ * fVar399 + fVar223 * fVar285;
        auVar297._12_4_ = auVar17._12_4_ * fVar274 + fVar277 * fVar286;
        auVar332._0_4_ = fVar387 * local_5d8 + fVar275 * auVar284._16_4_;
        auVar332._4_4_ = fVar273 * fStack_5d4 + fVar276 * auVar284._20_4_;
        auVar332._8_4_ = fVar399 * fStack_5d0 + fVar223 * auVar284._16_4_;
        auVar332._12_4_ = fVar274 * fStack_5cc + fVar277 * auVar284._20_4_;
        auVar96 = vsubps_avx(auVar393,auVar115);
        auVar17 = vmovshdup_avx(auVar344);
        auVar197 = vmovsldup_avx(auVar344);
        auVar404._0_4_ = auVar96._0_4_ * auVar197._0_4_ + auVar115._0_4_ * auVar17._0_4_;
        auVar404._4_4_ = auVar96._4_4_ * auVar197._4_4_ + auVar115._4_4_ * auVar17._4_4_;
        auVar404._8_4_ = auVar96._8_4_ * auVar197._8_4_ + auVar115._8_4_ * auVar17._8_4_;
        auVar404._12_4_ = auVar96._12_4_ * auVar197._12_4_ + auVar115._12_4_ * auVar17._12_4_;
        auVar317 = vmovshdup_avx(auVar404);
        auVar115 = vsubps_avx(auVar263,auVar118);
        auVar186._0_4_ = auVar115._0_4_ * 3.0;
        auVar186._4_4_ = auVar115._4_4_ * 3.0;
        auVar186._8_4_ = auVar115._8_4_ * 3.0;
        auVar186._12_4_ = auVar115._12_4_ * 3.0;
        auVar115 = vsubps_avx(auVar297,auVar263);
        auVar215._0_4_ = auVar115._0_4_ * 3.0;
        auVar215._4_4_ = auVar115._4_4_ * 3.0;
        auVar215._8_4_ = auVar115._8_4_ * 3.0;
        auVar215._12_4_ = auVar115._12_4_ * 3.0;
        auVar115 = vsubps_avx(auVar332,auVar297);
        auVar310._0_4_ = auVar115._0_4_ * 3.0;
        auVar310._4_4_ = auVar115._4_4_ * 3.0;
        auVar310._8_4_ = auVar115._8_4_ * 3.0;
        auVar310._12_4_ = auVar115._12_4_ * 3.0;
        auVar17 = vminps_avx(auVar215,auVar310);
        auVar115 = vmaxps_avx(auVar215,auVar310);
        auVar17 = vminps_avx(auVar186,auVar17);
        auVar115 = vmaxps_avx(auVar186,auVar115);
        auVar197 = vshufpd_avx(auVar17,auVar17,3);
        auVar96 = vshufpd_avx(auVar115,auVar115,3);
        auVar17 = vminps_avx(auVar17,auVar197);
        auVar115 = vmaxps_avx(auVar115,auVar96);
        auVar197 = vshufps_avx(ZEXT416((uint)(1.0 / fVar206)),ZEXT416((uint)(1.0 / fVar206)),0);
        auVar311._0_4_ = auVar197._0_4_ * auVar17._0_4_;
        auVar311._4_4_ = auVar197._4_4_ * auVar17._4_4_;
        auVar311._8_4_ = auVar197._8_4_ * auVar17._8_4_;
        auVar311._12_4_ = auVar197._12_4_ * auVar17._12_4_;
        auVar319._0_4_ = auVar197._0_4_ * auVar115._0_4_;
        auVar319._4_4_ = auVar197._4_4_ * auVar115._4_4_;
        auVar319._8_4_ = auVar197._8_4_ * auVar115._8_4_;
        auVar319._12_4_ = auVar197._12_4_ * auVar115._12_4_;
        auVar147 = ZEXT416((uint)(1.0 / (auVar317._0_4_ - auVar404._0_4_)));
        auVar115 = vshufpd_avx(auVar118,auVar118,3);
        auVar17 = vshufpd_avx(auVar263,auVar263,3);
        auVar197 = vshufpd_avx(auVar297,auVar297,3);
        auVar96 = vshufpd_avx(auVar332,auVar332,3);
        auVar115 = vsubps_avx(auVar115,auVar118);
        auVar146 = vsubps_avx(auVar17,auVar263);
        auVar183 = vsubps_avx(auVar197,auVar297);
        auVar96 = vsubps_avx(auVar96,auVar332);
        auVar17 = vminps_avx(auVar115,auVar146);
        auVar115 = vmaxps_avx(auVar115,auVar146);
        auVar197 = vminps_avx(auVar183,auVar96);
        auVar197 = vminps_avx(auVar17,auVar197);
        auVar17 = vmaxps_avx(auVar183,auVar96);
        auVar115 = vmaxps_avx(auVar115,auVar17);
        auVar17 = vshufps_avx(auVar147,auVar147,0);
        auVar378._0_4_ = auVar17._0_4_ * auVar197._0_4_;
        auVar378._4_4_ = auVar17._4_4_ * auVar197._4_4_;
        auVar378._8_4_ = auVar17._8_4_ * auVar197._8_4_;
        auVar378._12_4_ = auVar17._12_4_ * auVar197._12_4_;
        auVar394._0_4_ = auVar17._0_4_ * auVar115._0_4_;
        auVar394._4_4_ = auVar17._4_4_ * auVar115._4_4_;
        auVar394._8_4_ = auVar17._8_4_ * auVar115._8_4_;
        auVar394._12_4_ = auVar17._12_4_ * auVar115._12_4_;
        auVar115 = vmovsldup_avx(auVar404);
        auVar333._4_12_ = auVar115._4_12_;
        auVar333._0_4_ = fVar272;
        auVar346._4_12_ = auVar404._4_12_;
        auVar346._0_4_ = fVar271;
        auVar216._0_4_ = (fVar272 + fVar271) * 0.5;
        auVar216._4_4_ = (auVar115._4_4_ + auVar404._4_4_) * 0.5;
        auVar216._8_4_ = (auVar115._8_4_ + auVar404._8_4_) * 0.5;
        auVar216._12_4_ = (auVar115._12_4_ + auVar404._12_4_) * 0.5;
        auVar115 = vshufps_avx(auVar216,auVar216,0);
        local_258 = auVar108._0_4_;
        fStack_254 = auVar108._4_4_;
        fStack_250 = auVar108._8_4_;
        fStack_24c = auVar108._12_4_;
        fVar387 = auVar115._0_4_;
        fVar273 = auVar115._4_4_;
        fVar399 = auVar115._8_4_;
        fVar274 = auVar115._12_4_;
        p00.field_0.i[0] = auVar106._0_4_;
        p00.field_0.i[1] = auVar106._4_4_;
        p00.field_0.i[2] = auVar106._8_4_;
        p00.field_0.i[3] = auVar106._12_4_;
        auVar148._0_4_ = fVar387 * local_258 + p00.field_0.v[0];
        auVar148._4_4_ = fVar273 * fStack_254 + p00.field_0.v[1];
        auVar148._8_4_ = fVar399 * fStack_250 + p00.field_0.v[2];
        auVar148._12_4_ = fVar274 * fStack_24c + p00.field_0.v[3];
        local_268 = auVar11._0_4_;
        fStack_264 = auVar11._4_4_;
        fStack_260 = auVar11._8_4_;
        fStack_25c = auVar11._12_4_;
        p01.field_0.i[0] = auVar34._0_4_;
        p01.field_0.i[1] = auVar34._4_4_;
        p01.field_0.i[2] = auVar34._8_4_;
        p01.field_0.i[3] = auVar34._12_4_;
        auVar187._0_4_ = fVar387 * local_268 + p01.field_0.v[0];
        auVar187._4_4_ = fVar273 * fStack_264 + p01.field_0.v[1];
        auVar187._8_4_ = fVar399 * fStack_260 + p01.field_0.v[2];
        auVar187._12_4_ = fVar274 * fStack_25c + p01.field_0.v[3];
        local_278 = auVar12._0_4_;
        fStack_274 = auVar12._4_4_;
        fStack_270 = auVar12._8_4_;
        fStack_26c = auVar12._12_4_;
        p02.field_0.i[0] = auVar229._0_4_;
        p02.field_0.i[1] = auVar229._4_4_;
        p02.field_0.i[2] = auVar229._8_4_;
        p02.field_0.i[3] = auVar229._12_4_;
        auVar264._0_4_ = fVar387 * local_278 + p02.field_0.v[0];
        auVar264._4_4_ = fVar273 * fStack_274 + p02.field_0.v[1];
        auVar264._8_4_ = fVar399 * fStack_270 + p02.field_0.v[2];
        auVar264._12_4_ = fVar274 * fStack_26c + p02.field_0.v[3];
        auVar115 = vsubps_avx(auVar187,auVar148);
        auVar149._0_4_ = auVar148._0_4_ + fVar387 * auVar115._0_4_;
        auVar149._4_4_ = auVar148._4_4_ + fVar273 * auVar115._4_4_;
        auVar149._8_4_ = auVar148._8_4_ + fVar399 * auVar115._8_4_;
        auVar149._12_4_ = auVar148._12_4_ + fVar274 * auVar115._12_4_;
        auVar115 = vsubps_avx(auVar264,auVar187);
        auVar188._0_4_ = auVar187._0_4_ + fVar387 * auVar115._0_4_;
        auVar188._4_4_ = auVar187._4_4_ + fVar273 * auVar115._4_4_;
        auVar188._8_4_ = auVar187._8_4_ + fVar399 * auVar115._8_4_;
        auVar188._12_4_ = auVar187._12_4_ + fVar274 * auVar115._12_4_;
        auVar115 = vsubps_avx(auVar188,auVar149);
        fVar387 = auVar149._0_4_ + fVar387 * auVar115._0_4_;
        fVar273 = auVar149._4_4_ + fVar273 * auVar115._4_4_;
        auVar119._0_8_ = CONCAT44(fVar273,fVar387);
        auVar119._8_4_ = auVar149._8_4_ + fVar399 * auVar115._8_4_;
        auVar119._12_4_ = auVar149._12_4_ + fVar274 * auVar115._12_4_;
        fVar399 = auVar115._0_4_ * 3.0;
        fVar274 = auVar115._4_4_ * 3.0;
        auVar150._0_8_ = CONCAT44(fVar274,fVar399);
        auVar150._8_4_ = auVar115._8_4_ * 3.0;
        auVar150._12_4_ = auVar115._12_4_ * 3.0;
        auVar189._8_8_ = auVar119._0_8_;
        auVar189._0_8_ = auVar119._0_8_;
        auVar115 = vshufpd_avx(auVar119,auVar119,3);
        auVar17 = vshufps_avx(auVar216,auVar216,0x55);
        auVar183 = vsubps_avx(auVar115,auVar189);
        auVar363._0_4_ = auVar183._0_4_ * auVar17._0_4_ + fVar387;
        auVar363._4_4_ = auVar183._4_4_ * auVar17._4_4_ + fVar273;
        auVar363._8_4_ = auVar183._8_4_ * auVar17._8_4_ + fVar387;
        auVar363._12_4_ = auVar183._12_4_ * auVar17._12_4_ + fVar273;
        auVar190._8_8_ = auVar150._0_8_;
        auVar190._0_8_ = auVar150._0_8_;
        auVar115 = vshufpd_avx(auVar150,auVar150,1);
        auVar115 = vsubps_avx(auVar115,auVar190);
        auVar151._0_4_ = auVar115._0_4_ * auVar17._0_4_ + fVar399;
        auVar151._4_4_ = auVar115._4_4_ * auVar17._4_4_ + fVar274;
        auVar151._8_4_ = auVar115._8_4_ * auVar17._8_4_ + fVar399;
        auVar151._12_4_ = auVar115._12_4_ * auVar17._12_4_ + fVar274;
        auVar17 = vmovshdup_avx(auVar151);
        auVar265._0_8_ = auVar17._0_8_ ^ 0x8000000080000000;
        auVar265._8_4_ = auVar17._8_4_ ^ 0x80000000;
        auVar265._12_4_ = auVar17._12_4_ ^ 0x80000000;
        auVar197 = vmovshdup_avx(auVar183);
        auVar115 = vunpcklps_avx(auVar197,auVar265);
        auVar96 = vshufps_avx(auVar115,auVar265,4);
        auVar120._0_8_ = auVar183._0_8_ ^ 0x8000000080000000;
        auVar120._8_4_ = -auVar183._8_4_;
        auVar120._12_4_ = -auVar183._12_4_;
        auVar115 = vmovlhps_avx(auVar120,auVar151);
        auVar146 = vshufps_avx(auVar115,auVar151,8);
        auVar115 = ZEXT416((uint)(auVar151._0_4_ * auVar197._0_4_ - auVar183._0_4_ * auVar17._0_4_))
        ;
        auVar17 = vshufps_avx(auVar115,auVar115,0);
        auVar115 = vdivps_avx(auVar96,auVar17);
        auVar17 = vdivps_avx(auVar146,auVar17);
        auVar146 = vinsertps_avx(auVar311,auVar378,0x1c);
        auVar183 = vinsertps_avx(auVar319,auVar394,0x1c);
        auVar147 = vinsertps_avx(auVar378,auVar311,0x4c);
        auVar224 = vinsertps_avx(auVar394,auVar319,0x4c);
        auVar197 = vmovsldup_avx(auVar115);
        auVar191._0_4_ = auVar197._0_4_ * auVar146._0_4_;
        auVar191._4_4_ = auVar197._4_4_ * auVar146._4_4_;
        auVar191._8_4_ = auVar197._8_4_ * auVar146._8_4_;
        auVar191._12_4_ = auVar197._12_4_ * auVar146._12_4_;
        auVar152._0_4_ = auVar183._0_4_ * auVar197._0_4_;
        auVar152._4_4_ = auVar183._4_4_ * auVar197._4_4_;
        auVar152._8_4_ = auVar183._8_4_ * auVar197._8_4_;
        auVar152._12_4_ = auVar183._12_4_ * auVar197._12_4_;
        auVar96 = vminps_avx(auVar191,auVar152);
        auVar197 = vmaxps_avx(auVar152,auVar191);
        auVar256 = vmovsldup_avx(auVar17);
        auVar395._0_4_ = auVar147._0_4_ * auVar256._0_4_;
        auVar395._4_4_ = auVar147._4_4_ * auVar256._4_4_;
        auVar395._8_4_ = auVar147._8_4_ * auVar256._8_4_;
        auVar395._12_4_ = auVar147._12_4_ * auVar256._12_4_;
        auVar192._0_4_ = auVar224._0_4_ * auVar256._0_4_;
        auVar192._4_4_ = auVar224._4_4_ * auVar256._4_4_;
        auVar192._8_4_ = auVar224._8_4_ * auVar256._8_4_;
        auVar192._12_4_ = auVar224._12_4_ * auVar256._12_4_;
        auVar256 = vminps_avx(auVar395,auVar192);
        auVar241._0_4_ = auVar96._0_4_ + auVar256._0_4_;
        auVar241._4_4_ = auVar96._4_4_ + auVar256._4_4_;
        auVar241._8_4_ = auVar96._8_4_ + auVar256._8_4_;
        auVar241._12_4_ = auVar96._12_4_ + auVar256._12_4_;
        auVar96 = vmaxps_avx(auVar192,auVar395);
        auVar256 = vsubps_avx(auVar333,auVar216);
        auVar343 = vsubps_avx(auVar346,auVar216);
        auVar153._0_4_ = auVar197._0_4_ + auVar96._0_4_;
        auVar153._4_4_ = auVar197._4_4_ + auVar96._4_4_;
        auVar153._8_4_ = auVar197._8_4_ + auVar96._8_4_;
        auVar153._12_4_ = auVar197._12_4_ + auVar96._12_4_;
        auVar193._8_8_ = 0x3f800000;
        auVar193._0_8_ = 0x3f800000;
        auVar197 = vsubps_avx(auVar193,auVar153);
        auVar96 = vsubps_avx(auVar193,auVar241);
        fVar223 = auVar256._0_4_;
        auVar242._0_4_ = fVar223 * auVar197._0_4_;
        fVar277 = auVar256._4_4_;
        auVar242._4_4_ = fVar277 * auVar197._4_4_;
        fVar285 = auVar256._8_4_;
        auVar242._8_4_ = fVar285 * auVar197._8_4_;
        fVar286 = auVar256._12_4_;
        auVar242._12_4_ = fVar286 * auVar197._12_4_;
        fVar399 = auVar343._0_4_;
        auVar154._0_4_ = fVar399 * auVar197._0_4_;
        fVar274 = auVar343._4_4_;
        auVar154._4_4_ = fVar274 * auVar197._4_4_;
        fVar275 = auVar343._8_4_;
        auVar154._8_4_ = fVar275 * auVar197._8_4_;
        fVar276 = auVar343._12_4_;
        auVar154._12_4_ = fVar276 * auVar197._12_4_;
        auVar334._0_4_ = fVar223 * auVar96._0_4_;
        auVar334._4_4_ = fVar277 * auVar96._4_4_;
        auVar334._8_4_ = fVar285 * auVar96._8_4_;
        auVar334._12_4_ = fVar286 * auVar96._12_4_;
        auVar194._0_4_ = fVar399 * auVar96._0_4_;
        auVar194._4_4_ = fVar274 * auVar96._4_4_;
        auVar194._8_4_ = fVar275 * auVar96._8_4_;
        auVar194._12_4_ = fVar276 * auVar96._12_4_;
        auVar197 = vminps_avx(auVar242,auVar334);
        auVar96 = vminps_avx(auVar154,auVar194);
        auVar256 = vminps_avx(auVar197,auVar96);
        auVar197 = vmaxps_avx(auVar334,auVar242);
        auVar96 = vmaxps_avx(auVar194,auVar154);
        auVar343 = vshufps_avx(auVar216,auVar216,0x54);
        auVar96 = vmaxps_avx(auVar96,auVar197);
        auVar402 = vshufps_avx(auVar363,auVar363,0);
        auVar43 = vshufps_avx(auVar363,auVar363,0x55);
        auVar197 = vhaddps_avx(auVar256,auVar256);
        auVar96 = vhaddps_avx(auVar96,auVar96);
        auVar217._0_4_ = auVar402._0_4_ * auVar115._0_4_ + auVar43._0_4_ * auVar17._0_4_;
        auVar217._4_4_ = auVar402._4_4_ * auVar115._4_4_ + auVar43._4_4_ * auVar17._4_4_;
        auVar217._8_4_ = auVar402._8_4_ * auVar115._8_4_ + auVar43._8_4_ * auVar17._8_4_;
        auVar217._12_4_ = auVar402._12_4_ * auVar115._12_4_ + auVar43._12_4_ * auVar17._12_4_;
        auVar256 = vsubps_avx(auVar343,auVar217);
        fVar387 = auVar256._0_4_ + auVar197._0_4_;
        fVar273 = auVar256._0_4_ + auVar96._0_4_;
        auVar197 = vmaxss_avx(ZEXT416((uint)fVar272),ZEXT416((uint)fVar387));
        auVar96 = vminss_avx(ZEXT416((uint)fVar273),ZEXT416((uint)fVar271));
      } while (auVar96._0_4_ < auVar197._0_4_);
      auVar197 = vmovshdup_avx(auVar115);
      auVar121._0_4_ = auVar197._0_4_ * auVar146._0_4_;
      auVar121._4_4_ = auVar197._4_4_ * auVar146._4_4_;
      auVar121._8_4_ = auVar197._8_4_ * auVar146._8_4_;
      auVar121._12_4_ = auVar197._12_4_ * auVar146._12_4_;
      auVar155._0_4_ = auVar183._0_4_ * auVar197._0_4_;
      auVar155._4_4_ = auVar183._4_4_ * auVar197._4_4_;
      auVar155._8_4_ = auVar183._8_4_ * auVar197._8_4_;
      auVar155._12_4_ = auVar183._12_4_ * auVar197._12_4_;
      auVar96 = vminps_avx(auVar121,auVar155);
      auVar197 = vmaxps_avx(auVar155,auVar121);
      auVar146 = vmovshdup_avx(auVar17);
      auVar243._0_4_ = auVar147._0_4_ * auVar146._0_4_;
      auVar243._4_4_ = auVar147._4_4_ * auVar146._4_4_;
      auVar243._8_4_ = auVar147._8_4_ * auVar146._8_4_;
      auVar243._12_4_ = auVar147._12_4_ * auVar146._12_4_;
      auVar156._0_4_ = auVar224._0_4_ * auVar146._0_4_;
      auVar156._4_4_ = auVar224._4_4_ * auVar146._4_4_;
      auVar156._8_4_ = auVar224._8_4_ * auVar146._8_4_;
      auVar156._12_4_ = auVar224._12_4_ * auVar146._12_4_;
      auVar146 = vminps_avx(auVar243,auVar156);
      auVar195._0_4_ = auVar96._0_4_ + auVar146._0_4_;
      auVar195._4_4_ = auVar96._4_4_ + auVar146._4_4_;
      auVar195._8_4_ = auVar96._8_4_ + auVar146._8_4_;
      auVar195._12_4_ = auVar96._12_4_ + auVar146._12_4_;
      auVar96 = vmaxps_avx(auVar156,auVar243);
      auVar122._0_4_ = auVar197._0_4_ + auVar96._0_4_;
      auVar122._4_4_ = auVar197._4_4_ + auVar96._4_4_;
      auVar122._8_4_ = auVar197._8_4_ + auVar96._8_4_;
      auVar122._12_4_ = auVar197._12_4_ + auVar96._12_4_;
      auVar197 = vsubps_avx(auVar282,auVar122);
      auVar96 = vsubps_avx(auVar282,auVar195);
      auVar196._0_4_ = fVar223 * auVar197._0_4_;
      auVar196._4_4_ = fVar277 * auVar197._4_4_;
      auVar196._8_4_ = fVar285 * auVar197._8_4_;
      auVar196._12_4_ = fVar286 * auVar197._12_4_;
      auVar244._0_4_ = fVar223 * auVar96._0_4_;
      auVar244._4_4_ = fVar277 * auVar96._4_4_;
      auVar244._8_4_ = fVar285 * auVar96._8_4_;
      auVar244._12_4_ = fVar286 * auVar96._12_4_;
      auVar123._0_4_ = fVar399 * auVar197._0_4_;
      auVar123._4_4_ = fVar274 * auVar197._4_4_;
      auVar123._8_4_ = fVar275 * auVar197._8_4_;
      auVar123._12_4_ = fVar276 * auVar197._12_4_;
      auVar157._0_4_ = fVar399 * auVar96._0_4_;
      auVar157._4_4_ = fVar274 * auVar96._4_4_;
      auVar157._8_4_ = fVar275 * auVar96._8_4_;
      auVar157._12_4_ = fVar276 * auVar96._12_4_;
      auVar197 = vminps_avx(auVar196,auVar244);
      auVar96 = vminps_avx(auVar123,auVar157);
      auVar197 = vminps_avx(auVar197,auVar96);
      auVar96 = vmaxps_avx(auVar244,auVar196);
      auVar146 = vmaxps_avx(auVar157,auVar123);
      auVar197 = vhaddps_avx(auVar197,auVar197);
      auVar96 = vmaxps_avx(auVar146,auVar96);
      auVar96 = vhaddps_avx(auVar96,auVar96);
      auVar146 = vmovshdup_avx(auVar256);
      auVar183 = ZEXT416((uint)(auVar146._0_4_ + auVar197._0_4_));
      auVar197 = vmaxss_avx(auVar404,auVar183);
      auVar146 = ZEXT416((uint)(auVar146._0_4_ + auVar96._0_4_));
      auVar96 = vminss_avx(auVar146,auVar317);
    } while (auVar96._0_4_ < auVar197._0_4_);
    bVar91 = 0;
    if ((fVar272 < fVar387) && (fVar273 < fVar271)) {
      auVar197 = vcmpps_avx(auVar146,auVar317,1);
      auVar96 = vcmpps_avx(auVar404,auVar183,1);
      auVar197 = vandps_avx(auVar96,auVar197);
      bVar91 = auVar197[0];
    }
    auVar320._8_4_ = 0x7fffffff;
    auVar320._0_8_ = 0x7fffffff7fffffff;
    auVar320._12_4_ = 0x7fffffff;
    p03.field_0.i[0] = auVar35._0_4_;
    p03.field_0.i[1] = auVar35._4_4_;
    p03.field_0.i[2] = auVar35._8_4_;
    p03.field_0.i[3] = auVar35._12_4_;
    if ((3 < (uint)uVar90 || fVar206 < 0.001) || (bVar91 & 1) != 0) {
      lVar89 = 0xc9;
      do {
        lVar89 = lVar89 + -1;
        if (lVar89 == 0) goto LAB_00ac1d86;
        fVar206 = auVar256._0_4_;
        fVar271 = 1.0 - fVar206;
        auVar197 = ZEXT416((uint)(fVar271 * fVar271 * fVar271));
        auVar197 = vshufps_avx(auVar197,auVar197,0);
        auVar96 = ZEXT416((uint)(fVar206 * 3.0 * fVar271 * fVar271));
        auVar96 = vshufps_avx(auVar96,auVar96,0);
        auVar146 = ZEXT416((uint)(fVar271 * fVar206 * fVar206 * 3.0));
        auVar146 = vshufps_avx(auVar146,auVar146,0);
        auVar183 = ZEXT416((uint)(fVar206 * fVar206 * fVar206));
        auVar183 = vshufps_avx(auVar183,auVar183,0);
        fVar271 = p00.field_0.v[0] * auVar197._0_4_ +
                  p01.field_0.v[0] * auVar96._0_4_ +
                  p03.field_0.v[0] * auVar183._0_4_ + p02.field_0.v[0] * auVar146._0_4_;
        fVar206 = p00.field_0.v[1] * auVar197._4_4_ +
                  p01.field_0.v[1] * auVar96._4_4_ +
                  p03.field_0.v[1] * auVar183._4_4_ + p02.field_0.v[1] * auVar146._4_4_;
        auVar124._0_8_ = CONCAT44(fVar206,fVar271);
        auVar124._8_4_ =
             p00.field_0.v[2] * auVar197._8_4_ +
             p01.field_0.v[2] * auVar96._8_4_ +
             p03.field_0.v[2] * auVar183._8_4_ + p02.field_0.v[2] * auVar146._8_4_;
        auVar124._12_4_ =
             p00.field_0.v[3] * auVar197._12_4_ +
             p01.field_0.v[3] * auVar96._12_4_ +
             p03.field_0.v[3] * auVar183._12_4_ + p02.field_0.v[3] * auVar146._12_4_;
        auVar158._8_8_ = auVar124._0_8_;
        auVar158._0_8_ = auVar124._0_8_;
        auVar96 = vshufpd_avx(auVar124,auVar124,1);
        auVar197 = vmovshdup_avx(auVar256);
        auVar96 = vsubps_avx(auVar96,auVar158);
        auVar125._0_4_ = auVar197._0_4_ * auVar96._0_4_ + fVar271;
        auVar125._4_4_ = auVar197._4_4_ * auVar96._4_4_ + fVar206;
        auVar125._8_4_ = auVar197._8_4_ * auVar96._8_4_ + fVar271;
        auVar125._12_4_ = auVar197._12_4_ * auVar96._12_4_ + fVar206;
        auVar197 = vshufps_avx(auVar125,auVar125,0);
        auVar96 = vshufps_avx(auVar125,auVar125,0x55);
        auVar159._0_4_ = auVar115._0_4_ * auVar197._0_4_ + auVar17._0_4_ * auVar96._0_4_;
        auVar159._4_4_ = auVar115._4_4_ * auVar197._4_4_ + auVar17._4_4_ * auVar96._4_4_;
        auVar159._8_4_ = auVar115._8_4_ * auVar197._8_4_ + auVar17._8_4_ * auVar96._8_4_;
        auVar159._12_4_ = auVar115._12_4_ * auVar197._12_4_ + auVar17._12_4_ * auVar96._12_4_;
        auVar256 = vsubps_avx(auVar256,auVar159);
        auVar197 = vandps_avx(auVar320,auVar125);
        auVar96 = vshufps_avx(auVar197,auVar197,0xf5);
        auVar197 = vmaxss_avx(auVar96,auVar197);
      } while (fVar170 <= auVar197._0_4_);
      fVar271 = auVar256._0_4_;
      if ((0.0 <= fVar271) && (fVar271 <= 1.0)) {
        auVar115 = vmovshdup_avx(auVar256);
        fVar206 = auVar115._0_4_;
        if ((0.0 <= fVar206) && (fVar206 <= 1.0)) {
          auVar115 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                   ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
          auVar224 = vinsertps_avx(auVar115,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28
                                  );
          auVar115 = vdpps_avx(auVar224,auVar36,0x7f);
          auVar17 = vdpps_avx(auVar224,auVar37,0x7f);
          auVar197 = vdpps_avx(auVar224,auVar40,0x7f);
          auVar96 = vdpps_avx(auVar224,auVar41,0x7f);
          auVar146 = vdpps_avx(auVar224,auVar42,0x7f);
          auVar183 = vdpps_avx(auVar224,auVar10,0x7f);
          fVar274 = 1.0 - fVar206;
          auVar147 = vdpps_avx(auVar224,auVar38,0x7f);
          auVar224 = vdpps_avx(auVar224,auVar39,0x7f);
          fVar275 = 1.0 - fVar271;
          fVar272 = auVar256._4_4_;
          fVar387 = auVar256._8_4_;
          fVar273 = auVar256._12_4_;
          fVar399 = fVar275 * fVar271 * fVar271 * 3.0;
          auVar266._0_4_ = fVar271 * fVar271 * fVar271;
          auVar266._4_4_ = fVar272 * fVar272 * fVar272;
          auVar266._8_4_ = fVar387 * fVar387 * fVar387;
          auVar266._12_4_ = fVar273 * fVar273 * fVar273;
          fVar272 = fVar271 * 3.0 * fVar275 * fVar275;
          fVar387 = fVar275 * fVar275 * fVar275;
          fVar271 = (fVar274 * auVar115._0_4_ + fVar206 * auVar197._0_4_) * fVar387 +
                    (fVar274 * auVar17._0_4_ + fVar206 * auVar96._0_4_) * fVar272 +
                    fVar399 * (fVar274 * auVar147._0_4_ + fVar206 * auVar146._0_4_) +
                    auVar266._0_4_ * (auVar183._0_4_ * fVar206 + fVar274 * auVar224._0_4_);
          if ((fVar255 <= fVar271) && (fVar206 = *(float *)(ray + k * 4 + 0x80), fVar271 <= fVar206)
             ) {
            pGVar19 = (context->scene->geometries).items[uVar86].ptr;
            if ((pGVar19->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              bVar95 = false;
            }
            else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                    (bVar95 = true, pGVar19->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              local_1e8 = vshufps_avx(auVar256,auVar256,0x55);
              auVar312._8_4_ = 0x3f800000;
              auVar312._0_8_ = 0x3f8000003f800000;
              auVar312._12_4_ = 0x3f800000;
              auVar115 = vsubps_avx(auVar312,local_1e8);
              fVar273 = local_1e8._0_4_;
              fVar274 = local_1e8._4_4_;
              fVar276 = local_1e8._8_4_;
              fVar223 = local_1e8._12_4_;
              fVar277 = auVar115._0_4_;
              fVar285 = auVar115._4_4_;
              fVar286 = auVar115._8_4_;
              fVar341 = auVar115._12_4_;
              auVar321._0_4_ = fVar273 * (float)local_438._0_4_ + fVar277 * (float)local_408._0_4_;
              auVar321._4_4_ = fVar274 * (float)local_438._4_4_ + fVar285 * (float)local_408._4_4_;
              auVar321._8_4_ = fVar276 * fStack_430 + fVar286 * fStack_400;
              auVar321._12_4_ = fVar223 * fStack_42c + fVar341 * fStack_3fc;
              auVar335._0_4_ = fVar273 * (float)local_448._0_4_ + fVar277 * fVar287;
              auVar335._4_4_ = fVar274 * (float)local_448._4_4_ + fVar285 * fVar288;
              auVar335._8_4_ = fVar276 * fStack_440 + fVar286 * fVar289;
              auVar335._12_4_ = fVar223 * fStack_43c + fVar341 * fVar290;
              auVar347._0_4_ = fVar273 * auVar401._0_4_ + fVar277 * (float)local_418._0_4_;
              auVar347._4_4_ = fVar274 * auVar401._4_4_ + fVar285 * (float)local_418._4_4_;
              auVar347._8_4_ = fVar276 * auVar401._8_4_ + fVar286 * fStack_410;
              auVar347._12_4_ = fVar223 * auVar401._12_4_ + fVar341 * fStack_40c;
              auVar313._0_4_ = fVar273 * fVar250 + fVar277 * (float)local_428._0_4_;
              auVar313._4_4_ = fVar274 * fVar251 + fVar285 * (float)local_428._4_4_;
              auVar313._8_4_ = fVar276 * fVar253 + fVar286 * fStack_420;
              auVar313._12_4_ = fVar223 * fVar254 + fVar341 * fStack_41c;
              auVar96 = vsubps_avx(auVar335,auVar321);
              auVar146 = vsubps_avx(auVar347,auVar335);
              auVar183 = vsubps_avx(auVar313,auVar347);
              local_1f8 = vshufps_avx(auVar256,auVar256,0);
              fVar273 = local_1f8._0_4_;
              fVar276 = local_1f8._4_4_;
              fVar223 = local_1f8._8_4_;
              fVar285 = local_1f8._12_4_;
              auVar115 = vshufps_avx(ZEXT416((uint)fVar275),ZEXT416((uint)fVar275),0);
              fVar274 = auVar115._0_4_;
              fVar275 = auVar115._4_4_;
              fVar277 = auVar115._8_4_;
              fVar286 = auVar115._12_4_;
              auVar115 = vshufps_avx(auVar266,auVar266,0);
              local_398 = auVar16._0_4_;
              fStack_394 = auVar16._4_4_;
              fStack_390 = auVar16._8_4_;
              fStack_38c = auVar16._12_4_;
              auVar17 = vshufps_avx(ZEXT416((uint)fVar399),ZEXT416((uint)fVar399),0);
              local_388 = auVar15._0_4_;
              fStack_384 = auVar15._4_4_;
              fStack_380 = auVar15._8_4_;
              fStack_37c = auVar15._12_4_;
              auVar197 = vshufps_avx(ZEXT416((uint)fVar272),ZEXT416((uint)fVar272),0);
              local_378 = auVar14._0_4_;
              fStack_374 = auVar14._4_4_;
              fStack_370 = auVar14._8_4_;
              fStack_36c = auVar14._12_4_;
              auVar245._0_4_ =
                   ((auVar146._0_4_ * fVar274 + auVar183._0_4_ * fVar273) * fVar273 +
                   (auVar96._0_4_ * fVar274 + auVar146._0_4_ * fVar273) * fVar274) * 3.0;
              auVar245._4_4_ =
                   ((auVar146._4_4_ * fVar275 + auVar183._4_4_ * fVar276) * fVar276 +
                   (auVar96._4_4_ * fVar275 + auVar146._4_4_ * fVar276) * fVar275) * 3.0;
              auVar245._8_4_ =
                   ((auVar146._8_4_ * fVar277 + auVar183._8_4_ * fVar223) * fVar223 +
                   (auVar96._8_4_ * fVar277 + auVar146._8_4_ * fVar223) * fVar277) * 3.0;
              auVar245._12_4_ =
                   ((auVar146._12_4_ * fVar286 + auVar183._12_4_ * fVar285) * fVar285 +
                   (auVar96._12_4_ * fVar286 + auVar146._12_4_ * fVar285) * fVar286) * 3.0;
              auVar96 = vshufps_avx(ZEXT416((uint)fVar387),ZEXT416((uint)fVar387),0);
              local_368 = auVar13._0_4_;
              fStack_364 = auVar13._4_4_;
              fStack_360 = auVar13._8_4_;
              fStack_35c = auVar13._12_4_;
              auVar160._0_4_ =
                   auVar96._0_4_ * local_368 +
                   auVar197._0_4_ * local_378 +
                   auVar115._0_4_ * local_398 + auVar17._0_4_ * local_388;
              auVar160._4_4_ =
                   auVar96._4_4_ * fStack_364 +
                   auVar197._4_4_ * fStack_374 +
                   auVar115._4_4_ * fStack_394 + auVar17._4_4_ * fStack_384;
              auVar160._8_4_ =
                   auVar96._8_4_ * fStack_360 +
                   auVar197._8_4_ * fStack_370 +
                   auVar115._8_4_ * fStack_390 + auVar17._8_4_ * fStack_380;
              auVar160._12_4_ =
                   auVar96._12_4_ * fStack_35c +
                   auVar197._12_4_ * fStack_36c +
                   auVar115._12_4_ * fStack_38c + auVar17._12_4_ * fStack_37c;
              auVar115 = vshufps_avx(auVar245,auVar245,0xc9);
              auVar198._0_4_ = auVar160._0_4_ * auVar115._0_4_;
              auVar198._4_4_ = auVar160._4_4_ * auVar115._4_4_;
              auVar198._8_4_ = auVar160._8_4_ * auVar115._8_4_;
              auVar198._12_4_ = auVar160._12_4_ * auVar115._12_4_;
              auVar115 = vshufps_avx(auVar160,auVar160,0xc9);
              auVar161._0_4_ = auVar245._0_4_ * auVar115._0_4_;
              auVar161._4_4_ = auVar245._4_4_ * auVar115._4_4_;
              auVar161._8_4_ = auVar245._8_4_ * auVar115._8_4_;
              auVar161._12_4_ = auVar245._12_4_ * auVar115._12_4_;
              auVar17 = vsubps_avx(auVar161,auVar198);
              auVar115 = vshufps_avx(auVar17,auVar17,0x55);
              local_228[0] = (RTCHitN)auVar115[0];
              local_228[1] = (RTCHitN)auVar115[1];
              local_228[2] = (RTCHitN)auVar115[2];
              local_228[3] = (RTCHitN)auVar115[3];
              local_228[4] = (RTCHitN)auVar115[4];
              local_228[5] = (RTCHitN)auVar115[5];
              local_228[6] = (RTCHitN)auVar115[6];
              local_228[7] = (RTCHitN)auVar115[7];
              local_228[8] = (RTCHitN)auVar115[8];
              local_228[9] = (RTCHitN)auVar115[9];
              local_228[10] = (RTCHitN)auVar115[10];
              local_228[0xb] = (RTCHitN)auVar115[0xb];
              local_228[0xc] = (RTCHitN)auVar115[0xc];
              local_228[0xd] = (RTCHitN)auVar115[0xd];
              local_228[0xe] = (RTCHitN)auVar115[0xe];
              local_228[0xf] = (RTCHitN)auVar115[0xf];
              local_218 = vshufps_avx(auVar17,auVar17,0xaa);
              local_208 = vshufps_avx(auVar17,auVar17,0);
              local_358 = auVar140._0_8_;
              uStack_350 = auVar140._8_8_;
              local_1d8 = local_358;
              uStack_1d0 = uStack_350;
              local_1c8 = auVar107;
              vcmpps_avx(ZEXT1632(auVar107),ZEXT1632(auVar107),0xf);
              uStack_1b4 = context->user->instID[0];
              local_1b8 = uStack_1b4;
              uStack_1b0 = uStack_1b4;
              uStack_1ac = uStack_1b4;
              uStack_1a8 = context->user->instPrimID[0];
              uStack_1a4 = uStack_1a8;
              uStack_1a0 = uStack_1a8;
              uStack_19c = uStack_1a8;
              *(float *)(ray + k * 4 + 0x80) = fVar271;
              local_468 = *local_458;
              args.valid = (int *)local_468;
              args.geometryUserPtr = pGVar19->userPtr;
              args.context = context->user;
              args.ray = (RTCRayN *)ray;
              args.hit = local_228;
              args.N = 4;
              if (pGVar19->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar19->occlusionFilterN)(&args);
              }
              if (local_468 == (undefined1  [16])0x0) {
                auVar115 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                auVar115 = auVar115 ^ _DAT_01f46b70;
              }
              else {
                p_Var24 = context->args->filter;
                if ((p_Var24 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar19->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  (*p_Var24)(&args);
                }
                auVar17 = vpcmpeqd_avx(local_468,_DAT_01f45a50);
                auVar115 = auVar17 ^ _DAT_01f46b70;
                auVar199._8_4_ = 0xff800000;
                auVar199._0_8_ = 0xff800000ff800000;
                auVar199._12_4_ = 0xff800000;
                auVar17 = vblendvps_avx(auVar199,*(undefined1 (*) [16])(args.ray + 0x80),auVar17);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar17;
              }
              auVar162._8_8_ = 0x100000001;
              auVar162._0_8_ = 0x100000001;
              bVar95 = (auVar162 & auVar115) != (undefined1  [16])0x0;
              if (!bVar95) {
                *(float *)(ray + k * 4 + 0x80) = fVar206;
              }
            }
            bVar94 = (bool)(bVar94 | bVar95);
          }
        }
      }
      goto LAB_00ac1d86;
    }
    auVar115 = vinsertps_avx(ZEXT416((uint)fVar272),ZEXT416((uint)fVar271),0x10);
    auVar406 = ZEXT1664(auVar115);
    auVar353 = ZEXT1664(auVar404);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }